

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersector1<8>::
     occluded_h<embree::avx::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [28];
  undefined4 uVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Primitive PVar33;
  __int_type_conflict _Var34;
  long lVar35;
  RTCFilterFunctionN p_Var36;
  code *pcVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [28];
  undefined1 auVar139 [12];
  undefined1 auVar140 [28];
  undefined1 auVar141 [28];
  undefined1 auVar142 [28];
  undefined1 auVar143 [28];
  undefined1 auVar144 [28];
  uint uVar145;
  int iVar146;
  RTCIntersectArguments *pRVar147;
  uint uVar148;
  ulong uVar149;
  long lVar150;
  ulong uVar151;
  long lVar152;
  long lVar153;
  Geometry *pGVar154;
  long lVar155;
  bool bVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar157;
  undefined1 auVar162 [16];
  float fVar178;
  float fVar181;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar174;
  float fVar175;
  float fVar179;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar176;
  float fVar177;
  float fVar180;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar182;
  float fVar198;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [24];
  float fVar199;
  float fVar201;
  float fVar205;
  undefined1 auVar188 [32];
  float fVar203;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar197;
  float fVar200;
  float fVar202;
  float fVar204;
  float fVar206;
  float fVar207;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar196 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  float fVar218;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar219;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar220;
  float fVar236;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar235;
  float fVar237;
  float fVar240;
  float fVar243;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar238;
  float fVar239;
  float fVar241;
  float fVar242;
  float fVar244;
  float fVar245;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  float fVar246;
  float fVar256;
  float fVar258;
  float fVar260;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar247;
  undefined1 auVar251 [16];
  undefined1 auVar250 [16];
  float fVar257;
  float fVar259;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar265;
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar266;
  float fVar272;
  float fVar273;
  undefined1 auVar267 [16];
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar268 [32];
  float fVar274;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar278;
  undefined1 auVar279 [16];
  float fVar286;
  float fVar287;
  undefined1 auVar280 [32];
  float fVar288;
  float fVar289;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar290;
  float fVar291;
  undefined1 auVar285 [32];
  float fVar299;
  float fVar300;
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar301;
  undefined1 auVar297 [32];
  undefined1 auVar298 [64];
  float fVar302;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar328;
  float fVar336;
  float fVar338;
  float fVar339;
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar337;
  undefined1 auVar335 [32];
  float fVar340;
  float fVar346;
  float fVar347;
  float fVar348;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  float in_register_0000151c;
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  float fVar358;
  float fVar359;
  undefined1 auVar360 [16];
  float fVar367;
  float fVar369;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  float fVar368;
  float fVar370;
  float fVar372;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  float fVar371;
  undefined1 auVar366 [64];
  float fVar373;
  float fVar377;
  float fVar378;
  float fVar379;
  float in_register_0000159c;
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  float fVar380;
  float fVar385;
  float fVar386;
  undefined1 auVar381 [16];
  float fVar387;
  float in_register_000015dc;
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar388 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_7c4;
  undefined1 local_7c0 [32];
  uint local_7a0;
  undefined4 uStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  ulong local_770;
  Precalculations *local_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 auStack_690 [8];
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_630 [8];
  undefined8 uStack_628;
  undefined8 local_620;
  undefined4 local_618;
  float local_614;
  uint local_610;
  undefined4 local_60c;
  undefined4 local_608;
  uint local_604;
  uint local_600;
  ulong local_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_570 [8];
  undefined8 uStack_568;
  undefined1 local_560 [8];
  undefined8 uStack_558;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  local_768 = pre;
  PVar33 = prim[1];
  uVar151 = (ulong)(byte)PVar33;
  lVar153 = uVar151 * 0x25;
  fVar220 = *(float *)(prim + lVar153 + 0x12);
  auVar211 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar153 + 6));
  auVar267._0_4_ = fVar220 * (ray->dir).field_0.m128[0];
  auVar267._4_4_ = fVar220 * (ray->dir).field_0.m128[1];
  auVar267._8_4_ = fVar220 * (ray->dir).field_0.m128[2];
  auVar267._12_4_ = fVar220 * (ray->dir).field_0.m128[3];
  auVar388 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 4 + 6)));
  auVar183._0_4_ = fVar220 * auVar211._0_4_;
  auVar183._4_4_ = fVar220 * auVar211._4_4_;
  auVar183._8_4_ = fVar220 * auVar211._8_4_;
  auVar183._12_4_ = fVar220 * auVar211._12_4_;
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 4 + 10)));
  auVar163._16_16_ = auVar211;
  auVar163._0_16_ = auVar388;
  auVar163 = vcvtdq2ps_avx(auVar163);
  lVar155 = uVar151 * 5;
  auVar388 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar155 + 6)));
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar155 + 10)));
  auVar213._16_16_ = auVar211;
  auVar213._0_16_ = auVar388;
  auVar388 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 6 + 6)));
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 6 + 10)));
  auVar39 = vcvtdq2ps_avx(auVar213);
  auVar224._16_16_ = auVar211;
  auVar224._0_16_ = auVar388;
  auVar40 = vcvtdq2ps_avx(auVar224);
  auVar388 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 0xf + 6)));
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 0xf + 10)));
  auVar225._16_16_ = auVar211;
  auVar225._0_16_ = auVar388;
  auVar41 = vcvtdq2ps_avx(auVar225);
  lVar152 = (ulong)(byte)PVar33 * 0x10;
  auVar388 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar152 + 6)));
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar152 + 10)));
  auVar280._16_16_ = auVar211;
  auVar280._0_16_ = auVar388;
  auVar388 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar152 + uVar151 + 6)));
  auVar42 = vcvtdq2ps_avx(auVar280);
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar152 + uVar151 + 10)));
  auVar292._16_16_ = auVar211;
  auVar292._0_16_ = auVar388;
  auVar388 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 0x1a + 6)));
  auVar43 = vcvtdq2ps_avx(auVar292);
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 0x1a + 10)));
  auVar293._16_16_ = auVar211;
  auVar293._0_16_ = auVar388;
  auVar44 = vcvtdq2ps_avx(auVar293);
  auVar388 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 0x1b + 6)));
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 0x1b + 10)));
  auVar318._16_16_ = auVar211;
  auVar318._0_16_ = auVar388;
  auVar388 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 0x1c + 6)));
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar151 * 0x1c + 10)));
  auVar45 = vcvtdq2ps_avx(auVar318);
  auVar329._16_16_ = auVar211;
  auVar329._0_16_ = auVar388;
  auVar46 = vcvtdq2ps_avx(auVar329);
  auVar388 = vshufps_avx(auVar267,auVar267,0);
  auVar211 = vshufps_avx(auVar267,auVar267,0x55);
  auVar251 = vshufps_avx(auVar267,auVar267,0xaa);
  fVar220 = auVar251._0_4_;
  fVar177 = auVar251._4_4_;
  fVar235 = auVar251._8_4_;
  fVar199 = auVar251._12_4_;
  fVar218 = auVar211._0_4_;
  fVar180 = auVar211._4_4_;
  fVar236 = auVar211._8_4_;
  fVar288 = auVar211._12_4_;
  fVar237 = auVar388._0_4_;
  fVar240 = auVar388._4_4_;
  fVar243 = auVar388._8_4_;
  fVar246 = auVar388._12_4_;
  auVar349._0_4_ = fVar237 * auVar163._0_4_ + fVar218 * auVar39._0_4_ + fVar220 * auVar40._0_4_;
  auVar349._4_4_ = fVar240 * auVar163._4_4_ + fVar180 * auVar39._4_4_ + fVar177 * auVar40._4_4_;
  auVar349._8_4_ = fVar243 * auVar163._8_4_ + fVar236 * auVar39._8_4_ + fVar235 * auVar40._8_4_;
  auVar349._12_4_ = fVar246 * auVar163._12_4_ + fVar288 * auVar39._12_4_ + fVar199 * auVar40._12_4_;
  auVar349._16_4_ = fVar237 * auVar163._16_4_ + fVar218 * auVar39._16_4_ + fVar220 * auVar40._16_4_;
  auVar349._20_4_ = fVar240 * auVar163._20_4_ + fVar180 * auVar39._20_4_ + fVar177 * auVar40._20_4_;
  auVar349._24_4_ = fVar243 * auVar163._24_4_ + fVar236 * auVar39._24_4_ + fVar235 * auVar40._24_4_;
  auVar349._28_4_ = fVar288 + in_register_000015dc + in_register_0000151c;
  auVar341._0_4_ = fVar237 * auVar41._0_4_ + fVar218 * auVar42._0_4_ + auVar43._0_4_ * fVar220;
  auVar341._4_4_ = fVar240 * auVar41._4_4_ + fVar180 * auVar42._4_4_ + auVar43._4_4_ * fVar177;
  auVar341._8_4_ = fVar243 * auVar41._8_4_ + fVar236 * auVar42._8_4_ + auVar43._8_4_ * fVar235;
  auVar341._12_4_ = fVar246 * auVar41._12_4_ + fVar288 * auVar42._12_4_ + auVar43._12_4_ * fVar199;
  auVar341._16_4_ = fVar237 * auVar41._16_4_ + fVar218 * auVar42._16_4_ + auVar43._16_4_ * fVar220;
  auVar341._20_4_ = fVar240 * auVar41._20_4_ + fVar180 * auVar42._20_4_ + auVar43._20_4_ * fVar177;
  auVar341._24_4_ = fVar243 * auVar41._24_4_ + fVar236 * auVar42._24_4_ + auVar43._24_4_ * fVar235;
  auVar341._28_4_ = fVar288 + in_register_000015dc + in_register_0000159c;
  auVar268._0_4_ = fVar237 * auVar44._0_4_ + fVar218 * auVar45._0_4_ + auVar46._0_4_ * fVar220;
  auVar268._4_4_ = fVar240 * auVar44._4_4_ + fVar180 * auVar45._4_4_ + auVar46._4_4_ * fVar177;
  auVar268._8_4_ = fVar243 * auVar44._8_4_ + fVar236 * auVar45._8_4_ + auVar46._8_4_ * fVar235;
  auVar268._12_4_ = fVar246 * auVar44._12_4_ + fVar288 * auVar45._12_4_ + auVar46._12_4_ * fVar199;
  auVar268._16_4_ = fVar237 * auVar44._16_4_ + fVar218 * auVar45._16_4_ + auVar46._16_4_ * fVar220;
  auVar268._20_4_ = fVar240 * auVar44._20_4_ + fVar180 * auVar45._20_4_ + auVar46._20_4_ * fVar177;
  auVar268._24_4_ = fVar243 * auVar44._24_4_ + fVar236 * auVar45._24_4_ + auVar46._24_4_ * fVar235;
  auVar268._28_4_ = fVar246 + fVar288 + fVar199;
  auVar388 = vshufps_avx(auVar183,auVar183,0);
  auVar211 = vshufps_avx(auVar183,auVar183,0x55);
  auVar251 = vshufps_avx(auVar183,auVar183,0xaa);
  fVar220 = auVar251._0_4_;
  fVar177 = auVar251._4_4_;
  fVar235 = auVar251._8_4_;
  fVar199 = auVar251._12_4_;
  fVar240 = auVar211._0_4_;
  fVar243 = auVar211._4_4_;
  fVar246 = auVar211._8_4_;
  fVar256 = auVar211._12_4_;
  fVar218 = auVar39._28_4_ + auVar40._28_4_;
  fVar180 = auVar388._0_4_;
  fVar236 = auVar388._4_4_;
  fVar288 = auVar388._8_4_;
  fVar237 = auVar388._12_4_;
  auVar188._0_4_ = fVar180 * auVar163._0_4_ + fVar240 * auVar39._0_4_ + fVar220 * auVar40._0_4_;
  auVar188._4_4_ = fVar236 * auVar163._4_4_ + fVar243 * auVar39._4_4_ + fVar177 * auVar40._4_4_;
  auVar188._8_4_ = fVar288 * auVar163._8_4_ + fVar246 * auVar39._8_4_ + fVar235 * auVar40._8_4_;
  auVar188._12_4_ = fVar237 * auVar163._12_4_ + fVar256 * auVar39._12_4_ + fVar199 * auVar40._12_4_;
  auVar188._16_4_ = fVar180 * auVar163._16_4_ + fVar240 * auVar39._16_4_ + fVar220 * auVar40._16_4_;
  auVar188._20_4_ = fVar236 * auVar163._20_4_ + fVar243 * auVar39._20_4_ + fVar177 * auVar40._20_4_;
  auVar188._24_4_ = fVar288 * auVar163._24_4_ + fVar246 * auVar39._24_4_ + fVar235 * auVar40._24_4_;
  auVar188._28_4_ = auVar163._28_4_ + fVar218;
  auVar164._0_4_ = fVar180 * auVar41._0_4_ + auVar43._0_4_ * fVar220 + fVar240 * auVar42._0_4_;
  auVar164._4_4_ = fVar236 * auVar41._4_4_ + auVar43._4_4_ * fVar177 + fVar243 * auVar42._4_4_;
  auVar164._8_4_ = fVar288 * auVar41._8_4_ + auVar43._8_4_ * fVar235 + fVar246 * auVar42._8_4_;
  auVar164._12_4_ = fVar237 * auVar41._12_4_ + auVar43._12_4_ * fVar199 + fVar256 * auVar42._12_4_;
  auVar164._16_4_ = fVar180 * auVar41._16_4_ + auVar43._16_4_ * fVar220 + fVar240 * auVar42._16_4_;
  auVar164._20_4_ = fVar236 * auVar41._20_4_ + auVar43._20_4_ * fVar177 + fVar243 * auVar42._20_4_;
  auVar164._24_4_ = fVar288 * auVar41._24_4_ + auVar43._24_4_ * fVar235 + fVar246 * auVar42._24_4_;
  auVar164._28_4_ = auVar163._28_4_ + auVar43._28_4_ + auVar40._28_4_;
  auVar303._8_4_ = 0x7fffffff;
  auVar303._0_8_ = 0x7fffffff7fffffff;
  auVar303._12_4_ = 0x7fffffff;
  auVar303._16_4_ = 0x7fffffff;
  auVar303._20_4_ = 0x7fffffff;
  auVar303._24_4_ = 0x7fffffff;
  auVar303._28_4_ = 0x7fffffff;
  auVar226._8_4_ = 0x219392ef;
  auVar226._0_8_ = 0x219392ef219392ef;
  auVar226._12_4_ = 0x219392ef;
  auVar226._16_4_ = 0x219392ef;
  auVar226._20_4_ = 0x219392ef;
  auVar226._24_4_ = 0x219392ef;
  auVar226._28_4_ = 0x219392ef;
  auVar163 = vandps_avx(auVar349,auVar303);
  auVar163 = vcmpps_avx(auVar163,auVar226,1);
  auVar39 = vblendvps_avx(auVar349,auVar226,auVar163);
  auVar163 = vandps_avx(auVar341,auVar303);
  auVar163 = vcmpps_avx(auVar163,auVar226,1);
  auVar40 = vblendvps_avx(auVar341,auVar226,auVar163);
  auVar163 = vandps_avx(auVar303,auVar268);
  auVar163 = vcmpps_avx(auVar163,auVar226,1);
  auVar163 = vblendvps_avx(auVar268,auVar226,auVar163);
  auVar214._0_4_ = fVar180 * auVar44._0_4_ + fVar240 * auVar45._0_4_ + auVar46._0_4_ * fVar220;
  auVar214._4_4_ = fVar236 * auVar44._4_4_ + fVar243 * auVar45._4_4_ + auVar46._4_4_ * fVar177;
  auVar214._8_4_ = fVar288 * auVar44._8_4_ + fVar246 * auVar45._8_4_ + auVar46._8_4_ * fVar235;
  auVar214._12_4_ = fVar237 * auVar44._12_4_ + fVar256 * auVar45._12_4_ + auVar46._12_4_ * fVar199;
  auVar214._16_4_ = fVar180 * auVar44._16_4_ + fVar240 * auVar45._16_4_ + auVar46._16_4_ * fVar220;
  auVar214._20_4_ = fVar236 * auVar44._20_4_ + fVar243 * auVar45._20_4_ + auVar46._20_4_ * fVar177;
  auVar214._24_4_ = fVar288 * auVar44._24_4_ + fVar246 * auVar45._24_4_ + auVar46._24_4_ * fVar235;
  auVar214._28_4_ = fVar218 + auVar42._28_4_ + fVar199;
  auVar41 = vrcpps_avx(auVar39);
  fVar220 = auVar41._0_4_;
  fVar235 = auVar41._4_4_;
  auVar42._4_4_ = auVar39._4_4_ * fVar235;
  auVar42._0_4_ = auVar39._0_4_ * fVar220;
  fVar218 = auVar41._8_4_;
  auVar42._8_4_ = auVar39._8_4_ * fVar218;
  fVar236 = auVar41._12_4_;
  auVar42._12_4_ = auVar39._12_4_ * fVar236;
  fVar237 = auVar41._16_4_;
  auVar42._16_4_ = auVar39._16_4_ * fVar237;
  fVar240 = auVar41._20_4_;
  auVar42._20_4_ = auVar39._20_4_ * fVar240;
  fVar243 = auVar41._24_4_;
  auVar42._24_4_ = auVar39._24_4_ * fVar243;
  auVar42._28_4_ = auVar39._28_4_;
  auVar304._8_4_ = 0x3f800000;
  auVar304._0_8_ = 0x3f8000003f800000;
  auVar304._12_4_ = 0x3f800000;
  auVar304._16_4_ = 0x3f800000;
  auVar304._20_4_ = 0x3f800000;
  auVar304._24_4_ = 0x3f800000;
  auVar304._28_4_ = 0x3f800000;
  auVar43 = vsubps_avx(auVar304,auVar42);
  auVar42 = vrcpps_avx(auVar40);
  fVar220 = fVar220 + fVar220 * auVar43._0_4_;
  fVar235 = fVar235 + fVar235 * auVar43._4_4_;
  fVar218 = fVar218 + fVar218 * auVar43._8_4_;
  fVar236 = fVar236 + fVar236 * auVar43._12_4_;
  fVar237 = fVar237 + fVar237 * auVar43._16_4_;
  fVar240 = fVar240 + fVar240 * auVar43._20_4_;
  fVar243 = fVar243 + fVar243 * auVar43._24_4_;
  fVar246 = auVar42._0_4_;
  fVar256 = auVar42._4_4_;
  auVar39._4_4_ = fVar256 * auVar40._4_4_;
  auVar39._0_4_ = fVar246 * auVar40._0_4_;
  fVar258 = auVar42._8_4_;
  auVar39._8_4_ = fVar258 * auVar40._8_4_;
  fVar260 = auVar42._12_4_;
  auVar39._12_4_ = fVar260 * auVar40._12_4_;
  fVar262 = auVar42._16_4_;
  auVar39._16_4_ = fVar262 * auVar40._16_4_;
  fVar263 = auVar42._20_4_;
  auVar39._20_4_ = fVar263 * auVar40._20_4_;
  fVar264 = auVar42._24_4_;
  auVar39._24_4_ = fVar264 * auVar40._24_4_;
  auVar39._28_4_ = auVar43._28_4_;
  auVar40 = vsubps_avx(auVar304,auVar39);
  fVar246 = fVar246 + fVar246 * auVar40._0_4_;
  fVar256 = fVar256 + fVar256 * auVar40._4_4_;
  fVar258 = fVar258 + fVar258 * auVar40._8_4_;
  fVar260 = fVar260 + fVar260 * auVar40._12_4_;
  fVar262 = fVar262 + fVar262 * auVar40._16_4_;
  fVar263 = fVar263 + fVar263 * auVar40._20_4_;
  fVar264 = fVar264 + fVar264 * auVar40._24_4_;
  auVar39 = vrcpps_avx(auVar163);
  fVar266 = auVar39._0_4_;
  fVar272 = auVar39._4_4_;
  auVar44._4_4_ = fVar272 * auVar163._4_4_;
  auVar44._0_4_ = fVar266 * auVar163._0_4_;
  fVar273 = auVar39._8_4_;
  auVar44._8_4_ = fVar273 * auVar163._8_4_;
  fVar274 = auVar39._12_4_;
  auVar44._12_4_ = fVar274 * auVar163._12_4_;
  fVar275 = auVar39._16_4_;
  auVar44._16_4_ = fVar275 * auVar163._16_4_;
  fVar276 = auVar39._20_4_;
  auVar44._20_4_ = fVar276 * auVar163._20_4_;
  fVar277 = auVar39._24_4_;
  auVar44._24_4_ = fVar277 * auVar163._24_4_;
  auVar44._28_4_ = auVar163._28_4_;
  auVar163 = vsubps_avx(auVar304,auVar44);
  fVar266 = fVar266 + fVar266 * auVar163._0_4_;
  fVar272 = fVar272 + fVar272 * auVar163._4_4_;
  fVar273 = fVar273 + fVar273 * auVar163._8_4_;
  fVar274 = fVar274 + fVar274 * auVar163._12_4_;
  fVar275 = fVar275 + fVar275 * auVar163._16_4_;
  fVar276 = fVar276 + fVar276 * auVar163._20_4_;
  fVar277 = fVar277 + fVar277 * auVar163._24_4_;
  auVar388 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar153 + 0x16)) *
                           *(float *)(prim + lVar153 + 0x1a)));
  auVar47 = vshufps_avx(auVar388,auVar388,0);
  auVar388._8_8_ = 0;
  auVar388._0_8_ = *(ulong *)(prim + uVar151 * 7 + 6);
  auVar388 = vpmovsxwd_avx(auVar388);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = *(ulong *)(prim + uVar151 * 7 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar211);
  auVar294._16_16_ = auVar211;
  auVar294._0_16_ = auVar388;
  auVar163 = vcvtdq2ps_avx(auVar294);
  auVar251._8_8_ = 0;
  auVar251._0_8_ = *(ulong *)(prim + uVar151 * 0xb + 6);
  auVar388 = vpmovsxwd_avx(auVar251);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar151 * 0xb + 0xe);
  auVar211 = vpmovsxwd_avx(auVar222);
  auVar305._16_16_ = auVar211;
  auVar305._0_16_ = auVar388;
  auVar39 = vcvtdq2ps_avx(auVar305);
  auVar39 = vsubps_avx(auVar39,auVar163);
  fVar177 = auVar47._0_4_;
  fVar199 = auVar47._4_4_;
  fVar180 = auVar47._8_4_;
  fVar288 = auVar47._12_4_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar151 * 9 + 6);
  auVar388 = vpmovsxwd_avx(auVar47);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar151 * 9 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar14);
  auVar295._0_4_ = auVar39._0_4_ * fVar177 + auVar163._0_4_;
  auVar295._4_4_ = auVar39._4_4_ * fVar199 + auVar163._4_4_;
  auVar295._8_4_ = auVar39._8_4_ * fVar180 + auVar163._8_4_;
  auVar295._12_4_ = auVar39._12_4_ * fVar288 + auVar163._12_4_;
  auVar295._16_4_ = auVar39._16_4_ * fVar177 + auVar163._16_4_;
  auVar295._20_4_ = auVar39._20_4_ * fVar199 + auVar163._20_4_;
  auVar295._24_4_ = auVar39._24_4_ * fVar180 + auVar163._24_4_;
  auVar295._28_4_ = auVar39._28_4_ + auVar163._28_4_;
  auVar306._16_16_ = auVar211;
  auVar306._0_16_ = auVar388;
  auVar163 = vcvtdq2ps_avx(auVar306);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar151 * 0xd + 6);
  auVar388 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar151 * 0xd + 0xe);
  auVar211 = vpmovsxwd_avx(auVar16);
  auVar319._16_16_ = auVar211;
  auVar319._0_16_ = auVar388;
  auVar39 = vcvtdq2ps_avx(auVar319);
  auVar39 = vsubps_avx(auVar39,auVar163);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar151 * 0x12 + 6);
  auVar388 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar151 * 0x12 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar18);
  auVar307._0_4_ = auVar163._0_4_ + auVar39._0_4_ * fVar177;
  auVar307._4_4_ = auVar163._4_4_ + auVar39._4_4_ * fVar199;
  auVar307._8_4_ = auVar163._8_4_ + auVar39._8_4_ * fVar180;
  auVar307._12_4_ = auVar163._12_4_ + auVar39._12_4_ * fVar288;
  auVar307._16_4_ = auVar163._16_4_ + auVar39._16_4_ * fVar177;
  auVar307._20_4_ = auVar163._20_4_ + auVar39._20_4_ * fVar199;
  auVar307._24_4_ = auVar163._24_4_ + auVar39._24_4_ * fVar180;
  auVar307._28_4_ = auVar163._28_4_ + auVar39._28_4_;
  auVar320._16_16_ = auVar211;
  auVar320._0_16_ = auVar388;
  auVar163 = vcvtdq2ps_avx(auVar320);
  uVar149 = (ulong)(uint)((int)lVar155 << 2);
  lVar153 = uVar151 * 2 + uVar149;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar153 + 6);
  auVar388 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar153 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar20);
  auVar330._16_16_ = auVar211;
  auVar330._0_16_ = auVar388;
  auVar39 = vcvtdq2ps_avx(auVar330);
  auVar39 = vsubps_avx(auVar39,auVar163);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar149 + 6);
  auVar388 = vpmovsxwd_avx(auVar21);
  auVar321._0_4_ = auVar163._0_4_ + auVar39._0_4_ * fVar177;
  auVar321._4_4_ = auVar163._4_4_ + auVar39._4_4_ * fVar199;
  auVar321._8_4_ = auVar163._8_4_ + auVar39._8_4_ * fVar180;
  auVar321._12_4_ = auVar163._12_4_ + auVar39._12_4_ * fVar288;
  auVar321._16_4_ = auVar163._16_4_ + auVar39._16_4_ * fVar177;
  auVar321._20_4_ = auVar163._20_4_ + auVar39._20_4_ * fVar199;
  auVar321._24_4_ = auVar163._24_4_ + auVar39._24_4_ * fVar180;
  auVar321._28_4_ = auVar163._28_4_ + auVar39._28_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar149 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar22);
  auVar331._16_16_ = auVar211;
  auVar331._0_16_ = auVar388;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar151 * 0x18 + 6);
  auVar388 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar151 * 0x18 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar24);
  auVar163 = vcvtdq2ps_avx(auVar331);
  auVar342._16_16_ = auVar211;
  auVar342._0_16_ = auVar388;
  auVar39 = vcvtdq2ps_avx(auVar342);
  auVar39 = vsubps_avx(auVar39,auVar163);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar151 * 0x1d + 6);
  auVar388 = vpmovsxwd_avx(auVar25);
  auVar332._0_4_ = auVar163._0_4_ + auVar39._0_4_ * fVar177;
  auVar332._4_4_ = auVar163._4_4_ + auVar39._4_4_ * fVar199;
  auVar332._8_4_ = auVar163._8_4_ + auVar39._8_4_ * fVar180;
  auVar332._12_4_ = auVar163._12_4_ + auVar39._12_4_ * fVar288;
  auVar332._16_4_ = auVar163._16_4_ + auVar39._16_4_ * fVar177;
  auVar332._20_4_ = auVar163._20_4_ + auVar39._20_4_ * fVar199;
  auVar332._24_4_ = auVar163._24_4_ + auVar39._24_4_ * fVar180;
  auVar332._28_4_ = auVar163._28_4_ + auVar39._28_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar151 * 0x1d + 0xe);
  auVar211 = vpmovsxwd_avx(auVar26);
  auVar343._16_16_ = auVar211;
  auVar343._0_16_ = auVar388;
  auVar163 = vcvtdq2ps_avx(auVar343);
  lVar153 = uVar151 + (ulong)(byte)PVar33 * 0x20;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar153 + 6);
  auVar388 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar153 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar28);
  auVar350._16_16_ = auVar211;
  auVar350._0_16_ = auVar388;
  auVar39 = vcvtdq2ps_avx(auVar350);
  auVar39 = vsubps_avx(auVar39,auVar163);
  auVar344._0_4_ = auVar163._0_4_ + auVar39._0_4_ * fVar177;
  auVar344._4_4_ = auVar163._4_4_ + auVar39._4_4_ * fVar199;
  auVar344._8_4_ = auVar163._8_4_ + auVar39._8_4_ * fVar180;
  auVar344._12_4_ = auVar163._12_4_ + auVar39._12_4_ * fVar288;
  auVar344._16_4_ = auVar163._16_4_ + auVar39._16_4_ * fVar177;
  auVar344._20_4_ = auVar163._20_4_ + auVar39._20_4_ * fVar199;
  auVar344._24_4_ = auVar163._24_4_ + auVar39._24_4_ * fVar180;
  auVar344._28_4_ = auVar163._28_4_ + auVar39._28_4_;
  lVar153 = (ulong)(byte)PVar33 * 0x20 - uVar151;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + lVar153 + 6);
  auVar388 = vpmovsxwd_avx(auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + lVar153 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar30);
  auVar351._16_16_ = auVar211;
  auVar351._0_16_ = auVar388;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar151 * 0x23 + 6);
  auVar388 = vpmovsxwd_avx(auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar151 * 0x23 + 0xe);
  auVar211 = vpmovsxwd_avx(auVar32);
  auVar361._16_16_ = auVar211;
  auVar361._0_16_ = auVar388;
  auVar163 = vcvtdq2ps_avx(auVar351);
  auVar39 = vcvtdq2ps_avx(auVar361);
  auVar39 = vsubps_avx(auVar39,auVar163);
  auVar352._0_4_ = auVar163._0_4_ + auVar39._0_4_ * fVar177;
  auVar352._4_4_ = auVar163._4_4_ + auVar39._4_4_ * fVar199;
  auVar352._8_4_ = auVar163._8_4_ + auVar39._8_4_ * fVar180;
  auVar352._12_4_ = auVar163._12_4_ + auVar39._12_4_ * fVar288;
  auVar352._16_4_ = auVar163._16_4_ + auVar39._16_4_ * fVar177;
  auVar352._20_4_ = auVar163._20_4_ + auVar39._20_4_ * fVar199;
  auVar352._24_4_ = auVar163._24_4_ + auVar39._24_4_ * fVar180;
  auVar352._28_4_ = auVar163._28_4_ + fVar288;
  auVar163 = vsubps_avx(auVar295,auVar188);
  auVar279._0_4_ = fVar220 * auVar163._0_4_;
  auVar279._4_4_ = fVar235 * auVar163._4_4_;
  auVar279._8_4_ = fVar218 * auVar163._8_4_;
  auVar279._12_4_ = fVar236 * auVar163._12_4_;
  auVar45._16_4_ = fVar237 * auVar163._16_4_;
  auVar45._0_16_ = auVar279;
  auVar45._20_4_ = fVar240 * auVar163._20_4_;
  auVar45._24_4_ = fVar243 * auVar163._24_4_;
  auVar45._28_4_ = auVar163._28_4_;
  auVar163 = vsubps_avx(auVar307,auVar188);
  auVar221._0_4_ = fVar220 * auVar163._0_4_;
  auVar221._4_4_ = fVar235 * auVar163._4_4_;
  auVar221._8_4_ = fVar218 * auVar163._8_4_;
  auVar221._12_4_ = fVar236 * auVar163._12_4_;
  auVar46._16_4_ = fVar237 * auVar163._16_4_;
  auVar46._0_16_ = auVar221;
  auVar46._20_4_ = fVar240 * auVar163._20_4_;
  auVar46._24_4_ = fVar243 * auVar163._24_4_;
  auVar46._28_4_ = auVar41._28_4_ + auVar43._28_4_;
  auVar163 = vsubps_avx(auVar321,auVar164);
  auVar184._0_4_ = fVar246 * auVar163._0_4_;
  auVar184._4_4_ = fVar256 * auVar163._4_4_;
  auVar184._8_4_ = fVar258 * auVar163._8_4_;
  auVar184._12_4_ = fVar260 * auVar163._12_4_;
  auVar41._16_4_ = fVar262 * auVar163._16_4_;
  auVar41._0_16_ = auVar184;
  auVar41._20_4_ = fVar263 * auVar163._20_4_;
  auVar41._24_4_ = fVar264 * auVar163._24_4_;
  auVar41._28_4_ = auVar163._28_4_;
  auVar163 = vsubps_avx(auVar332,auVar164);
  auVar248._0_4_ = fVar246 * auVar163._0_4_;
  auVar248._4_4_ = fVar256 * auVar163._4_4_;
  auVar248._8_4_ = fVar258 * auVar163._8_4_;
  auVar248._12_4_ = fVar260 * auVar163._12_4_;
  auVar43._16_4_ = fVar262 * auVar163._16_4_;
  auVar43._0_16_ = auVar248;
  auVar43._20_4_ = fVar263 * auVar163._20_4_;
  auVar43._24_4_ = fVar264 * auVar163._24_4_;
  auVar43._28_4_ = auVar42._28_4_ + auVar40._28_4_;
  auVar163 = vsubps_avx(auVar344,auVar214);
  auVar160._0_4_ = fVar266 * auVar163._0_4_;
  auVar160._4_4_ = fVar272 * auVar163._4_4_;
  auVar160._8_4_ = fVar273 * auVar163._8_4_;
  auVar160._12_4_ = fVar274 * auVar163._12_4_;
  auVar40._16_4_ = fVar275 * auVar163._16_4_;
  auVar40._0_16_ = auVar160;
  auVar40._20_4_ = fVar276 * auVar163._20_4_;
  auVar40._24_4_ = fVar277 * auVar163._24_4_;
  auVar40._28_4_ = auVar163._28_4_;
  auVar163 = vsubps_avx(auVar352,auVar214);
  auVar208._0_4_ = fVar266 * auVar163._0_4_;
  auVar208._4_4_ = fVar272 * auVar163._4_4_;
  auVar208._8_4_ = fVar273 * auVar163._8_4_;
  auVar208._12_4_ = fVar274 * auVar163._12_4_;
  auVar48._16_4_ = fVar275 * auVar163._16_4_;
  auVar48._0_16_ = auVar208;
  auVar48._20_4_ = fVar276 * auVar163._20_4_;
  auVar48._24_4_ = fVar277 * auVar163._24_4_;
  auVar48._28_4_ = auVar163._28_4_;
  auVar388 = vpminsd_avx(auVar45._16_16_,auVar46._16_16_);
  auVar211 = vpminsd_avx(auVar279,auVar221);
  auVar308._16_16_ = auVar388;
  auVar308._0_16_ = auVar211;
  auVar388 = vpminsd_avx(auVar41._16_16_,auVar43._16_16_);
  auVar211 = vpminsd_avx(auVar184,auVar248);
  auVar345._16_16_ = auVar388;
  auVar345._0_16_ = auVar211;
  auVar163 = vmaxps_avx(auVar308,auVar345);
  auVar388 = vpminsd_avx(auVar40._16_16_,auVar48._16_16_);
  auVar211 = vpminsd_avx(auVar160,auVar208);
  auVar362._16_16_ = auVar388;
  auVar362._0_16_ = auVar211;
  uVar12 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar374._4_4_ = uVar12;
  auVar374._0_4_ = uVar12;
  auVar374._8_4_ = uVar12;
  auVar374._12_4_ = uVar12;
  auVar374._16_4_ = uVar12;
  auVar374._20_4_ = uVar12;
  auVar374._24_4_ = uVar12;
  auVar374._28_4_ = uVar12;
  auVar39 = vmaxps_avx(auVar362,auVar374);
  auVar163 = vmaxps_avx(auVar163,auVar39);
  local_80._4_4_ = auVar163._4_4_ * 0.99999964;
  local_80._0_4_ = auVar163._0_4_ * 0.99999964;
  local_80._8_4_ = auVar163._8_4_ * 0.99999964;
  local_80._12_4_ = auVar163._12_4_ * 0.99999964;
  local_80._16_4_ = auVar163._16_4_ * 0.99999964;
  local_80._20_4_ = auVar163._20_4_ * 0.99999964;
  local_80._24_4_ = auVar163._24_4_ * 0.99999964;
  local_80._28_4_ = auVar163._28_4_;
  auVar388 = vpmaxsd_avx(auVar45._16_16_,auVar46._16_16_);
  auVar211 = vpmaxsd_avx(auVar279,auVar221);
  auVar227._16_16_ = auVar388;
  auVar227._0_16_ = auVar211;
  auVar388 = vpmaxsd_avx(auVar41._16_16_,auVar43._16_16_);
  auVar211 = vpmaxsd_avx(auVar184,auVar248);
  auVar189._16_16_ = auVar388;
  auVar189._0_16_ = auVar211;
  auVar163 = vminps_avx(auVar227,auVar189);
  auVar388 = vpmaxsd_avx(auVar40._16_16_,auVar48._16_16_);
  auVar211 = vpmaxsd_avx(auVar160,auVar208);
  fVar220 = ray->tfar;
  auVar215._4_4_ = fVar220;
  auVar215._0_4_ = fVar220;
  auVar215._8_4_ = fVar220;
  auVar215._12_4_ = fVar220;
  auVar215._16_4_ = fVar220;
  auVar215._20_4_ = fVar220;
  auVar215._24_4_ = fVar220;
  auVar215._28_4_ = fVar220;
  auVar165._16_16_ = auVar388;
  auVar165._0_16_ = auVar211;
  auVar39 = vminps_avx(auVar165,auVar215);
  auVar163 = vminps_avx(auVar163,auVar39);
  auVar38._4_4_ = auVar163._4_4_ * 1.0000004;
  auVar38._0_4_ = auVar163._0_4_ * 1.0000004;
  auVar38._8_4_ = auVar163._8_4_ * 1.0000004;
  auVar38._12_4_ = auVar163._12_4_ * 1.0000004;
  auVar38._16_4_ = auVar163._16_4_ * 1.0000004;
  auVar38._20_4_ = auVar163._20_4_ * 1.0000004;
  auVar38._24_4_ = auVar163._24_4_ * 1.0000004;
  auVar38._28_4_ = auVar163._28_4_;
  auVar163 = vcmpps_avx(local_80,auVar38,2);
  auVar388 = vpshufd_avx(ZEXT116((byte)PVar33),0);
  auVar190._16_16_ = auVar388;
  auVar190._0_16_ = auVar388;
  auVar39 = vcvtdq2ps_avx(auVar190);
  auVar39 = vcmpps_avx(_DAT_01faff40,auVar39,1);
  auVar163 = vandps_avx(auVar163,auVar39);
  uVar145 = vmovmskps_avx(auVar163);
  if (uVar145 != 0) {
    uVar145 = uVar145 & 0xff;
    local_480 = mm_lookupmask_ps._16_8_;
    uStack_478 = mm_lookupmask_ps._24_8_;
    uStack_470 = mm_lookupmask_ps._16_8_;
    uStack_468 = mm_lookupmask_ps._24_8_;
    do {
      lVar153 = 0;
      if (uVar145 != 0) {
        for (; (uVar145 >> lVar153 & 1) == 0; lVar153 = lVar153 + 1) {
        }
      }
      local_770 = (ulong)*(uint *)(prim + 2);
      pGVar154 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
      local_5e8 = (ulong)*(uint *)(prim + lVar153 * 4 + 6);
      uVar151 = (ulong)*(uint *)(*(long *)&pGVar154->field_0x58 +
                                (ulong)*(uint *)(prim + lVar153 * 4 + 6) *
                                pGVar154[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar220 = (pGVar154->time_range).lower;
      fVar220 = pGVar154->fnumTimeSegments *
                (((ray->dir).field_0.m128[3] - fVar220) / ((pGVar154->time_range).upper - fVar220));
      auVar388 = vroundss_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),9);
      auVar388 = vminss_avx(auVar388,ZEXT416((uint)(pGVar154->fnumTimeSegments + -1.0)));
      auVar388 = vmaxss_avx(ZEXT816(0) << 0x20,auVar388);
      fVar220 = fVar220 - auVar388._0_4_;
      _Var34 = pGVar154[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar150 = (long)(int)auVar388._0_4_ * 0x38;
      lVar155 = *(long *)(_Var34 + 0x10 + lVar150);
      lVar152 = *(long *)(_Var34 + 0x38 + lVar150);
      lVar35 = *(long *)(_Var34 + 0x48 + lVar150);
      auVar388 = vshufps_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),0);
      pfVar1 = (float *)(lVar152 + lVar35 * uVar151);
      fVar177 = auVar388._0_4_;
      fVar235 = auVar388._4_4_;
      fVar199 = auVar388._8_4_;
      fVar218 = auVar388._12_4_;
      lVar153 = uVar151 + 1;
      pfVar2 = (float *)(lVar152 + lVar35 * lVar153);
      p_Var36 = pGVar154[4].occlusionFilterN;
      auVar388 = vshufps_avx(ZEXT416((uint)(1.0 - fVar220)),ZEXT416((uint)(1.0 - fVar220)),0);
      pfVar3 = (float *)(*(long *)(_Var34 + lVar150) + lVar155 * uVar151);
      fVar220 = auVar388._0_4_;
      fVar180 = auVar388._4_4_;
      fVar236 = auVar388._8_4_;
      fVar288 = auVar388._12_4_;
      pfVar4 = (float *)(*(long *)(_Var34 + lVar150) + lVar155 * lVar153);
      pfVar5 = (float *)(*(long *)(p_Var36 + lVar150 + 0x38) +
                        uVar151 * *(long *)(p_Var36 + lVar150 + 0x48));
      pfVar6 = (float *)(*(long *)(p_Var36 + lVar150 + 0x38) +
                        *(long *)(p_Var36 + lVar150 + 0x48) * lVar153);
      pfVar7 = (float *)(*(long *)(p_Var36 + lVar150) +
                        *(long *)(p_Var36 + lVar150 + 0x10) * uVar151);
      pfVar8 = (float *)(*(long *)(p_Var36 + lVar150) +
                        *(long *)(p_Var36 + lVar150 + 0x10) * lVar153);
      uVar148 = (uint)pGVar154[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar153 = (long)(int)uVar148 * 0x44;
      fVar237 = fVar220 * *pfVar3 + fVar177 * *pfVar1;
      fVar240 = fVar180 * pfVar3[1] + fVar235 * pfVar1[1];
      local_630 = (undefined1  [8])CONCAT44(fVar240,fVar237);
      uStack_628._0_4_ = fVar236 * pfVar3[2] + fVar199 * pfVar1[2];
      uStack_628._4_4_ = fVar288 * pfVar3[3] + fVar218 * pfVar1[3];
      local_550._0_4_ = fVar220 * *pfVar4 + fVar177 * *pfVar2;
      local_550._4_4_ = fVar180 * pfVar4[1] + fVar235 * pfVar2[1];
      fStack_548 = fVar236 * pfVar4[2] + fVar199 * pfVar2[2];
      fStack_544 = fVar288 * pfVar4[3] + fVar218 * pfVar2[3];
      local_560 = (undefined1  [8])
                  CONCAT44(fVar240 + (fVar180 * pfVar7[1] + fVar235 * pfVar5[1]) * 0.33333334,
                           fVar237 + (fVar220 * *pfVar7 + fVar177 * *pfVar5) * 0.33333334);
      uStack_558._0_4_ =
           (float)uStack_628 + (fVar236 * pfVar7[2] + fVar199 * pfVar5[2]) * 0.33333334;
      uStack_558._4_4_ = uStack_628._4_4_ + (fVar288 * pfVar7[3] + fVar218 * pfVar5[3]) * 0.33333334
      ;
      auVar161._0_4_ = (fVar220 * *pfVar8 + fVar177 * *pfVar6) * 0.33333334;
      auVar161._4_4_ = (fVar180 * pfVar8[1] + fVar235 * pfVar6[1]) * 0.33333334;
      auVar161._8_4_ = (fVar236 * pfVar8[2] + fVar199 * pfVar6[2]) * 0.33333334;
      auVar161._12_4_ = (fVar288 * pfVar8[3] + fVar218 * pfVar6[3]) * 0.33333334;
      _local_570 = vsubps_avx(_local_550,auVar161);
      aVar13 = (ray->org).field_0;
      auVar251 = vsubps_avx(_local_630,(undefined1  [16])aVar13);
      auVar15 = _local_630;
      auVar388 = vshufps_avx(auVar251,auVar251,0);
      auVar211 = vshufps_avx(auVar251,auVar251,0x55);
      auVar251 = vshufps_avx(auVar251,auVar251,0xaa);
      fVar220 = (local_768->ray_space).vx.field_0.m128[0];
      fVar177 = (local_768->ray_space).vx.field_0.m128[1];
      fVar235 = (local_768->ray_space).vx.field_0.m128[2];
      fVar199 = (local_768->ray_space).vx.field_0.m128[3];
      fVar218 = (local_768->ray_space).vy.field_0.m128[0];
      fVar180 = (local_768->ray_space).vy.field_0.m128[1];
      fVar236 = (local_768->ray_space).vy.field_0.m128[2];
      fVar288 = (local_768->ray_space).vy.field_0.m128[3];
      fVar237 = (local_768->ray_space).vz.field_0.m128[0];
      fVar240 = (local_768->ray_space).vz.field_0.m128[1];
      fVar243 = (local_768->ray_space).vz.field_0.m128[2];
      fVar246 = (local_768->ray_space).vz.field_0.m128[3];
      auVar381._0_4_ =
           auVar388._0_4_ * fVar220 + auVar251._0_4_ * fVar237 + auVar211._0_4_ * fVar218;
      auVar381._4_4_ =
           auVar388._4_4_ * fVar177 + auVar251._4_4_ * fVar240 + auVar211._4_4_ * fVar180;
      auVar381._8_4_ =
           auVar388._8_4_ * fVar235 + auVar251._8_4_ * fVar243 + auVar211._8_4_ * fVar236;
      auVar381._12_4_ =
           auVar388._12_4_ * fVar199 + auVar251._12_4_ * fVar246 + auVar211._12_4_ * fVar288;
      auVar388 = vblendps_avx(auVar381,_local_630,8);
      auVar222 = vsubps_avx(_local_560,(undefined1  [16])aVar13);
      auVar211 = vshufps_avx(auVar222,auVar222,0);
      auVar251 = vshufps_avx(auVar222,auVar222,0x55);
      auVar222 = vshufps_avx(auVar222,auVar222,0xaa);
      auVar360._0_4_ =
           auVar211._0_4_ * fVar220 + auVar251._0_4_ * fVar218 + fVar237 * auVar222._0_4_;
      auVar360._4_4_ =
           auVar211._4_4_ * fVar177 + auVar251._4_4_ * fVar180 + fVar240 * auVar222._4_4_;
      auVar360._8_4_ =
           auVar211._8_4_ * fVar235 + auVar251._8_4_ * fVar236 + fVar243 * auVar222._8_4_;
      auVar360._12_4_ =
           auVar211._12_4_ * fVar199 + auVar251._12_4_ * fVar288 + fVar246 * auVar222._12_4_;
      auVar211 = vblendps_avx(auVar360,_local_560,8);
      auVar47 = vsubps_avx(_local_570,(undefined1  [16])aVar13);
      auVar251 = vshufps_avx(auVar47,auVar47,0);
      auVar222 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar249._0_4_ = auVar251._0_4_ * fVar220 + auVar222._0_4_ * fVar218 + fVar237 * auVar47._0_4_
      ;
      auVar249._4_4_ = auVar251._4_4_ * fVar177 + auVar222._4_4_ * fVar180 + fVar240 * auVar47._4_4_
      ;
      auVar249._8_4_ = auVar251._8_4_ * fVar235 + auVar222._8_4_ * fVar236 + fVar243 * auVar47._8_4_
      ;
      auVar249._12_4_ =
           auVar251._12_4_ * fVar199 + auVar222._12_4_ * fVar288 + fVar246 * auVar47._12_4_;
      auVar251 = vblendps_avx(auVar249,_local_570,8);
      local_540._0_16_ = (undefined1  [16])aVar13;
      auVar14 = vsubps_avx(_local_550,(undefined1  [16])aVar13);
      auVar222 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar47 = vshufps_avx(auVar14,auVar14,0);
      auVar14 = vshufps_avx(auVar14,auVar14,0x55);
      auVar185._0_4_ = auVar47._0_4_ * fVar220 + auVar222._0_4_ * fVar237 + auVar14._0_4_ * fVar218;
      auVar185._4_4_ = auVar47._4_4_ * fVar177 + auVar222._4_4_ * fVar240 + auVar14._4_4_ * fVar180;
      auVar185._8_4_ = auVar47._8_4_ * fVar235 + auVar222._8_4_ * fVar243 + auVar14._8_4_ * fVar236;
      auVar185._12_4_ =
           auVar47._12_4_ * fVar199 + auVar222._12_4_ * fVar246 + auVar14._12_4_ * fVar288;
      auVar222 = vblendps_avx(auVar185,_local_550,8);
      auVar250._8_4_ = 0x7fffffff;
      auVar250._0_8_ = 0x7fffffff7fffffff;
      auVar250._12_4_ = 0x7fffffff;
      auVar388 = vandps_avx(auVar388,auVar250);
      auVar211 = vandps_avx(auVar211,auVar250);
      auVar47 = vmaxps_avx(auVar388,auVar211);
      auVar388 = vandps_avx(auVar251,auVar250);
      auVar211 = vandps_avx(auVar222,auVar250);
      auVar388 = vmaxps_avx(auVar388,auVar211);
      auVar388 = vmaxps_avx(auVar47,auVar388);
      auVar211 = vmovshdup_avx(auVar388);
      auVar211 = vmaxss_avx(auVar211,auVar388);
      auVar388 = vshufpd_avx(auVar388,auVar388,1);
      auVar388 = vmaxss_avx(auVar388,auVar211);
      fVar275 = *(float *)(bezier_basis0 + lVar153 + 0x908);
      fVar276 = *(float *)(bezier_basis0 + lVar153 + 0x90c);
      fVar277 = *(float *)(bezier_basis0 + lVar153 + 0x910);
      fVar312 = *(float *)(bezier_basis0 + lVar153 + 0x914);
      fVar239 = *(float *)(bezier_basis0 + lVar153 + 0x918);
      fVar299 = *(float *)(bezier_basis0 + lVar153 + 0x91c);
      fVar314 = *(float *)(bezier_basis0 + lVar153 + 0x920);
      auVar211 = vshufps_avx(auVar249,auVar249,0);
      local_740._16_16_ = auVar211;
      local_740._0_16_ = auVar211;
      fVar243 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar153 + 0xd8c);
      fVar246 = *(float *)(bezier_basis0 + lVar153 + 0xd90);
      fVar260 = *(float *)(bezier_basis0 + lVar153 + 0xd94);
      fVar262 = *(float *)(bezier_basis0 + lVar153 + 0xd98);
      fVar263 = *(float *)(bezier_basis0 + lVar153 + 0xd9c);
      fVar264 = *(float *)(bezier_basis0 + lVar153 + 0xda0);
      fVar266 = *(float *)(bezier_basis0 + lVar153 + 0xda4);
      auVar138 = *(undefined1 (*) [28])(bezier_basis0 + lVar153 + 0xd8c);
      local_7c0._0_16_ = auVar185;
      auVar251 = vshufps_avx(auVar185,auVar185,0);
      register0x00001210 = auVar251;
      _local_400 = auVar251;
      fVar220 = auVar251._0_4_;
      fVar218 = auVar251._4_4_;
      fVar237 = auVar251._8_4_;
      fVar256 = auVar251._12_4_;
      fVar182 = auVar211._0_4_;
      fVar200 = auVar211._4_4_;
      fVar204 = auVar211._8_4_;
      fVar207 = auVar211._12_4_;
      auVar211 = vshufps_avx(auVar249,auVar249,0x55);
      register0x00001410 = auVar211;
      _local_700 = auVar211;
      auVar251 = vshufps_avx(auVar185,auVar185,0x55);
      register0x00001350 = auVar251;
      _local_760 = auVar251;
      fVar177 = auVar251._0_4_;
      fVar180 = auVar251._4_4_;
      fVar240 = auVar251._8_4_;
      fVar258 = auVar251._12_4_;
      fVar302 = auVar211._0_4_;
      fVar310 = auVar211._4_4_;
      fVar311 = auVar211._8_4_;
      fVar313 = auVar211._12_4_;
      auVar14 = _local_570;
      auVar211 = vshufps_avx(_local_570,_local_570,0xff);
      register0x00001310 = auVar211;
      _local_a0 = auVar211;
      auVar251 = vshufps_avx(_local_550,_local_550,0xff);
      register0x000013d0 = auVar251;
      _local_100 = auVar251;
      fVar235 = auVar251._0_4_;
      fVar199 = auVar251._4_4_;
      fVar236 = auVar251._8_4_;
      fVar288 = auVar251._12_4_;
      fVar247 = auVar211._0_4_;
      fVar257 = auVar211._4_4_;
      fVar259 = auVar211._8_4_;
      fVar261 = auVar211._12_4_;
      auVar211 = vshufps_avx(auVar360,auVar360,0);
      register0x00001550 = auVar211;
      _local_420 = auVar211;
      local_460 = *(float *)(bezier_basis0 + lVar153 + 0x484);
      fStack_45c = *(float *)(bezier_basis0 + lVar153 + 0x488);
      fStack_458 = *(float *)(bezier_basis0 + lVar153 + 0x48c);
      fStack_454 = *(float *)(bezier_basis0 + lVar153 + 0x490);
      fStack_450 = *(float *)(bezier_basis0 + lVar153 + 0x494);
      fStack_44c = *(float *)(bezier_basis0 + lVar153 + 0x498);
      fStack_448 = *(float *)(bezier_basis0 + lVar153 + 0x49c);
      fVar358 = auVar211._0_4_;
      fVar367 = auVar211._4_4_;
      fVar369 = auVar211._8_4_;
      fVar371 = auVar211._12_4_;
      auVar211 = vshufps_avx(auVar360,auVar360,0x55);
      register0x000014d0 = auVar211;
      _local_720 = auVar211;
      fVar340 = auVar211._0_4_;
      fVar346 = auVar211._4_4_;
      fVar347 = auVar211._8_4_;
      fVar348 = auVar211._12_4_;
      auVar16 = _local_560;
      auVar211 = vshufps_avx(_local_560,_local_560,0xff);
      register0x00001590 = auVar211;
      _local_120 = auVar211;
      fStack_444 = (float)*(undefined4 *)(bezier_basis0 + lVar153 + 0x4a0);
      fVar339 = auVar211._0_4_;
      fVar359 = auVar211._4_4_;
      fVar368 = auVar211._8_4_;
      fVar370 = auVar211._12_4_;
      fVar219 = *(float *)(bezier_basis0 + lVar153 + 0x924) + 0.0 + 0.0;
      auVar211 = vshufps_avx(auVar381,auVar381,0);
      register0x00001390 = auVar211;
      _local_e0 = auVar211;
      pauVar9 = (undefined1 (*) [16])(bezier_basis0 + lVar153);
      fVar272 = *(float *)*pauVar9;
      fVar273 = *(float *)(bezier_basis0 + lVar153 + 4);
      fVar274 = *(float *)(bezier_basis0 + lVar153 + 8);
      auVar139 = *(undefined1 (*) [12])*pauVar9;
      fVar315 = *(float *)(bezier_basis0 + lVar153 + 0xc);
      fStack_310 = *(float *)(bezier_basis0 + lVar153 + 0x10);
      fStack_30c = *(float *)(bezier_basis0 + lVar153 + 0x14);
      fStack_308 = *(float *)(bezier_basis0 + lVar153 + 0x18);
      fVar278 = auVar211._0_4_;
      fVar286 = auVar211._4_4_;
      fVar287 = auVar211._8_4_;
      fVar289 = auVar211._12_4_;
      auVar322._0_4_ =
           fVar278 * fVar272 + fVar358 * local_460 + fVar182 * fVar275 + fVar243 * fVar220;
      auVar322._4_4_ =
           fVar286 * fVar273 + fVar367 * fStack_45c + fVar200 * fVar276 + fVar246 * fVar218;
      auVar322._8_4_ =
           fVar287 * fVar274 + fVar369 * fStack_458 + fVar204 * fVar277 + fVar260 * fVar237;
      auVar322._12_4_ =
           fVar289 * fVar315 + fVar371 * fStack_454 + fVar207 * fVar312 + fVar262 * fVar256;
      auVar322._16_4_ =
           fVar278 * fStack_310 + fVar358 * fStack_450 + fVar182 * fVar239 + fVar263 * fVar220;
      auVar322._20_4_ =
           fVar286 * fStack_30c + fVar367 * fStack_44c + fVar200 * fVar299 + fVar264 * fVar218;
      auVar322._24_4_ =
           fVar287 * fStack_308 + fVar369 * fStack_448 + fVar204 * fVar314 + fVar266 * fVar237;
      auVar322._28_4_ = fVar289 + fVar207 + fVar256 + 0.0;
      auVar211 = vshufps_avx(auVar381,auVar381,0x55);
      register0x000015d0 = auVar211;
      _local_c0 = auVar211;
      fVar380 = auVar211._0_4_;
      fVar385 = auVar211._4_4_;
      fVar386 = auVar211._8_4_;
      fVar387 = auVar211._12_4_;
      auVar353._0_4_ =
           fVar380 * fVar272 + fVar340 * local_460 + fVar302 * fVar275 + fVar243 * fVar177;
      auVar353._4_4_ =
           fVar385 * fVar273 + fVar346 * fStack_45c + fVar310 * fVar276 + fVar246 * fVar180;
      auVar353._8_4_ =
           fVar386 * fVar274 + fVar347 * fStack_458 + fVar311 * fVar277 + fVar260 * fVar240;
      auVar353._12_4_ =
           fVar387 * fVar315 + fVar348 * fStack_454 + fVar313 * fVar312 + fVar262 * fVar258;
      auVar353._16_4_ =
           fVar380 * fStack_310 + fVar340 * fStack_450 + fVar302 * fVar239 + fVar263 * fVar177;
      auVar353._20_4_ =
           fVar385 * fStack_30c + fVar346 * fStack_44c + fVar310 * fVar299 + fVar264 * fVar180;
      auVar353._24_4_ =
           fVar386 * fStack_308 + fVar347 * fStack_448 + fVar311 * fVar314 + fVar266 * fVar240;
      auVar353._28_4_ = 0;
      auVar211 = vpermilps_avx(_local_630,0xff);
      register0x00001490 = auVar211;
      _local_140 = auVar211;
      _local_320 = *pauVar9;
      auVar17 = _local_320;
      uStack_304 = *(undefined4 *)(bezier_basis0 + lVar153 + 0x1c);
      fVar328 = auVar211._0_4_;
      fVar336 = auVar211._4_4_;
      fVar338 = auVar211._8_4_;
      fVar157 = fVar328 * fVar272 + fVar339 * local_460 + fVar247 * fVar275 + fVar243 * fVar235;
      fVar174 = fVar336 * fVar273 + fVar359 * fStack_45c + fVar257 * fVar276 + fVar246 * fVar199;
      fStack_798 = fVar338 * fVar274 + fVar368 * fStack_458 + fVar259 * fVar277 + fVar260 * fVar236;
      fStack_794 = auVar211._12_4_ * fVar315 +
                   fVar370 * fStack_454 + fVar261 * fVar312 + fVar262 * fVar288;
      fStack_790 = fVar328 * fStack_310 +
                   fVar339 * fStack_450 + fVar247 * fVar239 + fVar263 * fVar235;
      fStack_78c = fVar336 * fStack_30c +
                   fVar359 * fStack_44c + fVar257 * fVar299 + fVar264 * fVar199;
      fStack_788 = fVar338 * fStack_308 +
                   fVar368 * fStack_448 + fVar259 * fVar314 + fVar266 * fVar236;
      fStack_784 = fVar219 + 0.0;
      auVar163 = *(undefined1 (*) [32])(bezier_basis1 + lVar153 + 0x908);
      auVar196 = ZEXT3264(auVar163);
      fVar242 = *(float *)(bezier_basis1 + lVar153 + 0xd8c);
      fVar300 = *(float *)(bezier_basis1 + lVar153 + 0xd90);
      fVar316 = *(float *)(bezier_basis1 + lVar153 + 0xd94);
      fVar317 = *(float *)(bezier_basis1 + lVar153 + 0xd98);
      fVar245 = *(float *)(bezier_basis1 + lVar153 + 0xd9c);
      fVar337 = *(float *)(bezier_basis1 + lVar153 + 0xda0);
      fVar158 = *(float *)(bezier_basis1 + lVar153 + 0xda4);
      fVar198 = auVar163._0_4_;
      fVar202 = auVar163._4_4_;
      fVar206 = auVar163._8_4_;
      fVar291 = auVar163._12_4_;
      fVar201 = auVar163._16_4_;
      fVar203 = auVar163._20_4_;
      fVar205 = auVar163._24_4_;
      fVar175 = *(float *)(bezier_basis1 + lVar153 + 0x484);
      fVar178 = *(float *)(bezier_basis1 + lVar153 + 0x488);
      fVar179 = *(float *)(bezier_basis1 + lVar153 + 0x48c);
      fVar181 = *(float *)(bezier_basis1 + lVar153 + 0x490);
      fVar159 = *(float *)(bezier_basis1 + lVar153 + 0x494);
      fVar176 = *(float *)(bezier_basis1 + lVar153 + 0x498);
      fVar265 = *(float *)(bezier_basis1 + lVar153 + 0x49c);
      fVar246 = fVar371 + fVar219 + 0.0;
      fVar219 = *(float *)(bezier_basis1 + lVar153);
      fVar290 = *(float *)(bezier_basis1 + lVar153 + 4);
      fVar197 = *(float *)(bezier_basis1 + lVar153 + 8);
      fVar238 = *(float *)(bezier_basis1 + lVar153 + 0xc);
      fVar241 = *(float *)(bezier_basis1 + lVar153 + 0x10);
      fVar244 = *(float *)(bezier_basis1 + lVar153 + 0x14);
      fVar301 = *(float *)(bezier_basis1 + lVar153 + 0x18);
      local_380._0_4_ =
           fVar278 * fVar219 + fVar358 * fVar175 + fVar198 * fVar182 + fVar242 * fVar220;
      local_380._4_4_ =
           fVar286 * fVar290 + fVar367 * fVar178 + fVar202 * fVar200 + fVar300 * fVar218;
      fStack_378 = fVar287 * fVar197 + fVar369 * fVar179 + fVar206 * fVar204 + fVar316 * fVar237;
      fStack_374 = fVar289 * fVar238 + fVar371 * fVar181 + fVar291 * fVar207 + fVar317 * fVar256;
      fStack_370 = fVar278 * fVar241 + fVar358 * fVar159 + fVar201 * fVar182 + fVar245 * fVar220;
      fStack_36c = fVar286 * fVar244 + fVar367 * fVar176 + fVar203 * fVar200 + fVar337 * fVar218;
      fStack_368 = fVar287 * fVar301 + fVar369 * fVar265 + fVar205 * fVar204 + fVar158 * fVar237;
      register0x0000135c = fVar370 + fVar246;
      auVar228._0_4_ = fVar380 * fVar219 + fVar340 * fVar175 + fVar302 * fVar198 + fVar177 * fVar242
      ;
      auVar228._4_4_ = fVar385 * fVar290 + fVar346 * fVar178 + fVar310 * fVar202 + fVar180 * fVar300
      ;
      auVar228._8_4_ = fVar386 * fVar197 + fVar347 * fVar179 + fVar311 * fVar206 + fVar240 * fVar316
      ;
      auVar228._12_4_ =
           fVar387 * fVar238 + fVar348 * fVar181 + fVar313 * fVar291 + fVar258 * fVar317;
      auVar228._16_4_ =
           fVar380 * fVar241 + fVar340 * fVar159 + fVar302 * fVar201 + fVar177 * fVar245;
      auVar228._20_4_ =
           fVar385 * fVar244 + fVar346 * fVar176 + fVar310 * fVar203 + fVar180 * fVar337;
      auVar228._24_4_ =
           fVar386 * fVar301 + fVar347 * fVar265 + fVar311 * fVar205 + fVar240 * fVar158;
      auVar228._28_4_ = fVar246 + fVar371 + fVar289 + 0.0;
      local_680._0_4_ =
           fVar339 * fVar175 + fVar247 * fVar198 + fVar235 * fVar242 + fVar328 * fVar219;
      local_680._4_4_ =
           fVar359 * fVar178 + fVar257 * fVar202 + fVar199 * fVar300 + fVar336 * fVar290;
      local_680._8_4_ =
           fVar368 * fVar179 + fVar259 * fVar206 + fVar236 * fVar316 + fVar338 * fVar197;
      local_680._12_4_ =
           fVar370 * fVar181 + fVar261 * fVar291 + fVar288 * fVar317 + auVar211._12_4_ * fVar238;
      local_680._16_4_ =
           fVar339 * fVar159 + fVar247 * fVar201 + fVar235 * fVar245 + fVar328 * fVar241;
      local_680._20_4_ =
           fVar359 * fVar176 + fVar257 * fVar203 + fVar199 * fVar337 + fVar336 * fVar244;
      local_680._24_4_ =
           fVar368 * fVar265 + fVar259 * fVar205 + fVar236 * fVar158 + fVar338 * fVar301;
      local_680._28_4_ = fVar371 + fVar288 + fVar289 + fVar246;
      auVar41 = vsubps_avx(_local_380,auVar322);
      _local_440 = vsubps_avx(auVar228,auVar353);
      fVar235 = auVar41._0_4_;
      fVar236 = auVar41._4_4_;
      auVar49._4_4_ = auVar353._4_4_ * fVar236;
      auVar49._0_4_ = auVar353._0_4_ * fVar235;
      fVar243 = auVar41._8_4_;
      auVar49._8_4_ = auVar353._8_4_ * fVar243;
      fVar260 = auVar41._12_4_;
      auVar49._12_4_ = auVar353._12_4_ * fVar260;
      fVar263 = auVar41._16_4_;
      auVar49._16_4_ = auVar353._16_4_ * fVar263;
      fVar266 = auVar41._20_4_;
      auVar49._20_4_ = auVar353._20_4_ * fVar266;
      fVar273 = auVar41._24_4_;
      auVar49._24_4_ = auVar353._24_4_ * fVar273;
      auVar49._28_4_ = fVar246;
      fVar199 = local_440._0_4_;
      fVar288 = local_440._4_4_;
      auVar50._4_4_ = auVar322._4_4_ * fVar288;
      auVar50._0_4_ = auVar322._0_4_ * fVar199;
      fVar246 = local_440._8_4_;
      auVar50._8_4_ = auVar322._8_4_ * fVar246;
      fVar262 = local_440._12_4_;
      auVar50._12_4_ = auVar322._12_4_ * fVar262;
      fVar264 = local_440._16_4_;
      auVar50._16_4_ = auVar322._16_4_ * fVar264;
      fVar272 = local_440._20_4_;
      auVar50._20_4_ = auVar322._20_4_ * fVar272;
      fVar274 = local_440._24_4_;
      auVar50._24_4_ = auVar322._24_4_ * fVar274;
      auVar50._28_4_ = auVar228._28_4_;
      auVar40 = vsubps_avx(auVar49,auVar50);
      auVar132._4_4_ = fVar174;
      auVar132._0_4_ = fVar157;
      auVar132._8_4_ = fStack_798;
      auVar132._12_4_ = fStack_794;
      auVar132._16_4_ = fStack_790;
      auVar132._20_4_ = fStack_78c;
      auVar132._24_4_ = fStack_788;
      auVar132._28_4_ = fStack_784;
      auVar39 = vmaxps_avx(auVar132,local_680);
      auVar51._4_4_ = auVar39._4_4_ * auVar39._4_4_ * (fVar236 * fVar236 + fVar288 * fVar288);
      auVar51._0_4_ = auVar39._0_4_ * auVar39._0_4_ * (fVar235 * fVar235 + fVar199 * fVar199);
      auVar51._8_4_ = auVar39._8_4_ * auVar39._8_4_ * (fVar243 * fVar243 + fVar246 * fVar246);
      auVar51._12_4_ = auVar39._12_4_ * auVar39._12_4_ * (fVar260 * fVar260 + fVar262 * fVar262);
      auVar51._16_4_ = auVar39._16_4_ * auVar39._16_4_ * (fVar263 * fVar263 + fVar264 * fVar264);
      auVar51._20_4_ = auVar39._20_4_ * auVar39._20_4_ * (fVar266 * fVar266 + fVar272 * fVar272);
      auVar51._24_4_ = auVar39._24_4_ * auVar39._24_4_ * (fVar273 * fVar273 + fVar274 * fVar274);
      auVar51._28_4_ = fVar261 + auVar228._28_4_;
      auVar52._4_4_ = auVar40._4_4_ * auVar40._4_4_;
      auVar52._0_4_ = auVar40._0_4_ * auVar40._0_4_;
      auVar52._8_4_ = auVar40._8_4_ * auVar40._8_4_;
      auVar52._12_4_ = auVar40._12_4_ * auVar40._12_4_;
      auVar52._16_4_ = auVar40._16_4_ * auVar40._16_4_;
      auVar52._20_4_ = auVar40._20_4_ * auVar40._20_4_;
      auVar52._24_4_ = auVar40._24_4_ * auVar40._24_4_;
      auVar52._28_4_ = auVar40._28_4_;
      auVar39 = vcmpps_avx(auVar52,auVar51,2);
      auVar211 = ZEXT416((uint)(float)(int)uVar148);
      local_3e0._0_16_ = auVar211;
      auVar211 = vshufps_avx(auVar211,auVar211,0);
      auVar229._16_16_ = auVar211;
      auVar229._0_16_ = auVar211;
      auVar40 = vcmpps_avx(_DAT_01faff40,auVar229,1);
      auVar211 = vpermilps_avx(auVar381,0xaa);
      register0x00001490 = auVar211;
      _local_660 = auVar211;
      auVar251 = vpermilps_avx(auVar360,0xaa);
      register0x00001550 = auVar251;
      _local_2e0 = auVar251;
      auVar222 = vpermilps_avx(auVar249,0xaa);
      register0x00001590 = auVar222;
      _local_300 = auVar222;
      auVar47 = vpermilps_avx(auVar185,0xaa);
      register0x00001310 = auVar47;
      _local_5c0 = auVar47;
      auVar42 = auVar40 & auVar39;
      auVar388 = ZEXT416((uint)(auVar388._0_4_ * 4.7683716e-07));
      fVar235 = fVar302;
      fVar199 = fVar310;
      fVar236 = fVar311;
      fVar288 = fVar340;
      fVar243 = fVar346;
      fVar246 = fVar347;
      if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar42 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar42 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar42 >> 0x7f,0) == '\0') &&
            (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar42 >> 0xbf,0) == '\0') &&
          (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar42[0x1f])
      {
        bVar156 = false;
        auVar366 = ZEXT3264(local_740);
        auVar298 = ZEXT3264(_local_760);
        auVar234 = ZEXT1664(auVar388);
        _local_630 = auVar15;
        _local_570 = auVar14;
        _local_560 = auVar16;
      }
      else {
        local_340 = vandps_avx(auVar39,auVar40);
        fVar328 = auVar211._0_4_;
        fVar336 = auVar211._4_4_;
        fVar338 = auVar211._8_4_;
        fVar339 = auVar211._12_4_;
        fVar359 = auVar251._0_4_;
        fVar368 = auVar251._4_4_;
        fVar370 = auVar251._8_4_;
        fVar372 = auVar251._12_4_;
        fVar373 = auVar222._0_4_;
        fVar377 = auVar222._4_4_;
        fVar378 = auVar222._8_4_;
        fVar379 = auVar222._12_4_;
        fVar247 = auVar47._0_4_;
        fVar257 = auVar47._4_4_;
        fVar259 = auVar47._8_4_;
        fVar261 = auVar47._12_4_;
        fVar260 = auVar40._28_4_ + auVar163._28_4_ + register0x0000135c;
        local_360._0_4_ =
             fVar328 * fVar219 + fVar359 * fVar175 + fVar373 * fVar198 + fVar247 * fVar242;
        local_360._4_4_ =
             fVar336 * fVar290 + fVar368 * fVar178 + fVar377 * fVar202 + fVar257 * fVar300;
        fStack_358 = fVar338 * fVar197 + fVar370 * fVar179 + fVar378 * fVar206 + fVar259 * fVar316;
        fStack_354 = fVar339 * fVar238 + fVar372 * fVar181 + fVar379 * fVar291 + fVar261 * fVar317;
        fStack_350 = fVar328 * fVar241 + fVar359 * fVar159 + fVar373 * fVar201 + fVar247 * fVar245;
        fStack_34c = fVar336 * fVar244 + fVar368 * fVar176 + fVar377 * fVar203 + fVar257 * fVar337;
        fStack_348 = fVar338 * fVar301 + fVar370 * fVar265 + fVar378 * fVar205 + fVar259 * fVar158;
        fStack_344 = local_340._28_4_ + fVar260;
        local_320._0_4_ = auVar139._0_4_;
        local_320._4_4_ = auVar139._4_4_;
        fStack_318 = auVar139._8_4_;
        local_5e0._0_4_ = auVar138._0_4_;
        local_5e0._4_4_ = auVar138._4_4_;
        fStack_5d8 = auVar138._8_4_;
        fStack_5d4 = auVar138._12_4_;
        fStack_5d0 = auVar138._16_4_;
        fStack_5cc = auVar138._20_4_;
        fStack_5c8 = auVar138._24_4_;
        local_500 = fVar328 * (float)local_320._0_4_ +
                    fVar359 * local_460 + fVar373 * fVar275 + fVar247 * (float)local_5e0._0_4_;
        fStack_4fc = fVar336 * (float)local_320._4_4_ +
                     fVar368 * fStack_45c + fVar377 * fVar276 + fVar257 * (float)local_5e0._4_4_;
        fStack_4f8 = fVar338 * fStack_318 +
                     fVar370 * fStack_458 + fVar378 * fVar277 + fVar259 * fStack_5d8;
        fStack_4f4 = fVar339 * fVar315 +
                     fVar372 * fStack_454 + fVar379 * fVar312 + fVar261 * fStack_5d4;
        fStack_4f0 = fVar328 * fStack_310 +
                     fVar359 * fStack_450 + fVar373 * fVar239 + fVar247 * fStack_5d0;
        fStack_4ec = fVar336 * fStack_30c +
                     fVar368 * fStack_44c + fVar377 * fVar299 + fVar257 * fStack_5cc;
        fStack_4e8 = fVar338 * fStack_308 +
                     fVar370 * fStack_448 + fVar378 * fVar314 + fVar259 * fStack_5c8;
        fStack_4e4 = fStack_344 + fVar260 + local_340._28_4_ + auVar40._28_4_;
        fVar260 = *(float *)(bezier_basis0 + lVar153 + 0x1210);
        fVar262 = *(float *)(bezier_basis0 + lVar153 + 0x1214);
        fVar263 = *(float *)(bezier_basis0 + lVar153 + 0x1218);
        fVar264 = *(float *)(bezier_basis0 + lVar153 + 0x121c);
        fVar266 = *(float *)(bezier_basis0 + lVar153 + 0x1220);
        fVar272 = *(float *)(bezier_basis0 + lVar153 + 0x1224);
        fVar273 = *(float *)(bezier_basis0 + lVar153 + 0x1228);
        fVar274 = *(float *)(bezier_basis0 + lVar153 + 0x1694);
        fVar275 = *(float *)(bezier_basis0 + lVar153 + 0x1698);
        fVar276 = *(float *)(bezier_basis0 + lVar153 + 0x169c);
        fVar277 = *(float *)(bezier_basis0 + lVar153 + 0x16a0);
        fVar312 = *(float *)(bezier_basis0 + lVar153 + 0x16a4);
        fVar239 = *(float *)(bezier_basis0 + lVar153 + 0x16a8);
        fVar299 = *(float *)(bezier_basis0 + lVar153 + 0x16ac);
        fVar314 = *(float *)(bezier_basis0 + lVar153 + 0x1b18);
        fVar315 = *(float *)(bezier_basis0 + lVar153 + 0x1b1c);
        fVar242 = *(float *)(bezier_basis0 + lVar153 + 0x1b20);
        fVar300 = *(float *)(bezier_basis0 + lVar153 + 0x1b24);
        fVar316 = *(float *)(bezier_basis0 + lVar153 + 0x1b28);
        fVar317 = *(float *)(bezier_basis0 + lVar153 + 0x1b2c);
        fVar245 = *(float *)(bezier_basis0 + lVar153 + 0x1b30);
        fVar337 = *(float *)(bezier_basis0 + lVar153 + 0x1f9c);
        fVar158 = *(float *)(bezier_basis0 + lVar153 + 0x1fa0);
        fVar175 = *(float *)(bezier_basis0 + lVar153 + 0x1fa4);
        fVar178 = *(float *)(bezier_basis0 + lVar153 + 0x1fa8);
        fVar179 = *(float *)(bezier_basis0 + lVar153 + 0x1fac);
        fVar181 = *(float *)(bezier_basis0 + lVar153 + 0x1fb0);
        fVar159 = *(float *)(bezier_basis0 + lVar153 + 0x1fb4);
        local_7c0._0_16_ = auVar388;
        fVar176 = *(float *)(bezier_basis0 + lVar153 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar153 + 0x1fb8);
        fVar265 = *(float *)(bezier_basis0 + lVar153 + 0x16b0) + fVar176;
        local_5e0._4_4_ =
             fVar286 * fVar262 + fVar275 * fVar367 + fVar200 * fVar315 + fVar218 * fVar158;
        local_5e0._0_4_ =
             fVar278 * fVar260 + fVar274 * fVar358 + fVar182 * fVar314 + fVar220 * fVar337;
        fStack_5d8 = fVar287 * fVar263 + fVar276 * fVar369 + fVar204 * fVar242 + fVar237 * fVar175;
        fStack_5d4 = fVar289 * fVar264 + fVar277 * fVar371 + fVar207 * fVar300 + fVar256 * fVar178;
        fStack_5d0 = fVar278 * fVar266 + fVar312 * fVar358 + fVar182 * fVar316 + fVar220 * fVar179;
        fStack_5cc = fVar286 * fVar272 + fVar239 * fVar367 + fVar200 * fVar317 + fVar218 * fVar181;
        fStack_5c8 = fVar287 * fVar273 + fVar299 * fVar369 + fVar204 * fVar245 + fVar237 * fVar159;
        fStack_5c4 = *(float *)(bezier_basis0 + lVar153 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar153 + 0x1fb8) +
                     *(float *)(bezier_basis1 + lVar153 + 0x4a0) + 0.0;
        auVar191._0_4_ =
             fVar380 * fVar260 + fVar340 * fVar274 + fVar302 * fVar314 + fVar177 * fVar337;
        auVar191._4_4_ =
             fVar385 * fVar262 + fVar346 * fVar275 + fVar310 * fVar315 + fVar180 * fVar158;
        auVar191._8_4_ =
             fVar386 * fVar263 + fVar347 * fVar276 + fVar311 * fVar242 + fVar240 * fVar175;
        auVar191._12_4_ =
             fVar387 * fVar264 + fVar348 * fVar277 + fVar313 * fVar300 + fVar258 * fVar178;
        auVar191._16_4_ =
             fVar380 * fVar266 + fVar340 * fVar312 + fVar302 * fVar316 + fVar177 * fVar179;
        auVar191._20_4_ =
             fVar385 * fVar272 + fVar346 * fVar239 + fVar310 * fVar317 + fVar180 * fVar181;
        auVar191._24_4_ =
             fVar386 * fVar273 + fVar347 * fVar299 + fVar311 * fVar245 + fVar240 * fVar159;
        auVar191._28_4_ =
             fVar176 + *(float *)(bezier_basis1 + lVar153 + 0x4a0) + 0.0 +
                       *(float *)(bezier_basis1 + lVar153 + 0x1c) + 0.0;
        auVar281._0_4_ =
             fVar328 * fVar260 + fVar359 * fVar274 + fVar373 * fVar314 + fVar247 * fVar337;
        auVar281._4_4_ =
             fVar336 * fVar262 + fVar368 * fVar275 + fVar377 * fVar315 + fVar257 * fVar158;
        auVar281._8_4_ =
             fVar338 * fVar263 + fVar370 * fVar276 + fVar378 * fVar242 + fVar259 * fVar175;
        auVar281._12_4_ =
             fVar339 * fVar264 + fVar372 * fVar277 + fVar379 * fVar300 + fVar261 * fVar178;
        auVar281._16_4_ =
             fVar328 * fVar266 + fVar359 * fVar312 + fVar373 * fVar316 + fVar247 * fVar179;
        auVar281._20_4_ =
             fVar336 * fVar272 + fVar368 * fVar239 + fVar377 * fVar317 + fVar257 * fVar181;
        auVar281._24_4_ =
             fVar338 * fVar273 + fVar370 * fVar299 + fVar378 * fVar245 + fVar259 * fVar159;
        auVar281._28_4_ = *(float *)(bezier_basis0 + lVar153 + 0x122c) + fVar265;
        fVar260 = *(float *)(bezier_basis1 + lVar153 + 0x1b18);
        fVar262 = *(float *)(bezier_basis1 + lVar153 + 0x1b1c);
        fVar263 = *(float *)(bezier_basis1 + lVar153 + 0x1b20);
        fVar264 = *(float *)(bezier_basis1 + lVar153 + 0x1b24);
        fVar266 = *(float *)(bezier_basis1 + lVar153 + 0x1b28);
        fVar272 = *(float *)(bezier_basis1 + lVar153 + 0x1b2c);
        fVar273 = *(float *)(bezier_basis1 + lVar153 + 0x1b30);
        fVar274 = *(float *)(bezier_basis1 + lVar153 + 0x1f9c);
        fVar275 = *(float *)(bezier_basis1 + lVar153 + 0x1fa0);
        fVar276 = *(float *)(bezier_basis1 + lVar153 + 0x1fa4);
        fVar277 = *(float *)(bezier_basis1 + lVar153 + 0x1fa8);
        fVar312 = *(float *)(bezier_basis1 + lVar153 + 0x1fac);
        fVar239 = *(float *)(bezier_basis1 + lVar153 + 0x1fb0);
        fVar299 = *(float *)(bezier_basis1 + lVar153 + 0x1fb4);
        fVar314 = *(float *)(bezier_basis1 + lVar153 + 0x1694);
        fVar315 = *(float *)(bezier_basis1 + lVar153 + 0x1698);
        fVar242 = *(float *)(bezier_basis1 + lVar153 + 0x169c);
        fVar300 = *(float *)(bezier_basis1 + lVar153 + 0x16a0);
        fVar316 = *(float *)(bezier_basis1 + lVar153 + 0x16a4);
        fVar317 = *(float *)(bezier_basis1 + lVar153 + 0x16a8);
        fVar245 = *(float *)(bezier_basis1 + lVar153 + 0x16ac);
        fVar337 = *(float *)(bezier_basis1 + lVar153 + 0x1210);
        fVar158 = *(float *)(bezier_basis1 + lVar153 + 0x1214);
        fVar175 = *(float *)(bezier_basis1 + lVar153 + 0x1218);
        fVar178 = *(float *)(bezier_basis1 + lVar153 + 0x121c);
        fVar179 = *(float *)(bezier_basis1 + lVar153 + 0x1220);
        fVar181 = *(float *)(bezier_basis1 + lVar153 + 0x1224);
        fVar159 = *(float *)(bezier_basis1 + lVar153 + 0x1228);
        auVar296._0_4_ =
             fVar278 * fVar337 + fVar314 * fVar358 + fVar182 * fVar260 + fVar220 * fVar274;
        auVar296._4_4_ =
             fVar286 * fVar158 + fVar315 * fVar367 + fVar200 * fVar262 + fVar218 * fVar275;
        auVar296._8_4_ =
             fVar287 * fVar175 + fVar242 * fVar369 + fVar204 * fVar263 + fVar237 * fVar276;
        auVar296._12_4_ =
             fVar289 * fVar178 + fVar300 * fVar371 + fVar207 * fVar264 + fVar256 * fVar277;
        auVar296._16_4_ =
             fVar278 * fVar179 + fVar316 * fVar358 + fVar182 * fVar266 + fVar220 * fVar312;
        auVar296._20_4_ =
             fVar286 * fVar181 + fVar317 * fVar367 + fVar200 * fVar272 + fVar218 * fVar239;
        auVar296._24_4_ =
             fVar287 * fVar159 + fVar245 * fVar369 + fVar204 * fVar273 + fVar237 * fVar299;
        auVar296._28_4_ = fVar256 + fVar256 + fVar265 + 0.0;
        auVar323._0_4_ =
             fVar380 * fVar337 + fVar340 * fVar314 + fVar302 * fVar260 + fVar177 * fVar274;
        auVar323._4_4_ =
             fVar385 * fVar158 + fVar346 * fVar315 + fVar310 * fVar262 + fVar180 * fVar275;
        auVar323._8_4_ =
             fVar386 * fVar175 + fVar347 * fVar242 + fVar311 * fVar263 + fVar240 * fVar276;
        auVar323._12_4_ =
             fVar387 * fVar178 + fVar348 * fVar300 + fVar313 * fVar264 + fVar258 * fVar277;
        auVar323._16_4_ =
             fVar380 * fVar179 + fVar340 * fVar316 + fVar302 * fVar266 + fVar177 * fVar312;
        auVar323._20_4_ =
             fVar385 * fVar181 + fVar346 * fVar317 + fVar310 * fVar272 + fVar180 * fVar239;
        auVar323._24_4_ =
             fVar386 * fVar159 + fVar347 * fVar245 + fVar311 * fVar273 + fVar240 * fVar299;
        auVar323._28_4_ = fVar256 + fVar256 + fVar256 + 0.0;
        auVar216._0_4_ =
             fVar328 * fVar337 + fVar359 * fVar314 + fVar373 * fVar260 + fVar274 * fVar247;
        auVar216._4_4_ =
             fVar336 * fVar158 + fVar368 * fVar315 + fVar377 * fVar262 + fVar275 * fVar257;
        auVar216._8_4_ =
             fVar338 * fVar175 + fVar370 * fVar242 + fVar378 * fVar263 + fVar276 * fVar259;
        auVar216._12_4_ =
             fVar339 * fVar178 + fVar372 * fVar300 + fVar379 * fVar264 + fVar277 * fVar261;
        auVar216._16_4_ =
             fVar328 * fVar179 + fVar359 * fVar316 + fVar373 * fVar266 + fVar312 * fVar247;
        auVar216._20_4_ =
             fVar336 * fVar181 + fVar368 * fVar317 + fVar377 * fVar272 + fVar239 * fVar257;
        auVar216._24_4_ =
             fVar338 * fVar159 + fVar370 * fVar245 + fVar378 * fVar273 + fVar299 * fVar259;
        auVar216._28_4_ =
             *(float *)(bezier_basis1 + lVar153 + 0x122c) +
             *(float *)(bezier_basis1 + lVar153 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar153 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar153 + 0x1fb8);
        auVar252._8_4_ = 0x7fffffff;
        auVar252._0_8_ = 0x7fffffff7fffffff;
        auVar252._12_4_ = 0x7fffffff;
        auVar252._16_4_ = 0x7fffffff;
        auVar252._20_4_ = 0x7fffffff;
        auVar252._24_4_ = 0x7fffffff;
        auVar252._28_4_ = 0x7fffffff;
        auVar163 = vandps_avx(_local_5e0,auVar252);
        auVar39 = vandps_avx(auVar191,auVar252);
        auVar39 = vmaxps_avx(auVar163,auVar39);
        auVar163 = vandps_avx(auVar281,auVar252);
        auVar163 = vmaxps_avx(auVar39,auVar163);
        auVar211 = vpermilps_avx(auVar388,0);
        auVar282._16_16_ = auVar211;
        auVar282._0_16_ = auVar211;
        auVar163 = vcmpps_avx(auVar163,auVar282,1);
        auVar40 = vblendvps_avx(_local_5e0,auVar41,auVar163);
        auVar42 = vblendvps_avx(auVar191,_local_440,auVar163);
        auVar163 = vandps_avx(auVar296,auVar252);
        auVar39 = vandps_avx(auVar323,auVar252);
        auVar43 = vmaxps_avx(auVar163,auVar39);
        auVar163 = vandps_avx(auVar216,auVar252);
        auVar163 = vmaxps_avx(auVar43,auVar163);
        auVar43 = vcmpps_avx(auVar163,auVar282,1);
        auVar163 = vblendvps_avx(auVar296,auVar41,auVar43);
        auVar41 = vblendvps_avx(auVar323,_local_440,auVar43);
        fVar158 = auVar40._0_4_;
        fVar175 = auVar40._4_4_;
        fVar178 = auVar40._8_4_;
        fVar179 = auVar40._12_4_;
        fVar181 = auVar40._16_4_;
        fVar159 = auVar40._20_4_;
        fVar176 = auVar40._24_4_;
        fVar265 = auVar163._0_4_;
        fVar219 = auVar163._4_4_;
        fVar290 = auVar163._8_4_;
        fVar197 = auVar163._12_4_;
        fVar238 = auVar163._16_4_;
        fVar241 = auVar163._20_4_;
        fVar244 = auVar163._24_4_;
        fVar301 = -auVar163._28_4_;
        fVar220 = auVar42._0_4_;
        fVar237 = auVar42._4_4_;
        fVar262 = auVar42._8_4_;
        fVar272 = auVar42._12_4_;
        fVar276 = auVar42._16_4_;
        fVar299 = auVar42._20_4_;
        fVar300 = auVar42._24_4_;
        auVar166._0_4_ = fVar220 * fVar220 + fVar158 * fVar158;
        auVar166._4_4_ = fVar237 * fVar237 + fVar175 * fVar175;
        auVar166._8_4_ = fVar262 * fVar262 + fVar178 * fVar178;
        auVar166._12_4_ = fVar272 * fVar272 + fVar179 * fVar179;
        auVar166._16_4_ = fVar276 * fVar276 + fVar181 * fVar181;
        auVar166._20_4_ = fVar299 * fVar299 + fVar159 * fVar159;
        auVar166._24_4_ = fVar300 * fVar300 + fVar176 * fVar176;
        auVar166._28_4_ = auVar323._28_4_ + auVar40._28_4_;
        auVar40 = vrsqrtps_avx(auVar166);
        fVar177 = auVar40._0_4_;
        fVar218 = auVar40._4_4_;
        auVar53._4_4_ = fVar218 * 1.5;
        auVar53._0_4_ = fVar177 * 1.5;
        fVar180 = auVar40._8_4_;
        auVar53._8_4_ = fVar180 * 1.5;
        fVar240 = auVar40._12_4_;
        auVar53._12_4_ = fVar240 * 1.5;
        fVar256 = auVar40._16_4_;
        auVar53._16_4_ = fVar256 * 1.5;
        fVar260 = auVar40._20_4_;
        auVar53._20_4_ = fVar260 * 1.5;
        fVar263 = auVar40._24_4_;
        fVar337 = auVar39._28_4_;
        auVar53._24_4_ = fVar263 * 1.5;
        auVar53._28_4_ = fVar337;
        auVar54._4_4_ = fVar218 * fVar218 * fVar218 * auVar166._4_4_ * 0.5;
        auVar54._0_4_ = fVar177 * fVar177 * fVar177 * auVar166._0_4_ * 0.5;
        auVar54._8_4_ = fVar180 * fVar180 * fVar180 * auVar166._8_4_ * 0.5;
        auVar54._12_4_ = fVar240 * fVar240 * fVar240 * auVar166._12_4_ * 0.5;
        auVar54._16_4_ = fVar256 * fVar256 * fVar256 * auVar166._16_4_ * 0.5;
        auVar54._20_4_ = fVar260 * fVar260 * fVar260 * auVar166._20_4_ * 0.5;
        auVar54._24_4_ = fVar263 * fVar263 * fVar263 * auVar166._24_4_ * 0.5;
        auVar54._28_4_ = auVar166._28_4_;
        auVar39 = vsubps_avx(auVar53,auVar54);
        fVar177 = auVar39._0_4_;
        fVar240 = auVar39._4_4_;
        fVar263 = auVar39._8_4_;
        fVar273 = auVar39._12_4_;
        fVar277 = auVar39._16_4_;
        fVar314 = auVar39._20_4_;
        fVar316 = auVar39._24_4_;
        fVar218 = auVar41._0_4_;
        fVar256 = auVar41._4_4_;
        fVar264 = auVar41._8_4_;
        fVar274 = auVar41._12_4_;
        fVar312 = auVar41._16_4_;
        fVar315 = auVar41._20_4_;
        fVar317 = auVar41._24_4_;
        auVar167._0_4_ = fVar218 * fVar218 + fVar265 * fVar265;
        auVar167._4_4_ = fVar256 * fVar256 + fVar219 * fVar219;
        auVar167._8_4_ = fVar264 * fVar264 + fVar290 * fVar290;
        auVar167._12_4_ = fVar274 * fVar274 + fVar197 * fVar197;
        auVar167._16_4_ = fVar312 * fVar312 + fVar238 * fVar238;
        auVar167._20_4_ = fVar315 * fVar315 + fVar241 * fVar241;
        auVar167._24_4_ = fVar317 * fVar317 + fVar244 * fVar244;
        auVar167._28_4_ = auVar163._28_4_ + auVar39._28_4_;
        auVar163 = vrsqrtps_avx(auVar167);
        fVar180 = auVar163._0_4_;
        fVar260 = auVar163._4_4_;
        auVar55._4_4_ = fVar260 * 1.5;
        auVar55._0_4_ = fVar180 * 1.5;
        fVar266 = auVar163._8_4_;
        auVar55._8_4_ = fVar266 * 1.5;
        fVar275 = auVar163._12_4_;
        auVar55._12_4_ = fVar275 * 1.5;
        fVar239 = auVar163._16_4_;
        auVar55._16_4_ = fVar239 * 1.5;
        fVar242 = auVar163._20_4_;
        auVar55._20_4_ = fVar242 * 1.5;
        fVar245 = auVar163._24_4_;
        auVar55._24_4_ = fVar245 * 1.5;
        auVar55._28_4_ = fVar337;
        auVar56._4_4_ = fVar260 * fVar260 * fVar260 * auVar167._4_4_ * 0.5;
        auVar56._0_4_ = fVar180 * fVar180 * fVar180 * auVar167._0_4_ * 0.5;
        auVar56._8_4_ = fVar266 * fVar266 * fVar266 * auVar167._8_4_ * 0.5;
        auVar56._12_4_ = fVar275 * fVar275 * fVar275 * auVar167._12_4_ * 0.5;
        auVar56._16_4_ = fVar239 * fVar239 * fVar239 * auVar167._16_4_ * 0.5;
        auVar56._20_4_ = fVar242 * fVar242 * fVar242 * auVar167._20_4_ * 0.5;
        auVar56._24_4_ = fVar245 * fVar245 * fVar245 * auVar167._24_4_ * 0.5;
        auVar56._28_4_ = auVar167._28_4_;
        auVar163 = vsubps_avx(auVar55,auVar56);
        fVar180 = auVar163._0_4_;
        fVar260 = auVar163._4_4_;
        fVar266 = auVar163._8_4_;
        fVar275 = auVar163._12_4_;
        fVar239 = auVar163._16_4_;
        fVar242 = auVar163._20_4_;
        fVar245 = auVar163._24_4_;
        fVar220 = fVar157 * fVar220 * fVar177;
        fVar237 = fVar174 * fVar237 * fVar240;
        auVar57._4_4_ = fVar237;
        auVar57._0_4_ = fVar220;
        fVar262 = fStack_798 * fVar262 * fVar263;
        auVar57._8_4_ = fVar262;
        fVar272 = fStack_794 * fVar272 * fVar273;
        auVar57._12_4_ = fVar272;
        fVar276 = fStack_790 * fVar276 * fVar277;
        auVar57._16_4_ = fVar276;
        fVar299 = fStack_78c * fVar299 * fVar314;
        auVar57._20_4_ = fVar299;
        fVar300 = fStack_788 * fVar300 * fVar316;
        auVar57._24_4_ = fVar300;
        auVar57._28_4_ = fVar301;
        local_5e0._4_4_ = auVar322._4_4_ + fVar237;
        local_5e0._0_4_ = auVar322._0_4_ + fVar220;
        fStack_5d8 = auVar322._8_4_ + fVar262;
        fStack_5d4 = auVar322._12_4_ + fVar272;
        fStack_5d0 = auVar322._16_4_ + fVar276;
        fStack_5cc = auVar322._20_4_ + fVar299;
        fStack_5c8 = auVar322._24_4_ + fVar300;
        fStack_5c4 = auVar322._28_4_ + fVar301;
        fVar220 = fVar157 * fVar177 * -fVar158;
        fVar237 = fVar174 * fVar240 * -fVar175;
        auVar58._4_4_ = fVar237;
        auVar58._0_4_ = fVar220;
        fVar262 = fStack_798 * fVar263 * -fVar178;
        auVar58._8_4_ = fVar262;
        fVar272 = fStack_794 * fVar273 * -fVar179;
        auVar58._12_4_ = fVar272;
        fVar276 = fStack_790 * fVar277 * -fVar181;
        auVar58._16_4_ = fVar276;
        fVar299 = fStack_78c * fVar314 * -fVar159;
        auVar58._20_4_ = fVar299;
        fVar300 = fStack_788 * fVar316 * -fVar176;
        auVar58._24_4_ = fVar300;
        auVar58._28_4_ = fVar337;
        local_520._4_4_ = fVar237 + auVar353._4_4_;
        local_520._0_4_ = fVar220 + auVar353._0_4_;
        fStack_518 = fVar262 + auVar353._8_4_;
        fStack_514 = fVar272 + auVar353._12_4_;
        fStack_510 = fVar276 + auVar353._16_4_;
        fStack_50c = fVar299 + auVar353._20_4_;
        fStack_508 = fVar300 + auVar353._24_4_;
        fStack_504 = fVar337 + 0.0;
        fVar220 = fVar157 * fVar177 * 0.0;
        fVar177 = fVar174 * fVar240 * 0.0;
        auVar59._4_4_ = fVar177;
        auVar59._0_4_ = fVar220;
        fVar237 = fStack_798 * fVar263 * 0.0;
        auVar59._8_4_ = fVar237;
        fVar240 = fStack_794 * fVar273 * 0.0;
        auVar59._12_4_ = fVar240;
        fVar262 = fStack_790 * fVar277 * 0.0;
        auVar59._16_4_ = fVar262;
        fVar263 = fStack_78c * fVar314 * 0.0;
        auVar59._20_4_ = fVar263;
        fVar272 = fStack_788 * fVar316 * 0.0;
        auVar59._24_4_ = fVar272;
        auVar59._28_4_ = fVar258;
        auVar135._4_4_ = fStack_4fc;
        auVar135._0_4_ = local_500;
        auVar135._8_4_ = fStack_4f8;
        auVar135._12_4_ = fStack_4f4;
        auVar135._16_4_ = fStack_4f0;
        auVar135._20_4_ = fStack_4ec;
        auVar135._24_4_ = fStack_4e8;
        auVar135._28_4_ = fStack_4e4;
        auVar283._0_4_ = local_500 + fVar220;
        auVar283._4_4_ = fStack_4fc + fVar177;
        auVar283._8_4_ = fStack_4f8 + fVar237;
        auVar283._12_4_ = fStack_4f4 + fVar240;
        auVar283._16_4_ = fStack_4f0 + fVar262;
        auVar283._20_4_ = fStack_4ec + fVar263;
        auVar283._24_4_ = fStack_4e8 + fVar272;
        auVar283._28_4_ = fStack_4e4 + fVar258;
        fVar220 = local_680._0_4_ * fVar218 * fVar180;
        fVar177 = local_680._4_4_ * fVar256 * fVar260;
        auVar60._4_4_ = fVar177;
        auVar60._0_4_ = fVar220;
        fVar218 = local_680._8_4_ * fVar264 * fVar266;
        auVar60._8_4_ = fVar218;
        fVar237 = local_680._12_4_ * fVar274 * fVar275;
        auVar60._12_4_ = fVar237;
        fVar240 = local_680._16_4_ * fVar312 * fVar239;
        auVar60._16_4_ = fVar240;
        fVar256 = local_680._20_4_ * fVar315 * fVar242;
        auVar60._20_4_ = fVar256;
        fVar258 = local_680._24_4_ * fVar317 * fVar245;
        auVar60._24_4_ = fVar258;
        auVar60._28_4_ = auVar41._28_4_;
        auVar42 = vsubps_avx(auVar322,auVar57);
        auVar324._0_4_ = (float)local_380._0_4_ + fVar220;
        auVar324._4_4_ = (float)local_380._4_4_ + fVar177;
        auVar324._8_4_ = fStack_378 + fVar218;
        auVar324._12_4_ = fStack_374 + fVar237;
        auVar324._16_4_ = fStack_370 + fVar240;
        auVar324._20_4_ = fStack_36c + fVar256;
        auVar324._24_4_ = fStack_368 + fVar258;
        auVar324._28_4_ = register0x0000135c + auVar41._28_4_;
        fVar220 = local_680._0_4_ * fVar180 * -fVar265;
        fVar177 = local_680._4_4_ * fVar260 * -fVar219;
        auVar61._4_4_ = fVar177;
        auVar61._0_4_ = fVar220;
        fVar218 = local_680._8_4_ * fVar266 * -fVar290;
        auVar61._8_4_ = fVar218;
        fVar237 = local_680._12_4_ * fVar275 * -fVar197;
        auVar61._12_4_ = fVar237;
        fVar240 = local_680._16_4_ * fVar239 * -fVar238;
        auVar61._16_4_ = fVar240;
        fVar256 = local_680._20_4_ * fVar242 * -fVar241;
        auVar61._20_4_ = fVar256;
        fVar258 = local_680._24_4_ * fVar245 * -fVar244;
        auVar61._24_4_ = fVar258;
        auVar61._28_4_ = fVar372;
        auVar43 = vsubps_avx(auVar353,auVar58);
        auVar333._0_4_ = fVar220 + auVar228._0_4_;
        auVar333._4_4_ = fVar177 + auVar228._4_4_;
        auVar333._8_4_ = fVar218 + auVar228._8_4_;
        auVar333._12_4_ = fVar237 + auVar228._12_4_;
        auVar333._16_4_ = fVar240 + auVar228._16_4_;
        auVar333._20_4_ = fVar256 + auVar228._20_4_;
        auVar333._24_4_ = fVar258 + auVar228._24_4_;
        auVar333._28_4_ = fVar372 + auVar228._28_4_;
        fVar220 = local_680._0_4_ * fVar180 * 0.0;
        fVar177 = local_680._4_4_ * fVar260 * 0.0;
        auVar62._4_4_ = fVar177;
        auVar62._0_4_ = fVar220;
        fVar218 = local_680._8_4_ * fVar266 * 0.0;
        auVar62._8_4_ = fVar218;
        fVar180 = local_680._12_4_ * fVar275 * 0.0;
        auVar62._12_4_ = fVar180;
        fVar237 = local_680._16_4_ * fVar239 * 0.0;
        auVar62._16_4_ = fVar237;
        fVar240 = local_680._20_4_ * fVar242 * 0.0;
        auVar62._20_4_ = fVar240;
        fVar256 = local_680._24_4_ * fVar245 * 0.0;
        auVar62._24_4_ = fVar256;
        auVar62._28_4_ = 0x3f000000;
        auVar44 = vsubps_avx(auVar135,auVar59);
        auVar375._0_4_ = fVar220 + (float)local_360._0_4_;
        auVar375._4_4_ = fVar177 + (float)local_360._4_4_;
        auVar375._8_4_ = fVar218 + fStack_358;
        auVar375._12_4_ = fVar180 + fStack_354;
        auVar375._16_4_ = fVar237 + fStack_350;
        auVar375._20_4_ = fVar240 + fStack_34c;
        auVar375._24_4_ = fVar256 + fStack_348;
        auVar375._28_4_ = fStack_344 + 0.5;
        auVar163 = vsubps_avx(_local_380,auVar60);
        auVar39 = vsubps_avx(auVar228,auVar61);
        auVar46 = vsubps_avx(_local_360,auVar62);
        auVar40 = vsubps_avx(auVar333,auVar43);
        auVar41 = vsubps_avx(auVar375,auVar44);
        auVar63._4_4_ = auVar44._4_4_ * auVar40._4_4_;
        auVar63._0_4_ = auVar44._0_4_ * auVar40._0_4_;
        auVar63._8_4_ = auVar44._8_4_ * auVar40._8_4_;
        auVar63._12_4_ = auVar44._12_4_ * auVar40._12_4_;
        auVar63._16_4_ = auVar44._16_4_ * auVar40._16_4_;
        auVar63._20_4_ = auVar44._20_4_ * auVar40._20_4_;
        auVar63._24_4_ = auVar44._24_4_ * auVar40._24_4_;
        auVar63._28_4_ = fVar348;
        auVar64._4_4_ = auVar43._4_4_ * auVar41._4_4_;
        auVar64._0_4_ = auVar43._0_4_ * auVar41._0_4_;
        auVar64._8_4_ = auVar43._8_4_ * auVar41._8_4_;
        auVar64._12_4_ = auVar43._12_4_ * auVar41._12_4_;
        auVar64._16_4_ = auVar43._16_4_ * auVar41._16_4_;
        auVar64._20_4_ = auVar43._20_4_ * auVar41._20_4_;
        auVar64._24_4_ = auVar43._24_4_ * auVar41._24_4_;
        auVar64._28_4_ = fStack_344;
        auVar45 = vsubps_avx(auVar64,auVar63);
        auVar65._4_4_ = auVar42._4_4_ * auVar41._4_4_;
        auVar65._0_4_ = auVar42._0_4_ * auVar41._0_4_;
        auVar65._8_4_ = auVar42._8_4_ * auVar41._8_4_;
        auVar65._12_4_ = auVar42._12_4_ * auVar41._12_4_;
        auVar65._16_4_ = auVar42._16_4_ * auVar41._16_4_;
        auVar65._20_4_ = auVar42._20_4_ * auVar41._20_4_;
        auVar65._24_4_ = auVar42._24_4_ * auVar41._24_4_;
        auVar65._28_4_ = auVar41._28_4_;
        auVar48 = vsubps_avx(auVar324,auVar42);
        auVar66._4_4_ = auVar44._4_4_ * auVar48._4_4_;
        auVar66._0_4_ = auVar44._0_4_ * auVar48._0_4_;
        auVar66._8_4_ = auVar44._8_4_ * auVar48._8_4_;
        auVar66._12_4_ = auVar44._12_4_ * auVar48._12_4_;
        auVar66._16_4_ = auVar44._16_4_ * auVar48._16_4_;
        auVar66._20_4_ = auVar44._20_4_ * auVar48._20_4_;
        auVar66._24_4_ = auVar44._24_4_ * auVar48._24_4_;
        auVar66._28_4_ = auVar228._28_4_;
        auVar38 = vsubps_avx(auVar66,auVar65);
        auVar67._4_4_ = auVar48._4_4_ * auVar43._4_4_;
        auVar67._0_4_ = auVar48._0_4_ * auVar43._0_4_;
        auVar67._8_4_ = auVar48._8_4_ * auVar43._8_4_;
        auVar67._12_4_ = auVar48._12_4_ * auVar43._12_4_;
        auVar67._16_4_ = auVar48._16_4_ * auVar43._16_4_;
        auVar67._20_4_ = auVar48._20_4_ * auVar43._20_4_;
        auVar67._24_4_ = auVar48._24_4_ * auVar43._24_4_;
        auVar67._28_4_ = auVar41._28_4_;
        auVar68._4_4_ = auVar42._4_4_ * auVar40._4_4_;
        auVar68._0_4_ = auVar42._0_4_ * auVar40._0_4_;
        auVar68._8_4_ = auVar42._8_4_ * auVar40._8_4_;
        auVar68._12_4_ = auVar42._12_4_ * auVar40._12_4_;
        auVar68._16_4_ = auVar42._16_4_ * auVar40._16_4_;
        auVar68._20_4_ = auVar42._20_4_ * auVar40._20_4_;
        auVar68._24_4_ = auVar42._24_4_ * auVar40._24_4_;
        auVar68._28_4_ = auVar40._28_4_;
        auVar40 = vsubps_avx(auVar68,auVar67);
        auVar168._0_4_ = auVar45._0_4_ * 0.0 + auVar40._0_4_ + auVar38._0_4_ * 0.0;
        auVar168._4_4_ = auVar45._4_4_ * 0.0 + auVar40._4_4_ + auVar38._4_4_ * 0.0;
        auVar168._8_4_ = auVar45._8_4_ * 0.0 + auVar40._8_4_ + auVar38._8_4_ * 0.0;
        auVar168._12_4_ = auVar45._12_4_ * 0.0 + auVar40._12_4_ + auVar38._12_4_ * 0.0;
        auVar168._16_4_ = auVar45._16_4_ * 0.0 + auVar40._16_4_ + auVar38._16_4_ * 0.0;
        auVar168._20_4_ = auVar45._20_4_ * 0.0 + auVar40._20_4_ + auVar38._20_4_ * 0.0;
        auVar168._24_4_ = auVar45._24_4_ * 0.0 + auVar40._24_4_ + auVar38._24_4_ * 0.0;
        auVar168._28_4_ = auVar40._28_4_ + auVar40._28_4_ + auVar38._28_4_;
        auVar45 = vcmpps_avx(auVar168,ZEXT432(0) << 0x20,2);
        _local_4e0 = vblendvps_avx(auVar163,_local_5e0,auVar45);
        _local_5a0 = vblendvps_avx(auVar39,_local_520,auVar45);
        auVar163 = vblendvps_avx(auVar46,auVar283,auVar45);
        auVar39 = vblendvps_avx(auVar42,auVar324,auVar45);
        auVar40 = vblendvps_avx(auVar43,auVar333,auVar45);
        auVar41 = vblendvps_avx(auVar44,auVar375,auVar45);
        auVar42 = vblendvps_avx(auVar324,auVar42,auVar45);
        auVar43 = vblendvps_avx(auVar333,auVar43,auVar45);
        _local_6a0 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
        _auStack_690 = auVar322._16_16_;
        auVar44 = vblendvps_avx(auVar375,auVar44,auVar45);
        auVar42 = vsubps_avx(auVar42,_local_4e0);
        auVar48 = vsubps_avx(auVar43,_local_5a0);
        auVar44 = vsubps_avx(auVar44,auVar163);
        auVar38 = vsubps_avx(_local_5a0,auVar40);
        fVar220 = auVar48._0_4_;
        fVar159 = auVar163._0_4_;
        fVar240 = auVar48._4_4_;
        fVar176 = auVar163._4_4_;
        auVar69._4_4_ = fVar176 * fVar240;
        auVar69._0_4_ = fVar159 * fVar220;
        fVar263 = auVar48._8_4_;
        fVar265 = auVar163._8_4_;
        auVar69._8_4_ = fVar265 * fVar263;
        fVar274 = auVar48._12_4_;
        fVar219 = auVar163._12_4_;
        auVar69._12_4_ = fVar219 * fVar274;
        fVar239 = auVar48._16_4_;
        fVar290 = auVar163._16_4_;
        auVar69._16_4_ = fVar290 * fVar239;
        fVar300 = auVar48._20_4_;
        fVar197 = auVar163._20_4_;
        auVar69._20_4_ = fVar197 * fVar300;
        fVar158 = auVar48._24_4_;
        fVar238 = auVar163._24_4_;
        auVar69._24_4_ = fVar238 * fVar158;
        auVar69._28_4_ = auVar43._28_4_;
        fVar177 = local_5a0._0_4_;
        fVar204 = auVar44._0_4_;
        fVar256 = local_5a0._4_4_;
        fVar206 = auVar44._4_4_;
        auVar70._4_4_ = fVar206 * fVar256;
        auVar70._0_4_ = fVar204 * fVar177;
        fVar264 = local_5a0._8_4_;
        fVar207 = auVar44._8_4_;
        auVar70._8_4_ = fVar207 * fVar264;
        fVar275 = local_5a0._12_4_;
        fVar291 = auVar44._12_4_;
        auVar70._12_4_ = fVar291 * fVar275;
        fVar299 = local_5a0._16_4_;
        fVar201 = auVar44._16_4_;
        auVar70._16_4_ = fVar201 * fVar299;
        fVar316 = local_5a0._20_4_;
        fVar203 = auVar44._20_4_;
        auVar70._20_4_ = fVar203 * fVar316;
        fVar175 = local_5a0._24_4_;
        fVar205 = auVar44._24_4_;
        uVar12 = auVar46._28_4_;
        auVar70._24_4_ = fVar205 * fVar175;
        auVar70._28_4_ = uVar12;
        auVar43 = vsubps_avx(auVar70,auVar69);
        fVar218 = local_4e0._0_4_;
        fVar258 = local_4e0._4_4_;
        auVar71._4_4_ = fVar206 * fVar258;
        auVar71._0_4_ = fVar204 * fVar218;
        fVar266 = local_4e0._8_4_;
        auVar71._8_4_ = fVar207 * fVar266;
        fVar276 = local_4e0._12_4_;
        auVar71._12_4_ = fVar291 * fVar276;
        fVar314 = local_4e0._16_4_;
        auVar71._16_4_ = fVar201 * fVar314;
        fVar317 = local_4e0._20_4_;
        auVar71._20_4_ = fVar203 * fVar317;
        fVar178 = local_4e0._24_4_;
        auVar71._24_4_ = fVar205 * fVar178;
        auVar71._28_4_ = uVar12;
        fVar180 = auVar42._0_4_;
        fVar260 = auVar42._4_4_;
        auVar72._4_4_ = fVar176 * fVar260;
        auVar72._0_4_ = fVar159 * fVar180;
        fVar272 = auVar42._8_4_;
        auVar72._8_4_ = fVar265 * fVar272;
        fVar277 = auVar42._12_4_;
        auVar72._12_4_ = fVar219 * fVar277;
        fVar315 = auVar42._16_4_;
        auVar72._16_4_ = fVar290 * fVar315;
        fVar245 = auVar42._20_4_;
        auVar72._20_4_ = fVar197 * fVar245;
        fVar179 = auVar42._24_4_;
        auVar72._24_4_ = fVar238 * fVar179;
        auVar72._28_4_ = auVar375._28_4_;
        auVar46 = vsubps_avx(auVar72,auVar71);
        auVar73._4_4_ = fVar256 * fVar260;
        auVar73._0_4_ = fVar177 * fVar180;
        auVar73._8_4_ = fVar264 * fVar272;
        auVar73._12_4_ = fVar275 * fVar277;
        auVar73._16_4_ = fVar299 * fVar315;
        auVar73._20_4_ = fVar316 * fVar245;
        auVar73._24_4_ = fVar175 * fVar179;
        auVar73._28_4_ = uVar12;
        auVar382._0_4_ = fVar218 * fVar220;
        auVar382._4_4_ = fVar258 * fVar240;
        auVar382._8_4_ = fVar266 * fVar263;
        auVar382._12_4_ = fVar276 * fVar274;
        auVar382._16_4_ = fVar314 * fVar239;
        auVar382._20_4_ = fVar317 * fVar300;
        auVar382._24_4_ = fVar178 * fVar158;
        auVar382._28_4_ = 0;
        auVar164 = vsubps_avx(auVar382,auVar73);
        auVar165 = vsubps_avx(auVar163,auVar41);
        fVar237 = auVar164._28_4_ + auVar46._28_4_;
        auVar192._0_4_ = auVar164._0_4_ + auVar46._0_4_ * 0.0 + auVar43._0_4_ * 0.0;
        auVar192._4_4_ = auVar164._4_4_ + auVar46._4_4_ * 0.0 + auVar43._4_4_ * 0.0;
        auVar192._8_4_ = auVar164._8_4_ + auVar46._8_4_ * 0.0 + auVar43._8_4_ * 0.0;
        auVar192._12_4_ = auVar164._12_4_ + auVar46._12_4_ * 0.0 + auVar43._12_4_ * 0.0;
        auVar192._16_4_ = auVar164._16_4_ + auVar46._16_4_ * 0.0 + auVar43._16_4_ * 0.0;
        auVar192._20_4_ = auVar164._20_4_ + auVar46._20_4_ * 0.0 + auVar43._20_4_ * 0.0;
        auVar192._24_4_ = auVar164._24_4_ + auVar46._24_4_ * 0.0 + auVar43._24_4_ * 0.0;
        auVar192._28_4_ = fVar237 + auVar43._28_4_;
        auVar196 = ZEXT3264(auVar192);
        fVar241 = auVar38._0_4_;
        fVar244 = auVar38._4_4_;
        auVar74._4_4_ = fVar244 * auVar41._4_4_;
        auVar74._0_4_ = fVar241 * auVar41._0_4_;
        fVar301 = auVar38._8_4_;
        auVar74._8_4_ = fVar301 * auVar41._8_4_;
        fVar182 = auVar38._12_4_;
        auVar74._12_4_ = fVar182 * auVar41._12_4_;
        fVar198 = auVar38._16_4_;
        auVar74._16_4_ = fVar198 * auVar41._16_4_;
        fVar200 = auVar38._20_4_;
        auVar74._20_4_ = fVar200 * auVar41._20_4_;
        fVar202 = auVar38._24_4_;
        auVar74._24_4_ = fVar202 * auVar41._24_4_;
        auVar74._28_4_ = fVar237;
        fVar237 = auVar165._0_4_;
        fVar262 = auVar165._4_4_;
        auVar75._4_4_ = auVar40._4_4_ * fVar262;
        auVar75._0_4_ = auVar40._0_4_ * fVar237;
        fVar273 = auVar165._8_4_;
        auVar75._8_4_ = auVar40._8_4_ * fVar273;
        fVar312 = auVar165._12_4_;
        auVar75._12_4_ = auVar40._12_4_ * fVar312;
        fVar242 = auVar165._16_4_;
        auVar75._16_4_ = auVar40._16_4_ * fVar242;
        fVar337 = auVar165._20_4_;
        auVar75._20_4_ = auVar40._20_4_ * fVar337;
        fVar181 = auVar165._24_4_;
        auVar75._24_4_ = auVar40._24_4_ * fVar181;
        auVar75._28_4_ = auVar164._28_4_;
        auVar46 = vsubps_avx(auVar75,auVar74);
        auVar38 = vsubps_avx(_local_4e0,auVar39);
        fVar247 = auVar38._0_4_;
        fVar257 = auVar38._4_4_;
        auVar76._4_4_ = fVar257 * auVar41._4_4_;
        auVar76._0_4_ = fVar247 * auVar41._0_4_;
        fVar259 = auVar38._8_4_;
        auVar76._8_4_ = fVar259 * auVar41._8_4_;
        fVar261 = auVar38._12_4_;
        auVar76._12_4_ = fVar261 * auVar41._12_4_;
        fVar278 = auVar38._16_4_;
        auVar76._16_4_ = fVar278 * auVar41._16_4_;
        fVar286 = auVar38._20_4_;
        auVar76._20_4_ = fVar286 * auVar41._20_4_;
        fVar287 = auVar38._24_4_;
        auVar76._24_4_ = fVar287 * auVar41._24_4_;
        auVar76._28_4_ = auVar41._28_4_;
        auVar77._4_4_ = auVar39._4_4_ * fVar262;
        auVar77._0_4_ = auVar39._0_4_ * fVar237;
        auVar77._8_4_ = auVar39._8_4_ * fVar273;
        auVar77._12_4_ = auVar39._12_4_ * fVar312;
        auVar77._16_4_ = auVar39._16_4_ * fVar242;
        auVar77._20_4_ = auVar39._20_4_ * fVar337;
        auVar77._24_4_ = auVar39._24_4_ * fVar181;
        auVar77._28_4_ = auVar43._28_4_;
        auVar43 = vsubps_avx(auVar76,auVar77);
        auVar78._4_4_ = auVar40._4_4_ * fVar257;
        auVar78._0_4_ = auVar40._0_4_ * fVar247;
        auVar78._8_4_ = auVar40._8_4_ * fVar259;
        auVar78._12_4_ = auVar40._12_4_ * fVar261;
        auVar78._16_4_ = auVar40._16_4_ * fVar278;
        auVar78._20_4_ = auVar40._20_4_ * fVar286;
        auVar78._24_4_ = auVar40._24_4_ * fVar287;
        auVar78._28_4_ = auVar41._28_4_;
        auVar79._4_4_ = auVar39._4_4_ * fVar244;
        auVar79._0_4_ = auVar39._0_4_ * fVar241;
        auVar79._8_4_ = auVar39._8_4_ * fVar301;
        auVar79._12_4_ = auVar39._12_4_ * fVar182;
        auVar79._16_4_ = auVar39._16_4_ * fVar198;
        auVar79._20_4_ = auVar39._20_4_ * fVar200;
        auVar79._24_4_ = auVar39._24_4_ * fVar202;
        auVar79._28_4_ = auVar39._28_4_;
        auVar39 = vsubps_avx(auVar79,auVar78);
        auVar253._0_4_ = auVar46._0_4_ * 0.0 + auVar39._0_4_ + auVar43._0_4_ * 0.0;
        auVar253._4_4_ = auVar46._4_4_ * 0.0 + auVar39._4_4_ + auVar43._4_4_ * 0.0;
        auVar253._8_4_ = auVar46._8_4_ * 0.0 + auVar39._8_4_ + auVar43._8_4_ * 0.0;
        auVar253._12_4_ = auVar46._12_4_ * 0.0 + auVar39._12_4_ + auVar43._12_4_ * 0.0;
        auVar253._16_4_ = auVar46._16_4_ * 0.0 + auVar39._16_4_ + auVar43._16_4_ * 0.0;
        auVar253._20_4_ = auVar46._20_4_ * 0.0 + auVar39._20_4_ + auVar43._20_4_ * 0.0;
        auVar253._24_4_ = auVar46._24_4_ * 0.0 + auVar39._24_4_ + auVar43._24_4_ * 0.0;
        auVar253._28_4_ = auVar39._28_4_ + auVar39._28_4_ + auVar43._28_4_;
        auVar39 = vmaxps_avx(auVar192,auVar253);
        auVar39 = vcmpps_avx(auVar39,ZEXT832(0) << 0x20,2);
        auVar211 = vpackssdw_avx(auVar39._0_16_,auVar39._16_16_);
        auVar211 = vpand_avx(auVar211,_local_6a0);
        auVar251 = vpmovsxwd_avx(auVar211);
        auVar222 = vpunpckhwd_avx(auVar211,auVar211);
        auVar230._16_16_ = auVar222;
        auVar230._0_16_ = auVar251;
        if ((((((((auVar230 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar230 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar230 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar230 >> 0x7f,0) == '\0') &&
              (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar222 >> 0x3f,0) == '\0') &&
            (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar222[0xf]) {
LAB_01183e88:
          auVar298 = ZEXT3264(CONCAT824(uStack_468,
                                        CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
          auVar376._4_4_ = fVar174;
          auVar376._0_4_ = fVar157;
          auVar376._8_4_ = fStack_798;
          auVar376._12_4_ = fStack_794;
          auVar376._16_4_ = fStack_790;
          auVar376._20_4_ = fStack_78c;
          auVar376._24_4_ = fStack_788;
          auVar376._28_4_ = fStack_784;
        }
        else {
          auVar80._4_4_ = fVar262 * fVar240;
          auVar80._0_4_ = fVar237 * fVar220;
          auVar80._8_4_ = fVar273 * fVar263;
          auVar80._12_4_ = fVar312 * fVar274;
          auVar80._16_4_ = fVar242 * fVar239;
          auVar80._20_4_ = fVar337 * fVar300;
          auVar80._24_4_ = fVar181 * fVar158;
          auVar80._28_4_ = auVar222._12_4_;
          auVar354._0_4_ = fVar241 * fVar204;
          auVar354._4_4_ = fVar244 * fVar206;
          auVar354._8_4_ = fVar301 * fVar207;
          auVar354._12_4_ = fVar182 * fVar291;
          auVar354._16_4_ = fVar198 * fVar201;
          auVar354._20_4_ = fVar200 * fVar203;
          auVar354._24_4_ = fVar202 * fVar205;
          auVar354._28_4_ = 0;
          auVar40 = vsubps_avx(auVar354,auVar80);
          auVar81._4_4_ = fVar257 * fVar206;
          auVar81._0_4_ = fVar247 * fVar204;
          auVar81._8_4_ = fVar259 * fVar207;
          auVar81._12_4_ = fVar261 * fVar291;
          auVar81._16_4_ = fVar278 * fVar201;
          auVar81._20_4_ = fVar286 * fVar203;
          auVar81._24_4_ = fVar287 * fVar205;
          auVar81._28_4_ = auVar44._28_4_;
          auVar82._4_4_ = fVar262 * fVar260;
          auVar82._0_4_ = fVar237 * fVar180;
          auVar82._8_4_ = fVar273 * fVar272;
          auVar82._12_4_ = fVar312 * fVar277;
          auVar82._16_4_ = fVar242 * fVar315;
          auVar82._20_4_ = fVar337 * fVar245;
          auVar82._24_4_ = fVar181 * fVar179;
          auVar82._28_4_ = auVar165._28_4_;
          auVar41 = vsubps_avx(auVar82,auVar81);
          auVar83._4_4_ = fVar244 * fVar260;
          auVar83._0_4_ = fVar241 * fVar180;
          auVar83._8_4_ = fVar301 * fVar272;
          auVar83._12_4_ = fVar182 * fVar277;
          auVar83._16_4_ = fVar198 * fVar315;
          auVar83._20_4_ = fVar200 * fVar245;
          auVar83._24_4_ = fVar202 * fVar179;
          auVar83._28_4_ = auVar192._28_4_;
          auVar84._4_4_ = fVar257 * fVar240;
          auVar84._0_4_ = fVar247 * fVar220;
          auVar84._8_4_ = fVar259 * fVar263;
          auVar84._12_4_ = fVar261 * fVar274;
          auVar84._16_4_ = fVar278 * fVar239;
          auVar84._20_4_ = fVar286 * fVar300;
          auVar84._24_4_ = fVar287 * fVar158;
          auVar84._28_4_ = auVar48._28_4_;
          auVar43 = vsubps_avx(auVar84,auVar83);
          auVar297._0_4_ = auVar40._0_4_ * 0.0 + auVar43._0_4_ + auVar41._0_4_ * 0.0;
          auVar297._4_4_ = auVar40._4_4_ * 0.0 + auVar43._4_4_ + auVar41._4_4_ * 0.0;
          auVar297._8_4_ = auVar40._8_4_ * 0.0 + auVar43._8_4_ + auVar41._8_4_ * 0.0;
          auVar297._12_4_ = auVar40._12_4_ * 0.0 + auVar43._12_4_ + auVar41._12_4_ * 0.0;
          auVar297._16_4_ = auVar40._16_4_ * 0.0 + auVar43._16_4_ + auVar41._16_4_ * 0.0;
          auVar297._20_4_ = auVar40._20_4_ * 0.0 + auVar43._20_4_ + auVar41._20_4_ * 0.0;
          auVar297._24_4_ = auVar40._24_4_ * 0.0 + auVar43._24_4_ + auVar41._24_4_ * 0.0;
          auVar297._28_4_ = auVar48._28_4_ + auVar43._28_4_ + auVar192._28_4_;
          auVar39 = vrcpps_avx(auVar297);
          fVar180 = auVar39._0_4_;
          fVar237 = auVar39._4_4_;
          auVar85._4_4_ = auVar297._4_4_ * fVar237;
          auVar85._0_4_ = auVar297._0_4_ * fVar180;
          fVar240 = auVar39._8_4_;
          auVar85._8_4_ = auVar297._8_4_ * fVar240;
          fVar260 = auVar39._12_4_;
          auVar85._12_4_ = auVar297._12_4_ * fVar260;
          fVar262 = auVar39._16_4_;
          auVar85._16_4_ = auVar297._16_4_ * fVar262;
          fVar263 = auVar39._20_4_;
          auVar85._20_4_ = auVar297._20_4_ * fVar263;
          fVar272 = auVar39._24_4_;
          auVar85._24_4_ = auVar297._24_4_ * fVar272;
          auVar85._28_4_ = auVar165._28_4_;
          auVar355._8_4_ = 0x3f800000;
          auVar355._0_8_ = 0x3f8000003f800000;
          auVar355._12_4_ = 0x3f800000;
          auVar355._16_4_ = 0x3f800000;
          auVar355._20_4_ = 0x3f800000;
          auVar355._24_4_ = 0x3f800000;
          auVar355._28_4_ = 0x3f800000;
          auVar44 = vsubps_avx(auVar355,auVar85);
          fVar180 = auVar44._0_4_ * fVar180 + fVar180;
          fVar237 = auVar44._4_4_ * fVar237 + fVar237;
          fVar240 = auVar44._8_4_ * fVar240 + fVar240;
          fVar260 = auVar44._12_4_ * fVar260 + fVar260;
          fVar262 = auVar44._16_4_ * fVar262 + fVar262;
          fVar263 = auVar44._20_4_ * fVar263 + fVar263;
          fVar272 = auVar44._24_4_ * fVar272 + fVar272;
          fVar273 = auVar44._28_4_ + auVar39._28_4_;
          auVar196 = ZEXT3264(CONCAT428(fVar273,CONCAT424(fVar272,CONCAT420(fVar263,CONCAT416(
                                                  fVar262,CONCAT412(fVar260,CONCAT48(fVar240,
                                                  CONCAT44(fVar237,fVar180))))))));
          auVar86._4_4_ =
               (auVar40._4_4_ * fVar258 + auVar41._4_4_ * fVar256 + auVar43._4_4_ * fVar176) *
               fVar237;
          auVar86._0_4_ =
               (auVar40._0_4_ * fVar218 + auVar41._0_4_ * fVar177 + auVar43._0_4_ * fVar159) *
               fVar180;
          auVar86._8_4_ =
               (auVar40._8_4_ * fVar266 + auVar41._8_4_ * fVar264 + auVar43._8_4_ * fVar265) *
               fVar240;
          auVar86._12_4_ =
               (auVar40._12_4_ * fVar276 + auVar41._12_4_ * fVar275 + auVar43._12_4_ * fVar219) *
               fVar260;
          auVar86._16_4_ =
               (auVar40._16_4_ * fVar314 + auVar41._16_4_ * fVar299 + auVar43._16_4_ * fVar290) *
               fVar262;
          auVar86._20_4_ =
               (auVar40._20_4_ * fVar317 + auVar41._20_4_ * fVar316 + auVar43._20_4_ * fVar197) *
               fVar263;
          auVar86._24_4_ =
               (auVar40._24_4_ * fVar178 + auVar41._24_4_ * fVar175 + auVar43._24_4_ * fVar238) *
               fVar272;
          auVar86._28_4_ = local_4e0._28_4_ + auVar42._28_4_ + auVar163._28_4_;
          auVar251 = vpermilps_avx((undefined1  [16])aVar13,0xff);
          auVar231._16_16_ = auVar251;
          auVar231._0_16_ = auVar251;
          auVar163 = vcmpps_avx(auVar231,auVar86,2);
          fVar220 = ray->tfar;
          auVar269._4_4_ = fVar220;
          auVar269._0_4_ = fVar220;
          auVar269._8_4_ = fVar220;
          auVar269._12_4_ = fVar220;
          auVar269._16_4_ = fVar220;
          auVar269._20_4_ = fVar220;
          auVar269._24_4_ = fVar220;
          auVar269._28_4_ = fVar220;
          auVar39 = vcmpps_avx(auVar86,auVar269,2);
          auVar163 = vandps_avx(auVar39,auVar163);
          auVar251 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
          auVar211 = vpand_avx(auVar211,auVar251);
          auVar251 = vpmovsxwd_avx(auVar211);
          auVar222 = vpshufd_avx(auVar211,0xee);
          auVar222 = vpmovsxwd_avx(auVar222);
          auVar232._16_16_ = auVar222;
          auVar232._0_16_ = auVar251;
          if ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar232 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar232 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar232 >> 0x7f,0) == '\0') &&
                (auVar232 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar222 >> 0x3f,0) == '\0') &&
              (auVar232 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar222[0xf]) goto LAB_01183e88;
          auVar163 = vcmpps_avx(ZEXT832(0) << 0x20,auVar297,4);
          auVar251 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
          auVar211 = vpand_avx(auVar211,auVar251);
          auVar251 = vpmovsxwd_avx(auVar211);
          auVar211 = vpunpckhwd_avx(auVar211,auVar211);
          auVar284._16_16_ = auVar211;
          auVar284._0_16_ = auVar251;
          auVar298 = ZEXT3264(CONCAT824(uStack_468,
                                        CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
          auVar376._4_4_ = fVar174;
          auVar376._0_4_ = fVar157;
          auVar376._8_4_ = fStack_798;
          auVar376._12_4_ = fStack_794;
          auVar376._16_4_ = fStack_790;
          auVar376._20_4_ = fStack_78c;
          auVar376._24_4_ = fStack_788;
          auVar376._28_4_ = fStack_784;
          if ((((((((auVar284 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar284 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar284 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar284 >> 0x7f,0) != '\0') ||
                (auVar284 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar211 >> 0x3f,0) != '\0') ||
              (auVar284 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar211[0xf] < '\0') {
            auVar233._0_4_ = auVar192._0_4_ * fVar180;
            auVar233._4_4_ = auVar192._4_4_ * fVar237;
            auVar233._8_4_ = auVar192._8_4_ * fVar240;
            auVar233._12_4_ = auVar192._12_4_ * fVar260;
            auVar233._16_4_ = auVar192._16_4_ * fVar262;
            auVar233._20_4_ = auVar192._20_4_ * fVar263;
            auVar233._24_4_ = auVar192._24_4_ * fVar272;
            auVar233._28_4_ = 0;
            auVar87._4_4_ = auVar253._4_4_ * fVar237;
            auVar87._0_4_ = auVar253._0_4_ * fVar180;
            auVar87._8_4_ = auVar253._8_4_ * fVar240;
            auVar87._12_4_ = auVar253._12_4_ * fVar260;
            auVar87._16_4_ = auVar253._16_4_ * fVar262;
            auVar87._20_4_ = auVar253._20_4_ * fVar263;
            auVar87._24_4_ = auVar253._24_4_ * fVar272;
            auVar87._28_4_ = fVar273;
            auVar270._8_4_ = 0x3f800000;
            auVar270._0_8_ = 0x3f8000003f800000;
            auVar270._12_4_ = 0x3f800000;
            auVar270._16_4_ = 0x3f800000;
            auVar270._20_4_ = 0x3f800000;
            auVar270._24_4_ = 0x3f800000;
            auVar270._28_4_ = 0x3f800000;
            auVar163 = vsubps_avx(auVar270,auVar233);
            local_4a0 = vblendvps_avx(auVar163,auVar233,auVar45);
            auVar163 = vsubps_avx(auVar270,auVar87);
            _local_3a0 = vblendvps_avx(auVar163,auVar87,auVar45);
            auVar196 = ZEXT3264(_local_3a0);
            auVar298 = ZEXT3264(auVar284);
            local_4c0 = auVar86;
          }
        }
        auVar234 = ZEXT1664(auVar388);
        auVar366 = ZEXT3264(local_740);
        auVar163 = auVar298._0_32_;
        if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar163 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar163 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar163 >> 0x7f,0) != '\0') ||
              (auVar298 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar163 >> 0xbf,0) != '\0') ||
            (auVar298 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar298[0x1f] < '\0') {
          auVar39 = vsubps_avx(local_680,auVar376);
          fVar177 = auVar376._0_4_ + local_4a0._0_4_ * auVar39._0_4_;
          fVar218 = auVar376._4_4_ + local_4a0._4_4_ * auVar39._4_4_;
          fVar180 = auVar376._8_4_ + local_4a0._8_4_ * auVar39._8_4_;
          fVar237 = auVar376._12_4_ + local_4a0._12_4_ * auVar39._12_4_;
          fVar240 = auVar376._16_4_ + local_4a0._16_4_ * auVar39._16_4_;
          fVar256 = auVar376._20_4_ + local_4a0._20_4_ * auVar39._20_4_;
          fVar258 = auVar376._24_4_ + local_4a0._24_4_ * auVar39._24_4_;
          fVar260 = auVar376._28_4_ + auVar39._28_4_;
          fVar220 = local_768->depth_scale;
          auVar196 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar220,CONCAT420(fVar220,CONCAT416(
                                                  fVar220,CONCAT412(fVar220,CONCAT48(fVar220,
                                                  CONCAT44(fVar220,fVar220))))))));
          auVar88._4_4_ = (fVar218 + fVar218) * fVar220;
          auVar88._0_4_ = (fVar177 + fVar177) * fVar220;
          auVar88._8_4_ = (fVar180 + fVar180) * fVar220;
          auVar88._12_4_ = (fVar237 + fVar237) * fVar220;
          auVar88._16_4_ = (fVar240 + fVar240) * fVar220;
          auVar88._20_4_ = (fVar256 + fVar256) * fVar220;
          auVar88._24_4_ = (fVar258 + fVar258) * fVar220;
          auVar88._28_4_ = fVar260 + fVar260;
          auVar39 = vcmpps_avx(local_4c0,auVar88,6);
          auVar40 = auVar163 & auVar39;
          if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar40 >> 0x7f,0) != '\0') ||
                (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar40 >> 0xbf,0) != '\0') ||
              (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar40[0x1f] < '\0') {
            local_200 = vandps_avx(auVar39,auVar163);
            local_3a0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
            local_3a0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
            fStack_398 = fStack_398 + fStack_398 + -1.0;
            fStack_394 = fStack_394 + fStack_394 + -1.0;
            fStack_390 = fStack_390 + fStack_390 + -1.0;
            fStack_38c = fStack_38c + fStack_38c + -1.0;
            fStack_388 = fStack_388 + fStack_388 + -1.0;
            fStack_384 = fStack_384 + fStack_384 + -1.0;
            local_2c0 = local_4a0;
            local_2a0._4_4_ = local_3a0._4_4_;
            local_2a0._0_4_ = local_3a0._0_4_;
            fStack_298 = fStack_398;
            fStack_294 = fStack_394;
            fStack_290 = fStack_390;
            fStack_28c = fStack_38c;
            fStack_288 = fStack_388;
            fStack_284 = fStack_384;
            local_280 = local_4c0;
            local_260 = 0;
            local_25c = uVar148;
            local_250 = local_630;
            uStack_248 = uStack_628;
            local_240 = local_560;
            uStack_238 = uStack_558;
            local_230 = local_570;
            uStack_228 = uStack_568;
            auVar196 = ZEXT1664(_local_550);
            local_220 = _local_550;
            if ((pGVar154->mask & ray->mask) != 0) {
              auVar298 = ZEXT3264(_local_760);
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar156 = true, _local_630 = auVar15, _local_570 = auVar14, _local_560 = auVar16,
                 pGVar154->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar209._0_4_ = 1.0 / (float)(int)uVar148;
                auVar209._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar388 = vshufps_avx(auVar209,auVar209,0);
                local_1e0[0] = auVar388._0_4_ * (local_4a0._0_4_ + 0.0);
                local_1e0[1] = auVar388._4_4_ * (local_4a0._4_4_ + 1.0);
                local_1e0[2] = auVar388._8_4_ * (local_4a0._8_4_ + 2.0);
                local_1e0[3] = auVar388._12_4_ * (local_4a0._12_4_ + 3.0);
                fStack_1d0 = auVar388._0_4_ * (local_4a0._16_4_ + 4.0);
                fStack_1cc = auVar388._4_4_ * (local_4a0._20_4_ + 5.0);
                fStack_1c8 = auVar388._8_4_ * (local_4a0._24_4_ + 6.0);
                fStack_1c4 = local_4a0._28_4_ + 7.0;
                auVar196 = ZEXT3264(_local_3a0);
                local_1c0 = _local_3a0;
                local_1a0 = local_4c0;
                uStack_79c = (undefined4)((ulong)context->args >> 0x20);
                local_7a0 = vmovmskps_avx(local_200);
                uVar151 = CONCAT44(uStack_79c,local_7a0);
                lVar155 = 0;
                if (uVar151 != 0) {
                  for (; (uVar151 >> lVar155 & 1) == 0; lVar155 = lVar155 + 1) {
                  }
                }
                if (local_7a0 == 0) {
                  bVar156 = false;
                  _local_630 = auVar15;
                  _local_570 = auVar14;
                  _local_560 = auVar16;
                }
                else {
                  local_6a0._0_4_ = ray->tfar;
                  _local_630 = auVar15;
                  _local_570 = auVar14;
                  _local_560 = auVar16;
                  _local_320 = auVar17;
                  do {
                    local_614 = local_1e0[lVar155];
                    local_610 = *(uint *)(local_1c0 + lVar155 * 4);
                    auVar196 = ZEXT464(local_610);
                    local_680._0_8_ = lVar155;
                    ray->tfar = *(float *)(local_1a0 + lVar155 * 4);
                    local_6d0.context = context->user;
                    fVar177 = 1.0 - local_614;
                    fVar220 = local_614 * fVar177 + local_614 * fVar177;
                    auVar388 = ZEXT416((uint)(local_614 * local_614 * 3.0));
                    auVar388 = vshufps_avx(auVar388,auVar388,0);
                    auVar211 = ZEXT416((uint)((fVar220 - local_614 * local_614) * 3.0));
                    auVar211 = vshufps_avx(auVar211,auVar211,0);
                    auVar251 = ZEXT416((uint)((fVar177 * fVar177 - fVar220) * 3.0));
                    auVar251 = vshufps_avx(auVar251,auVar251,0);
                    auVar222 = ZEXT416((uint)(fVar177 * fVar177 * -3.0));
                    auVar222 = vshufps_avx(auVar222,auVar222,0);
                    auVar210._0_4_ =
                         auVar222._0_4_ * (float)local_630._0_4_ +
                         auVar251._0_4_ * (float)local_560._0_4_ +
                         auVar388._0_4_ * (float)local_550._0_4_ +
                         auVar211._0_4_ * (float)local_570._0_4_;
                    auVar210._4_4_ =
                         auVar222._4_4_ * (float)local_630._4_4_ +
                         auVar251._4_4_ * (float)local_560._4_4_ +
                         auVar388._4_4_ * (float)local_550._4_4_ +
                         auVar211._4_4_ * (float)local_570._4_4_;
                    auVar210._8_4_ =
                         auVar222._8_4_ * (float)uStack_628 +
                         auVar251._8_4_ * (float)uStack_558 +
                         auVar388._8_4_ * fStack_548 + auVar211._8_4_ * (float)uStack_568;
                    auVar210._12_4_ =
                         auVar222._12_4_ * uStack_628._4_4_ +
                         auVar251._12_4_ * uStack_558._4_4_ +
                         auVar388._12_4_ * fStack_544 + auVar211._12_4_ * uStack_568._4_4_;
                    local_620 = vmovlps_avx(auVar210);
                    local_618 = vextractps_avx(auVar210,2);
                    local_60c = (int)local_5e8;
                    local_608 = (int)local_770;
                    local_604 = (local_6d0.context)->instID[0];
                    local_600 = (local_6d0.context)->instPrimID[0];
                    local_7c4 = -1;
                    local_6d0.valid = &local_7c4;
                    local_6d0.geometryUserPtr = pGVar154->userPtr;
                    local_6d0.ray = (RTCRayN *)ray;
                    local_6d0.hit = (RTCHitN *)&local_620;
                    local_6d0.N = 1;
                    if (pGVar154->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01182fe0:
                      p_Var36 = context->args->filter;
                      if ((p_Var36 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar154->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var36)(&local_6d0);
                        auVar196._8_56_ = extraout_var_02;
                        auVar196._0_8_ = extraout_XMM1_Qa_00;
                        if (*local_6d0.valid == 0) goto LAB_01183026;
                      }
                      bVar156 = true;
                      auVar366 = ZEXT3264(local_740);
                      auVar298 = ZEXT3264(_local_760);
                      auVar234 = ZEXT1664(local_7c0._0_16_);
                      fVar302 = (float)local_700._0_4_;
                      fVar310 = (float)local_700._4_4_;
                      fVar311 = fStack_6f8;
                      fVar313 = fStack_6f4;
                      fVar235 = fStack_6f0;
                      fVar199 = fStack_6ec;
                      fVar236 = fStack_6e8;
                      fVar340 = (float)local_720._0_4_;
                      fVar346 = (float)local_720._4_4_;
                      fVar347 = fStack_718;
                      fVar348 = fStack_714;
                      fVar288 = fStack_710;
                      fVar243 = fStack_70c;
                      fVar246 = fStack_708;
                      break;
                    }
                    (*pGVar154->occlusionFilterN)(&local_6d0);
                    auVar196._8_56_ = extraout_var_01;
                    auVar196._0_8_ = extraout_XMM1_Qa;
                    if (*local_6d0.valid != 0) goto LAB_01182fe0;
LAB_01183026:
                    ray->tfar = (float)local_6a0._0_4_;
                    uVar151 = CONCAT44(uStack_79c,local_7a0) ^ 1L << (local_680._0_8_ & 0x3f);
                    lVar155 = 0;
                    if (uVar151 != 0) {
                      for (; (uVar151 >> lVar155 & 1) == 0; lVar155 = lVar155 + 1) {
                      }
                    }
                    bVar156 = false;
                    local_7a0 = (uint)uVar151;
                    uStack_79c = (undefined4)(uVar151 >> 0x20);
                    auVar366 = ZEXT3264(local_740);
                    auVar298 = ZEXT3264(_local_760);
                    auVar234 = ZEXT1664(local_7c0._0_16_);
                    fVar302 = (float)local_700._0_4_;
                    fVar310 = (float)local_700._4_4_;
                    fVar311 = fStack_6f8;
                    fVar313 = fStack_6f4;
                    fVar235 = fStack_6f0;
                    fVar199 = fStack_6ec;
                    fVar236 = fStack_6e8;
                    fVar340 = (float)local_720._0_4_;
                    fVar346 = (float)local_720._4_4_;
                    fVar347 = fStack_718;
                    fVar348 = fStack_714;
                    fVar288 = fStack_710;
                    fVar243 = fStack_70c;
                    fVar246 = fStack_708;
                  } while (uVar151 != 0);
                }
              }
              goto LAB_01182cb3;
            }
          }
        }
        bVar156 = false;
        auVar298 = ZEXT3264(_local_760);
        _local_630 = auVar15;
        _local_570 = auVar14;
        _local_560 = auVar16;
      }
LAB_01182cb3:
      if (8 < (int)uVar148) {
        _local_320 = vpshufd_avx(ZEXT416(uVar148),0);
        auVar388 = vshufps_avx(auVar234._0_16_,auVar234._0_16_,0);
        local_340._16_16_ = auVar388;
        local_340._0_16_ = auVar388;
        auVar388 = vpermilps_avx(local_540._0_16_,0xff);
        register0x00001210 = auVar388;
        _local_360 = auVar388;
        auVar162._0_4_ = 1.0 / (float)local_3e0._0_4_;
        auVar162._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar388 = vshufps_avx(auVar162,auVar162,0);
        register0x00001210 = auVar388;
        _local_380 = auVar388;
        auVar173 = ZEXT3264(_local_380);
        lVar155 = 8;
        do {
          pauVar10 = (undefined1 (*) [28])(bezier_basis0 + lVar155 * 4 + lVar153);
          fVar220 = *(float *)*pauVar10;
          fVar177 = *(float *)(*pauVar10 + 4);
          fVar218 = *(float *)(*pauVar10 + 8);
          fVar180 = *(float *)(*pauVar10 + 0xc);
          fVar237 = *(float *)(*pauVar10 + 0x10);
          fVar240 = *(float *)(*pauVar10 + 0x14);
          fVar256 = *(float *)(*pauVar10 + 0x18);
          auVar141 = *pauVar10;
          pauVar11 = (undefined1 (*) [28])(lVar153 + 0x21aa768 + lVar155 * 4);
          fVar258 = *(float *)*pauVar11;
          fVar260 = *(float *)(*pauVar11 + 4);
          fVar262 = *(float *)(*pauVar11 + 8);
          fVar263 = *(float *)(*pauVar11 + 0xc);
          fVar264 = *(float *)(*pauVar11 + 0x10);
          fVar266 = *(float *)(*pauVar11 + 0x14);
          fVar272 = *(float *)(*pauVar11 + 0x18);
          auVar140 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar153 + 0x21aabec + lVar155 * 4);
          fVar273 = *(float *)*pauVar11;
          fVar274 = *(float *)(*pauVar11 + 4);
          fVar275 = *(float *)(*pauVar11 + 8);
          fVar276 = *(float *)(*pauVar11 + 0xc);
          fVar277 = *(float *)(*pauVar11 + 0x10);
          fVar312 = *(float *)(*pauVar11 + 0x14);
          fVar239 = *(float *)(*pauVar11 + 0x18);
          auVar138 = *pauVar11;
          pfVar1 = (float *)(lVar153 + 0x21ab070 + lVar155 * 4);
          fVar299 = *pfVar1;
          fVar314 = pfVar1[1];
          fVar315 = pfVar1[2];
          fVar242 = pfVar1[3];
          fVar300 = pfVar1[4];
          fVar316 = pfVar1[5];
          fVar317 = pfVar1[6];
          fVar238 = auVar366._0_4_;
          fVar241 = auVar366._4_4_;
          fVar244 = auVar366._8_4_;
          fVar301 = auVar366._12_4_;
          fVar157 = auVar366._16_4_;
          fVar174 = auVar366._20_4_;
          fVar182 = auVar366._24_4_;
          fVar245 = auVar234._28_4_;
          fStack_784 = fVar245 + fVar245 + auVar173._28_4_;
          auVar325._0_4_ =
               (float)local_e0._0_4_ * fVar220 +
               (float)local_420._0_4_ * fVar258 +
               fVar238 * fVar273 + (float)local_400._0_4_ * fVar299;
          auVar325._4_4_ =
               (float)local_e0._4_4_ * fVar177 +
               (float)local_420._4_4_ * fVar260 +
               fVar241 * fVar274 + (float)local_400._4_4_ * fVar314;
          auVar325._8_4_ =
               fStack_d8 * fVar218 + fStack_418 * fVar262 + fVar244 * fVar275 + fStack_3f8 * fVar315
          ;
          auVar325._12_4_ =
               fStack_d4 * fVar180 + fStack_414 * fVar263 + fVar301 * fVar276 + fStack_3f4 * fVar242
          ;
          auVar325._16_4_ =
               fStack_d0 * fVar237 + fStack_410 * fVar264 + fVar157 * fVar277 + fStack_3f0 * fVar300
          ;
          auVar325._20_4_ =
               fStack_cc * fVar240 + fStack_40c * fVar266 + fVar174 * fVar312 + fStack_3ec * fVar316
          ;
          auVar325._24_4_ =
               fStack_c8 * fVar256 + fStack_408 * fVar272 + fVar182 * fVar239 + fStack_3e8 * fVar317
          ;
          auVar325._28_4_ = fVar245 + pfVar1[7] + fStack_784;
          local_7c0._0_4_ =
               (float)local_c0._0_4_ * fVar220 +
               fVar340 * fVar258 + fVar302 * fVar273 + auVar298._0_4_ * fVar299;
          local_7c0._4_4_ =
               (float)local_c0._4_4_ * fVar177 +
               fVar346 * fVar260 + fVar310 * fVar274 + auVar298._4_4_ * fVar314;
          local_7c0._8_4_ =
               fStack_b8 * fVar218 +
               fVar347 * fVar262 + fVar311 * fVar275 + auVar298._8_4_ * fVar315;
          local_7c0._12_4_ =
               fStack_b4 * fVar180 +
               fVar348 * fVar263 + fVar313 * fVar276 + auVar298._12_4_ * fVar242;
          local_7c0._16_4_ =
               fStack_b0 * fVar237 +
               fVar288 * fVar264 + fVar235 * fVar277 + auVar298._16_4_ * fVar300;
          local_7c0._20_4_ =
               fStack_ac * fVar240 +
               fVar243 * fVar266 + fVar199 * fVar312 + auVar298._20_4_ * fVar316;
          local_7c0._24_4_ =
               fStack_a8 * fVar256 +
               fVar246 * fVar272 + fVar236 * fVar239 + auVar298._24_4_ * fVar317;
          local_7c0._28_4_ = fStack_784 + fVar245 + fVar245 + auVar196._28_4_;
          auVar234 = ZEXT3264(local_7c0);
          fVar159 = fVar220 * (float)local_140._0_4_ +
                    fVar258 * (float)local_120._0_4_ +
                    (float)local_a0._0_4_ * fVar273 + fVar299 * (float)local_100._0_4_;
          fVar176 = fVar177 * (float)local_140._4_4_ +
                    fVar260 * (float)local_120._4_4_ +
                    (float)local_a0._4_4_ * fVar274 + fVar314 * (float)local_100._4_4_;
          fStack_798 = fVar218 * fStack_138 +
                       fVar262 * fStack_118 + fStack_98 * fVar275 + fVar315 * fStack_f8;
          fStack_794 = fVar180 * fStack_134 +
                       fVar263 * fStack_114 + fStack_94 * fVar276 + fVar242 * fStack_f4;
          fStack_790 = fVar237 * fStack_130 +
                       fVar264 * fStack_110 + fStack_90 * fVar277 + fVar300 * fStack_f0;
          fStack_78c = fVar240 * fStack_12c +
                       fVar266 * fStack_10c + fStack_8c * fVar312 + fVar316 * fStack_ec;
          fStack_788 = fVar256 * fStack_128 +
                       fVar272 * fStack_108 + fStack_88 * fVar239 + fVar317 * fStack_e8;
          fStack_784 = fStack_784 + fVar245 + fVar245 + pfVar1[7];
          pauVar11 = (undefined1 (*) [28])(bezier_basis1 + lVar155 * 4 + lVar153);
          fVar220 = *(float *)*pauVar11;
          fVar177 = *(float *)(*pauVar11 + 4);
          fVar218 = *(float *)(*pauVar11 + 8);
          fVar180 = *(float *)(*pauVar11 + 0xc);
          fVar237 = *(float *)(*pauVar11 + 0x10);
          fVar240 = *(float *)(*pauVar11 + 0x14);
          fVar256 = *(float *)(*pauVar11 + 0x18);
          auVar144 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar153 + 0x21acb88 + lVar155 * 4);
          fVar258 = *(float *)*pauVar11;
          fVar260 = *(float *)(*pauVar11 + 4);
          fVar262 = *(float *)(*pauVar11 + 8);
          fVar263 = *(float *)(*pauVar11 + 0xc);
          fVar264 = *(float *)(*pauVar11 + 0x10);
          fVar266 = *(float *)(*pauVar11 + 0x14);
          fVar272 = *(float *)(*pauVar11 + 0x18);
          auVar143 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar153 + 0x21ad00c + lVar155 * 4);
          fVar273 = *(float *)*pauVar11;
          fVar274 = *(float *)(*pauVar11 + 4);
          fVar275 = *(float *)(*pauVar11 + 8);
          fVar276 = *(float *)(*pauVar11 + 0xc);
          fVar277 = *(float *)(*pauVar11 + 0x10);
          fVar312 = *(float *)(*pauVar11 + 0x14);
          fVar239 = *(float *)(*pauVar11 + 0x18);
          auVar142 = *pauVar11;
          pfVar1 = (float *)(lVar153 + 0x21ad490 + lVar155 * 4);
          fVar245 = *pfVar1;
          fVar337 = pfVar1[1];
          fVar158 = pfVar1[2];
          fVar175 = pfVar1[3];
          fVar178 = pfVar1[4];
          fVar179 = pfVar1[5];
          fVar181 = pfVar1[6];
          fVar197 = auVar298._28_4_;
          fVar290 = fVar197 + pfVar1[7];
          fVar265 = fVar197 + fVar197 + fStack_3e4;
          fVar219 = fVar197 + fVar197 + *(float *)pauVar10[1];
          auVar383._0_4_ =
               (float)local_e0._0_4_ * fVar220 +
               (float)local_420._0_4_ * fVar258 +
               fVar238 * fVar273 + (float)local_400._0_4_ * fVar245;
          auVar383._4_4_ =
               (float)local_e0._4_4_ * fVar177 +
               (float)local_420._4_4_ * fVar260 +
               fVar241 * fVar274 + (float)local_400._4_4_ * fVar337;
          auVar383._8_4_ =
               fStack_d8 * fVar218 + fStack_418 * fVar262 + fVar244 * fVar275 + fStack_3f8 * fVar158
          ;
          auVar383._12_4_ =
               fStack_d4 * fVar180 + fStack_414 * fVar263 + fVar301 * fVar276 + fStack_3f4 * fVar175
          ;
          auVar383._16_4_ =
               fStack_d0 * fVar237 + fStack_410 * fVar264 + fVar157 * fVar277 + fStack_3f0 * fVar178
          ;
          auVar383._20_4_ =
               fStack_cc * fVar240 + fStack_40c * fVar266 + fVar174 * fVar312 + fStack_3ec * fVar179
          ;
          auVar383._24_4_ =
               fStack_c8 * fVar256 + fStack_408 * fVar272 + fVar182 * fVar239 + fStack_3e8 * fVar181
          ;
          auVar383._28_4_ = fVar290 + fVar265;
          local_540._0_4_ =
               fVar220 * (float)local_c0._0_4_ +
               fVar340 * fVar258 + fVar302 * fVar273 + auVar298._0_4_ * fVar245;
          local_540._4_4_ =
               fVar177 * (float)local_c0._4_4_ +
               fVar346 * fVar260 + fVar310 * fVar274 + auVar298._4_4_ * fVar337;
          local_540._8_4_ =
               fVar218 * fStack_b8 +
               fVar347 * fVar262 + fVar311 * fVar275 + auVar298._8_4_ * fVar158;
          local_540._12_4_ =
               fVar180 * fStack_b4 +
               fVar348 * fVar263 + fVar313 * fVar276 + auVar298._12_4_ * fVar175;
          local_540._16_4_ =
               fVar237 * fStack_b0 +
               fVar288 * fVar264 + fVar235 * fVar277 + auVar298._16_4_ * fVar178;
          local_540._20_4_ =
               fVar240 * fStack_ac +
               fVar243 * fVar266 + fVar199 * fVar312 + auVar298._20_4_ * fVar179;
          local_540._24_4_ =
               fVar256 * fStack_a8 +
               fVar246 * fVar272 + fVar236 * fVar239 + auVar298._24_4_ * fVar181;
          local_540._28_4_ = fVar265 + fVar219;
          auVar363._0_4_ =
               fVar258 * (float)local_120._0_4_ +
               (float)local_a0._0_4_ * fVar273 + fVar245 * (float)local_100._0_4_ +
               fVar220 * (float)local_140._0_4_;
          auVar363._4_4_ =
               fVar260 * (float)local_120._4_4_ +
               (float)local_a0._4_4_ * fVar274 + fVar337 * (float)local_100._4_4_ +
               fVar177 * (float)local_140._4_4_;
          auVar363._8_4_ =
               fVar262 * fStack_118 + fStack_98 * fVar275 + fVar158 * fStack_f8 +
               fVar218 * fStack_138;
          auVar363._12_4_ =
               fVar263 * fStack_114 + fStack_94 * fVar276 + fVar175 * fStack_f4 +
               fVar180 * fStack_134;
          auVar363._16_4_ =
               fVar264 * fStack_110 + fStack_90 * fVar277 + fVar178 * fStack_f0 +
               fVar237 * fStack_130;
          auVar363._20_4_ =
               fVar266 * fStack_10c + fStack_8c * fVar312 + fVar179 * fStack_ec +
               fVar240 * fStack_12c;
          auVar363._24_4_ =
               fVar272 * fStack_108 + fStack_88 * fVar239 + fVar181 * fStack_e8 +
               fVar256 * fStack_128;
          auVar363._28_4_ = fVar197 + fVar290 + fVar265;
          auVar39 = vsubps_avx(auVar383,auVar325);
          auVar40 = vsubps_avx(local_540,local_7c0);
          fVar288 = auVar39._0_4_;
          fVar237 = auVar39._4_4_;
          auVar89._4_4_ = fVar237 * local_7c0._4_4_;
          auVar89._0_4_ = fVar288 * local_7c0._0_4_;
          fVar240 = auVar39._8_4_;
          auVar89._8_4_ = fVar240 * local_7c0._8_4_;
          fVar243 = auVar39._12_4_;
          auVar89._12_4_ = fVar243 * local_7c0._12_4_;
          fVar246 = auVar39._16_4_;
          auVar89._16_4_ = fVar246 * local_7c0._16_4_;
          fVar256 = auVar39._20_4_;
          auVar89._20_4_ = fVar256 * local_7c0._20_4_;
          fVar258 = auVar39._24_4_;
          auVar89._24_4_ = fVar258 * local_7c0._24_4_;
          auVar89._28_4_ = fVar265;
          fVar220 = auVar40._0_4_;
          fVar177 = auVar40._4_4_;
          auVar90._4_4_ = auVar325._4_4_ * fVar177;
          auVar90._0_4_ = auVar325._0_4_ * fVar220;
          fVar235 = auVar40._8_4_;
          auVar90._8_4_ = auVar325._8_4_ * fVar235;
          fVar199 = auVar40._12_4_;
          auVar90._12_4_ = auVar325._12_4_ * fVar199;
          fVar218 = auVar40._16_4_;
          auVar90._16_4_ = auVar325._16_4_ * fVar218;
          fVar180 = auVar40._20_4_;
          auVar90._20_4_ = auVar325._20_4_ * fVar180;
          fVar236 = auVar40._24_4_;
          auVar90._24_4_ = auVar325._24_4_ * fVar236;
          auVar90._28_4_ = fVar219;
          auVar41 = vsubps_avx(auVar89,auVar90);
          auVar133._4_4_ = fVar176;
          auVar133._0_4_ = fVar159;
          auVar133._8_4_ = fStack_798;
          auVar133._12_4_ = fStack_794;
          auVar133._16_4_ = fStack_790;
          auVar133._20_4_ = fStack_78c;
          auVar133._24_4_ = fStack_788;
          auVar133._28_4_ = fStack_784;
          auVar173 = ZEXT3264(auVar133);
          auVar163 = vmaxps_avx(auVar133,auVar363);
          auVar91._4_4_ = auVar163._4_4_ * auVar163._4_4_ * (fVar237 * fVar237 + fVar177 * fVar177);
          auVar91._0_4_ = auVar163._0_4_ * auVar163._0_4_ * (fVar288 * fVar288 + fVar220 * fVar220);
          auVar91._8_4_ = auVar163._8_4_ * auVar163._8_4_ * (fVar240 * fVar240 + fVar235 * fVar235);
          auVar91._12_4_ =
               auVar163._12_4_ * auVar163._12_4_ * (fVar243 * fVar243 + fVar199 * fVar199);
          auVar91._16_4_ =
               auVar163._16_4_ * auVar163._16_4_ * (fVar246 * fVar246 + fVar218 * fVar218);
          auVar91._20_4_ =
               auVar163._20_4_ * auVar163._20_4_ * (fVar256 * fVar256 + fVar180 * fVar180);
          auVar91._24_4_ =
               auVar163._24_4_ * auVar163._24_4_ * (fVar258 * fVar258 + fVar236 * fVar236);
          auVar91._28_4_ = fVar290 + fVar219;
          auVar92._4_4_ = auVar41._4_4_ * auVar41._4_4_;
          auVar92._0_4_ = auVar41._0_4_ * auVar41._0_4_;
          auVar92._8_4_ = auVar41._8_4_ * auVar41._8_4_;
          auVar92._12_4_ = auVar41._12_4_ * auVar41._12_4_;
          auVar92._16_4_ = auVar41._16_4_ * auVar41._16_4_;
          auVar92._20_4_ = auVar41._20_4_ * auVar41._20_4_;
          auVar92._24_4_ = auVar41._24_4_ * auVar41._24_4_;
          auVar92._28_4_ = auVar41._28_4_;
          auVar163 = vcmpps_avx(auVar92,auVar91,2);
          auVar196 = ZEXT3264(auVar163);
          local_260 = (uint)lVar155;
          auVar211 = vpshufd_avx(ZEXT416(local_260),0);
          auVar388 = vpor_avx(auVar211,_DAT_01f7fcf0);
          auVar211 = vpor_avx(auVar211,_DAT_01fafea0);
          auVar388 = vpcmpgtd_avx(_local_320,auVar388);
          auVar211 = vpcmpgtd_avx(_local_320,auVar211);
          auVar217._16_16_ = auVar211;
          auVar217._0_16_ = auVar388;
          auVar41 = auVar217 & auVar163;
          fVar302 = (float)local_700._0_4_;
          fVar310 = (float)local_700._4_4_;
          fVar311 = fStack_6f8;
          fVar313 = fStack_6f4;
          fVar235 = fStack_6f0;
          fVar199 = fStack_6ec;
          fVar236 = fStack_6e8;
          fVar340 = (float)local_720._0_4_;
          fVar346 = (float)local_720._4_4_;
          fVar347 = fStack_718;
          fVar348 = fStack_714;
          fVar288 = fStack_710;
          fVar243 = fStack_70c;
          fVar246 = fStack_708;
          if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar41 >> 0x7f,0) == '\0') &&
                (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar41 >> 0xbf,0) == '\0') &&
              (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar41[0x1f]) {
            auVar366 = ZEXT3264(auVar366._0_32_);
            auVar298 = ZEXT3264(_local_760);
          }
          else {
            local_5e0._0_4_ = auVar144._0_4_;
            local_5e0._4_4_ = auVar144._4_4_;
            fStack_5d8 = auVar144._8_4_;
            fStack_5d4 = auVar144._12_4_;
            fStack_5d0 = auVar144._16_4_;
            fStack_5cc = auVar144._20_4_;
            fStack_5c8 = auVar144._24_4_;
            local_460 = (float)local_660._0_4_ * (float)local_5e0._0_4_;
            fStack_45c = (float)local_660._4_4_ * (float)local_5e0._4_4_;
            fStack_458 = fStack_658 * fStack_5d8;
            fStack_454 = fStack_654 * fStack_5d4;
            fStack_450 = fStack_650 * fStack_5d0;
            fStack_44c = fStack_64c * fStack_5cc;
            fStack_448 = fStack_648 * fStack_5c8;
            local_520._0_4_ = auVar143._0_4_;
            local_520._4_4_ = auVar143._4_4_;
            fStack_518 = auVar143._8_4_;
            fStack_514 = auVar143._12_4_;
            fStack_510 = auVar143._16_4_;
            fStack_50c = auVar143._20_4_;
            fStack_508 = auVar143._24_4_;
            fVar258 = (float)local_2e0._0_4_ * (float)local_520._0_4_;
            fVar260 = (float)local_2e0._4_4_ * (float)local_520._4_4_;
            fVar262 = fStack_2d8 * fStack_518;
            fVar263 = fStack_2d4 * fStack_514;
            fVar264 = fStack_2d0 * fStack_510;
            fVar266 = fStack_2cc * fStack_50c;
            fVar272 = fStack_2c8 * fStack_508;
            _local_520 = auVar217;
            local_440._0_4_ = auVar142._0_4_;
            local_440._4_4_ = auVar142._4_4_;
            fStack_438 = auVar142._8_4_;
            fStack_434 = auVar142._12_4_;
            fStack_430 = auVar142._16_4_;
            fStack_42c = auVar142._20_4_;
            fStack_428 = auVar142._24_4_;
            fVar220 = (float)local_300._0_4_ * (float)local_440._0_4_;
            fVar177 = (float)local_300._4_4_ * (float)local_440._4_4_;
            fVar218 = fStack_2f8 * fStack_438;
            fVar180 = fStack_2f4 * fStack_434;
            fVar237 = fStack_2f0 * fStack_430;
            fVar240 = fStack_2ec * fStack_42c;
            fVar256 = fStack_2e8 * fStack_428;
            _local_5e0 = auVar363;
            _local_440 = auVar163;
            local_460 = local_460 + fVar258 + fVar220 + (float)local_5c0._0_4_ * fVar245;
            fStack_45c = fStack_45c + fVar260 + fVar177 + (float)local_5c0._4_4_ * fVar337;
            fStack_458 = fStack_458 + fVar262 + fVar218 + fStack_5b8 * fVar158;
            fStack_454 = fStack_454 + fVar263 + fVar180 + fStack_5b4 * fVar175;
            fStack_450 = fStack_450 + fVar264 + fVar237 + fStack_5b0 * fVar178;
            fStack_44c = fStack_44c + fVar266 + fVar240 + fStack_5ac * fVar179;
            fStack_448 = fStack_448 + fVar272 + fVar256 + fStack_5a8 * fVar181;
            fStack_444 = auVar325._28_4_ + fStack_644 + auVar163._28_4_ + 0.0;
            local_5a0._0_4_ = auVar140._0_4_;
            local_5a0._4_4_ = auVar140._4_4_;
            fStack_598 = auVar140._8_4_;
            fStack_594 = auVar140._12_4_;
            fStack_590 = auVar140._16_4_;
            fStack_58c = auVar140._20_4_;
            fStack_588 = auVar140._24_4_;
            local_4e0._0_4_ = auVar138._0_4_;
            local_4e0._4_4_ = auVar138._4_4_;
            fStack_4d8 = auVar138._8_4_;
            fStack_4d4 = auVar138._12_4_;
            fStack_4d0 = auVar138._16_4_;
            fStack_4cc = auVar138._20_4_;
            fStack_4c8 = auVar138._24_4_;
            fVar290 = (float)local_300._0_4_ * (float)local_4e0._0_4_;
            fVar197 = (float)local_300._4_4_ * (float)local_4e0._4_4_;
            fVar198 = fStack_2f8 * fStack_4d8;
            fVar200 = fStack_2f4 * fStack_4d4;
            fVar202 = fStack_2f0 * fStack_4d0;
            fVar204 = fStack_2ec * fStack_4cc;
            fVar206 = fStack_2e8 * fStack_4c8;
            pfVar1 = (float *)(lVar153 + 0x21abdfc + lVar155 * 4);
            fVar220 = *pfVar1;
            fVar218 = pfVar1[1];
            fVar180 = pfVar1[2];
            fVar237 = pfVar1[3];
            fVar240 = pfVar1[4];
            fVar256 = pfVar1[5];
            fVar258 = pfVar1[6];
            pfVar2 = (float *)(lVar153 + 0x21ac280 + lVar155 * 4);
            fVar260 = *pfVar2;
            fVar262 = pfVar2[1];
            fVar263 = pfVar2[2];
            fVar264 = pfVar2[3];
            fVar266 = pfVar2[4];
            fVar272 = pfVar2[5];
            fVar273 = pfVar2[6];
            _local_4e0 = auVar383;
            local_3e0 = auVar40;
            fVar177 = auVar366._28_4_;
            pfVar3 = (float *)(lVar153 + 0x21ab978 + lVar155 * 4);
            fVar274 = *pfVar3;
            fVar275 = pfVar3[1];
            fVar276 = pfVar3[2];
            fVar277 = pfVar3[3];
            fVar312 = pfVar3[4];
            fVar239 = pfVar3[5];
            fVar245 = pfVar3[6];
            fVar219 = pfVar1[7] + pfVar2[7];
            fVar207 = pfVar2[7] + fVar177 + 0.0;
            fVar291 = fVar177 + auVar363._28_4_ + fVar177 + 0.0;
            pfVar1 = (float *)(lVar153 + 0x21ab4f4 + lVar155 * 4);
            fVar337 = *pfVar1;
            fVar158 = pfVar1[1];
            fVar175 = pfVar1[2];
            fVar178 = pfVar1[3];
            fVar179 = pfVar1[4];
            fVar181 = pfVar1[5];
            fVar265 = pfVar1[6];
            local_500 = (float)local_e0._0_4_ * fVar337 +
                        fVar274 * (float)local_420._0_4_ +
                        fVar238 * fVar220 + (float)local_400._0_4_ * fVar260;
            fStack_4fc = (float)local_e0._4_4_ * fVar158 +
                         fVar275 * (float)local_420._4_4_ +
                         fVar241 * fVar218 + (float)local_400._4_4_ * fVar262;
            fStack_4f8 = fStack_d8 * fVar175 +
                         fVar276 * fStack_418 + fVar244 * fVar180 + fStack_3f8 * fVar263;
            fStack_4f4 = fStack_d4 * fVar178 +
                         fVar277 * fStack_414 + fVar301 * fVar237 + fStack_3f4 * fVar264;
            fStack_4f0 = fStack_d0 * fVar179 +
                         fVar312 * fStack_410 + fVar157 * fVar240 + fStack_3f0 * fVar266;
            fStack_4ec = fStack_cc * fVar181 +
                         fVar239 * fStack_40c + fVar174 * fVar256 + fStack_3ec * fVar272;
            fStack_4e8 = fStack_c8 * fVar265 +
                         fVar245 * fStack_408 + fVar182 * fVar258 + fStack_3e8 * fVar273;
            fStack_4e4 = fVar219 + fVar207;
            auVar193._0_4_ =
                 (float)local_c0._0_4_ * fVar337 +
                 (float)local_700._0_4_ * fVar220 + (float)local_760._0_4_ * fVar260 +
                 fVar274 * (float)local_720._0_4_;
            auVar193._4_4_ =
                 (float)local_c0._4_4_ * fVar158 +
                 (float)local_700._4_4_ * fVar218 + (float)local_760._4_4_ * fVar262 +
                 fVar275 * (float)local_720._4_4_;
            auVar193._8_4_ =
                 fStack_b8 * fVar175 +
                 fStack_6f8 * fVar180 + fStack_758 * fVar263 + fVar276 * fStack_718;
            auVar193._12_4_ =
                 fStack_b4 * fVar178 +
                 fStack_6f4 * fVar237 + fStack_754 * fVar264 + fVar277 * fStack_714;
            auVar193._16_4_ =
                 fStack_b0 * fVar179 +
                 fStack_6f0 * fVar240 + fStack_750 * fVar266 + fVar312 * fStack_710;
            auVar193._20_4_ =
                 fStack_ac * fVar181 +
                 fStack_6ec * fVar256 + fStack_74c * fVar272 + fVar239 * fStack_70c;
            auVar193._24_4_ =
                 fStack_a8 * fVar265 +
                 fStack_6e8 * fVar258 + fStack_748 * fVar273 + fVar245 * fStack_708;
            auVar193._28_4_ = fVar207 + fVar291;
            auVar364._0_4_ =
                 fVar274 * (float)local_2e0._0_4_ +
                 (float)local_300._0_4_ * fVar220 + (float)local_5c0._0_4_ * fVar260 +
                 fVar337 * (float)local_660._0_4_;
            auVar364._4_4_ =
                 fVar275 * (float)local_2e0._4_4_ +
                 (float)local_300._4_4_ * fVar218 + (float)local_5c0._4_4_ * fVar262 +
                 fVar158 * (float)local_660._4_4_;
            auVar364._8_4_ =
                 fVar276 * fStack_2d8 + fStack_2f8 * fVar180 + fStack_5b8 * fVar263 +
                 fVar175 * fStack_658;
            auVar364._12_4_ =
                 fVar277 * fStack_2d4 + fStack_2f4 * fVar237 + fStack_5b4 * fVar264 +
                 fVar178 * fStack_654;
            auVar364._16_4_ =
                 fVar312 * fStack_2d0 + fStack_2f0 * fVar240 + fStack_5b0 * fVar266 +
                 fVar179 * fStack_650;
            auVar364._20_4_ =
                 fVar239 * fStack_2cc + fStack_2ec * fVar256 + fStack_5ac * fVar272 +
                 fVar181 * fStack_64c;
            auVar364._24_4_ =
                 fVar245 * fStack_2c8 + fStack_2e8 * fVar258 + fStack_5a8 * fVar273 +
                 fVar265 * fStack_648;
            auVar364._28_4_ = pfVar3[7] + fVar219 + fVar291;
            pfVar1 = (float *)(lVar153 + 0x21ae21c + lVar155 * 4);
            fVar220 = *pfVar1;
            fVar218 = pfVar1[1];
            fVar180 = pfVar1[2];
            fVar237 = pfVar1[3];
            fVar240 = pfVar1[4];
            fVar256 = pfVar1[5];
            fVar258 = pfVar1[6];
            pfVar2 = (float *)(lVar153 + 0x21ae6a0 + lVar155 * 4);
            fVar260 = *pfVar2;
            fVar262 = pfVar2[1];
            fVar263 = pfVar2[2];
            fVar264 = pfVar2[3];
            fVar266 = pfVar2[4];
            fVar272 = pfVar2[5];
            fVar273 = pfVar2[6];
            pfVar3 = (float *)(lVar153 + 0x21add98 + lVar155 * 4);
            fVar274 = *pfVar3;
            fVar275 = pfVar3[1];
            fVar276 = pfVar3[2];
            fVar277 = pfVar3[3];
            fVar312 = pfVar3[4];
            fVar239 = pfVar3[5];
            fVar245 = pfVar3[6];
            pfVar4 = (float *)(lVar153 + 0x21ad914 + lVar155 * 4);
            fVar337 = *pfVar4;
            fVar158 = pfVar4[1];
            fVar175 = pfVar4[2];
            fVar178 = pfVar4[3];
            fVar179 = pfVar4[4];
            fVar181 = pfVar4[5];
            fVar265 = pfVar4[6];
            auVar326._0_4_ =
                 fVar337 * (float)local_e0._0_4_ +
                 fVar274 * (float)local_420._0_4_ +
                 fVar238 * fVar220 + fVar260 * (float)local_400._0_4_;
            auVar326._4_4_ =
                 fVar158 * (float)local_e0._4_4_ +
                 fVar275 * (float)local_420._4_4_ +
                 fVar241 * fVar218 + fVar262 * (float)local_400._4_4_;
            auVar326._8_4_ =
                 fVar175 * fStack_d8 +
                 fVar276 * fStack_418 + fVar244 * fVar180 + fVar263 * fStack_3f8;
            auVar326._12_4_ =
                 fVar178 * fStack_d4 +
                 fVar277 * fStack_414 + fVar301 * fVar237 + fVar264 * fStack_3f4;
            auVar326._16_4_ =
                 fVar179 * fStack_d0 +
                 fVar312 * fStack_410 + fVar157 * fVar240 + fVar266 * fStack_3f0;
            auVar326._20_4_ =
                 fVar181 * fStack_cc +
                 fVar239 * fStack_40c + fVar174 * fVar256 + fVar272 * fStack_3ec;
            auVar326._24_4_ =
                 fVar265 * fStack_c8 +
                 fVar245 * fStack_408 + fVar182 * fVar258 + fVar273 * fStack_3e8;
            auVar326._28_4_ = fStack_744 + fStack_744 + auVar325._28_4_ + fStack_3e4;
            auVar356._0_4_ =
                 (float)local_c0._0_4_ * fVar337 +
                 fVar274 * (float)local_720._0_4_ +
                 (float)local_700._0_4_ * fVar220 + (float)local_760._0_4_ * fVar260;
            auVar356._4_4_ =
                 (float)local_c0._4_4_ * fVar158 +
                 fVar275 * (float)local_720._4_4_ +
                 (float)local_700._4_4_ * fVar218 + (float)local_760._4_4_ * fVar262;
            auVar356._8_4_ =
                 fStack_b8 * fVar175 +
                 fVar276 * fStack_718 + fStack_6f8 * fVar180 + fStack_758 * fVar263;
            auVar356._12_4_ =
                 fStack_b4 * fVar178 +
                 fVar277 * fStack_714 + fStack_6f4 * fVar237 + fStack_754 * fVar264;
            auVar356._16_4_ =
                 fStack_b0 * fVar179 +
                 fVar312 * fStack_710 + fStack_6f0 * fVar240 + fStack_750 * fVar266;
            auVar356._20_4_ =
                 fStack_ac * fVar181 +
                 fVar239 * fStack_70c + fStack_6ec * fVar256 + fStack_74c * fVar272;
            auVar356._24_4_ =
                 fStack_a8 * fVar265 +
                 fVar245 * fStack_708 + fStack_6e8 * fVar258 + fStack_748 * fVar273;
            auVar356._28_4_ = fStack_744 + fStack_744 + fStack_c4 + fStack_744;
            auVar271._8_4_ = 0x7fffffff;
            auVar271._0_8_ = 0x7fffffff7fffffff;
            auVar271._12_4_ = 0x7fffffff;
            auVar271._16_4_ = 0x7fffffff;
            auVar271._20_4_ = 0x7fffffff;
            auVar271._24_4_ = 0x7fffffff;
            auVar271._28_4_ = 0x7fffffff;
            auVar136._4_4_ = fStack_4fc;
            auVar136._0_4_ = local_500;
            auVar136._8_4_ = fStack_4f8;
            auVar136._12_4_ = fStack_4f4;
            auVar136._16_4_ = fStack_4f0;
            auVar136._20_4_ = fStack_4ec;
            auVar136._24_4_ = fStack_4e8;
            auVar136._28_4_ = fStack_4e4;
            auVar41 = vandps_avx(auVar136,auVar271);
            auVar42 = vandps_avx(auVar193,auVar271);
            auVar42 = vmaxps_avx(auVar41,auVar42);
            auVar41 = vandps_avx(auVar364,auVar271);
            auVar42 = vmaxps_avx(auVar42,auVar41);
            auVar42 = vcmpps_avx(auVar42,local_340,1);
            auVar43 = vblendvps_avx(auVar136,auVar39,auVar42);
            auVar170._0_4_ =
                 fVar337 * (float)local_660._0_4_ +
                 fVar274 * (float)local_2e0._0_4_ +
                 fVar260 * (float)local_5c0._0_4_ + (float)local_300._0_4_ * fVar220;
            auVar170._4_4_ =
                 fVar158 * (float)local_660._4_4_ +
                 fVar275 * (float)local_2e0._4_4_ +
                 fVar262 * (float)local_5c0._4_4_ + (float)local_300._4_4_ * fVar218;
            auVar170._8_4_ =
                 fVar175 * fStack_658 +
                 fVar276 * fStack_2d8 + fVar263 * fStack_5b8 + fStack_2f8 * fVar180;
            auVar170._12_4_ =
                 fVar178 * fStack_654 +
                 fVar277 * fStack_2d4 + fVar264 * fStack_5b4 + fStack_2f4 * fVar237;
            auVar170._16_4_ =
                 fVar179 * fStack_650 +
                 fVar312 * fStack_2d0 + fVar266 * fStack_5b0 + fStack_2f0 * fVar240;
            auVar170._20_4_ =
                 fVar181 * fStack_64c +
                 fVar239 * fStack_2cc + fVar272 * fStack_5ac + fStack_2ec * fVar256;
            auVar170._24_4_ =
                 fVar265 * fStack_648 +
                 fVar245 * fStack_2c8 + fVar273 * fStack_5a8 + fStack_2e8 * fVar258;
            auVar170._28_4_ = auVar41._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar44 = vblendvps_avx(auVar193,auVar40,auVar42);
            auVar41 = vandps_avx(auVar326,auVar271);
            auVar42 = vandps_avx(auVar356,auVar271);
            auVar45 = vmaxps_avx(auVar41,auVar42);
            auVar41 = vandps_avx(auVar170,auVar271);
            auVar41 = vmaxps_avx(auVar45,auVar41);
            local_6a0._0_4_ = auVar141._0_4_;
            local_6a0._4_4_ = auVar141._4_4_;
            fStack_698 = auVar141._8_4_;
            fStack_694 = auVar141._12_4_;
            auStack_690._0_4_ = auVar141._16_4_;
            auStack_690._4_4_ = auVar141._20_4_;
            fStack_688 = auVar141._24_4_;
            auVar42 = vcmpps_avx(auVar41,local_340,1);
            auVar41 = vblendvps_avx(auVar326,auVar39,auVar42);
            auVar171._0_4_ =
                 (float)local_660._0_4_ * (float)local_6a0._0_4_ +
                 (float)local_2e0._0_4_ * (float)local_5a0._0_4_ +
                 fVar290 + (float)local_5c0._0_4_ * fVar299;
            auVar171._4_4_ =
                 (float)local_660._4_4_ * (float)local_6a0._4_4_ +
                 (float)local_2e0._4_4_ * (float)local_5a0._4_4_ +
                 fVar197 + (float)local_5c0._4_4_ * fVar314;
            auVar171._8_4_ =
                 fStack_658 * fStack_698 + fStack_2d8 * fStack_598 + fVar198 + fStack_5b8 * fVar315;
            auVar171._12_4_ =
                 fStack_654 * fStack_694 + fStack_2d4 * fStack_594 + fVar200 + fStack_5b4 * fVar242;
            auVar171._16_4_ =
                 fStack_650 * (float)auStack_690._0_4_ +
                 fStack_2d0 * fStack_590 + fVar202 + fStack_5b0 * fVar300;
            auVar171._20_4_ =
                 fStack_64c * (float)auStack_690._4_4_ +
                 fStack_2cc * fStack_58c + fVar204 + fStack_5ac * fVar316;
            auVar171._24_4_ =
                 fStack_648 * fStack_688 + fStack_2c8 * fStack_588 + fVar206 + fStack_5a8 * fVar317;
            auVar171._28_4_ = auVar45._28_4_ + fStack_444 + auVar163._28_4_ + 0.0;
            auVar40 = vblendvps_avx(auVar356,auVar40,auVar42);
            fVar265 = auVar43._0_4_;
            fVar219 = auVar43._4_4_;
            fVar290 = auVar43._8_4_;
            fVar197 = auVar43._12_4_;
            fVar238 = auVar43._16_4_;
            fVar241 = auVar43._20_4_;
            fVar244 = auVar43._24_4_;
            fVar301 = auVar43._28_4_;
            fVar273 = auVar41._0_4_;
            fVar275 = auVar41._4_4_;
            fVar277 = auVar41._8_4_;
            fVar239 = auVar41._12_4_;
            fVar314 = auVar41._16_4_;
            fVar242 = auVar41._20_4_;
            fVar316 = auVar41._24_4_;
            fVar220 = auVar44._0_4_;
            fVar218 = auVar44._4_4_;
            fVar237 = auVar44._8_4_;
            fVar256 = auVar44._12_4_;
            fVar260 = auVar44._16_4_;
            fVar263 = auVar44._20_4_;
            fVar266 = auVar44._24_4_;
            auVar334._0_4_ = fVar220 * fVar220 + fVar265 * fVar265;
            auVar334._4_4_ = fVar218 * fVar218 + fVar219 * fVar219;
            auVar334._8_4_ = fVar237 * fVar237 + fVar290 * fVar290;
            auVar334._12_4_ = fVar256 * fVar256 + fVar197 * fVar197;
            auVar334._16_4_ = fVar260 * fVar260 + fVar238 * fVar238;
            auVar334._20_4_ = fVar263 * fVar263 + fVar241 * fVar241;
            auVar334._24_4_ = fVar266 * fVar266 + fVar244 * fVar244;
            auVar334._28_4_ = auVar39._28_4_ + fVar177;
            auVar39 = vrsqrtps_avx(auVar334);
            fVar177 = auVar39._0_4_;
            fVar180 = auVar39._4_4_;
            auVar93._4_4_ = fVar180 * 1.5;
            auVar93._0_4_ = fVar177 * 1.5;
            fVar240 = auVar39._8_4_;
            auVar93._8_4_ = fVar240 * 1.5;
            fVar258 = auVar39._12_4_;
            auVar93._12_4_ = fVar258 * 1.5;
            fVar262 = auVar39._16_4_;
            auVar93._16_4_ = fVar262 * 1.5;
            fVar264 = auVar39._20_4_;
            auVar93._20_4_ = fVar264 * 1.5;
            fVar272 = auVar39._24_4_;
            auVar93._24_4_ = fVar272 * 1.5;
            auVar93._28_4_ = auVar356._28_4_;
            auVar94._4_4_ = fVar180 * fVar180 * fVar180 * auVar334._4_4_ * 0.5;
            auVar94._0_4_ = fVar177 * fVar177 * fVar177 * auVar334._0_4_ * 0.5;
            auVar94._8_4_ = fVar240 * fVar240 * fVar240 * auVar334._8_4_ * 0.5;
            auVar94._12_4_ = fVar258 * fVar258 * fVar258 * auVar334._12_4_ * 0.5;
            auVar94._16_4_ = fVar262 * fVar262 * fVar262 * auVar334._16_4_ * 0.5;
            auVar94._20_4_ = fVar264 * fVar264 * fVar264 * auVar334._20_4_ * 0.5;
            auVar94._24_4_ = fVar272 * fVar272 * fVar272 * auVar334._24_4_ * 0.5;
            auVar94._28_4_ = auVar334._28_4_;
            auVar42 = vsubps_avx(auVar93,auVar94);
            fVar245 = auVar42._0_4_;
            fVar337 = auVar42._4_4_;
            fVar158 = auVar42._8_4_;
            fVar175 = auVar42._12_4_;
            fVar178 = auVar42._16_4_;
            fVar179 = auVar42._20_4_;
            fVar181 = auVar42._24_4_;
            fVar177 = auVar40._0_4_;
            fVar180 = auVar40._4_4_;
            fVar240 = auVar40._8_4_;
            fVar258 = auVar40._12_4_;
            fVar262 = auVar40._16_4_;
            fVar264 = auVar40._20_4_;
            fVar272 = auVar40._24_4_;
            auVar309._0_4_ = fVar177 * fVar177 + fVar273 * fVar273;
            auVar309._4_4_ = fVar180 * fVar180 + fVar275 * fVar275;
            auVar309._8_4_ = fVar240 * fVar240 + fVar277 * fVar277;
            auVar309._12_4_ = fVar258 * fVar258 + fVar239 * fVar239;
            auVar309._16_4_ = fVar262 * fVar262 + fVar314 * fVar314;
            auVar309._20_4_ = fVar264 * fVar264 + fVar242 * fVar242;
            auVar309._24_4_ = fVar272 * fVar272 + fVar316 * fVar316;
            auVar309._28_4_ = auVar39._28_4_ + auVar41._28_4_;
            auVar39 = vrsqrtps_avx(auVar309);
            fVar274 = auVar39._0_4_;
            fVar276 = auVar39._4_4_;
            auVar95._4_4_ = fVar276 * 1.5;
            auVar95._0_4_ = fVar274 * 1.5;
            fVar312 = auVar39._8_4_;
            auVar95._8_4_ = fVar312 * 1.5;
            fVar299 = auVar39._12_4_;
            auVar95._12_4_ = fVar299 * 1.5;
            fVar315 = auVar39._16_4_;
            auVar95._16_4_ = fVar315 * 1.5;
            fVar300 = auVar39._20_4_;
            auVar95._20_4_ = fVar300 * 1.5;
            fVar317 = auVar39._24_4_;
            auVar95._24_4_ = fVar317 * 1.5;
            auVar95._28_4_ = auVar356._28_4_;
            auVar96._4_4_ = fVar276 * fVar276 * fVar276 * auVar309._4_4_ * 0.5;
            auVar96._0_4_ = fVar274 * fVar274 * fVar274 * auVar309._0_4_ * 0.5;
            auVar96._8_4_ = fVar312 * fVar312 * fVar312 * auVar309._8_4_ * 0.5;
            auVar96._12_4_ = fVar299 * fVar299 * fVar299 * auVar309._12_4_ * 0.5;
            auVar96._16_4_ = fVar315 * fVar315 * fVar315 * auVar309._16_4_ * 0.5;
            auVar96._20_4_ = fVar300 * fVar300 * fVar300 * auVar309._20_4_ * 0.5;
            auVar96._24_4_ = fVar317 * fVar317 * fVar317 * auVar309._24_4_ * 0.5;
            auVar96._28_4_ = auVar309._28_4_;
            auVar40 = vsubps_avx(auVar95,auVar96);
            fVar274 = auVar40._0_4_;
            fVar276 = auVar40._4_4_;
            fVar312 = auVar40._8_4_;
            fVar299 = auVar40._12_4_;
            fVar315 = auVar40._16_4_;
            fVar300 = auVar40._20_4_;
            fVar317 = auVar40._24_4_;
            fVar220 = fVar159 * fVar245 * fVar220;
            fVar218 = fVar176 * fVar337 * fVar218;
            auVar97._4_4_ = fVar218;
            auVar97._0_4_ = fVar220;
            fVar237 = fStack_798 * fVar158 * fVar237;
            auVar97._8_4_ = fVar237;
            fVar256 = fStack_794 * fVar175 * fVar256;
            auVar97._12_4_ = fVar256;
            fVar260 = fStack_790 * fVar178 * fVar260;
            auVar97._16_4_ = fVar260;
            fVar263 = fStack_78c * fVar179 * fVar263;
            auVar97._20_4_ = fVar263;
            fVar266 = fStack_788 * fVar181 * fVar266;
            auVar97._24_4_ = fVar266;
            auVar97._28_4_ = auVar39._28_4_;
            local_6a0._4_4_ = fVar218 + auVar325._4_4_;
            local_6a0._0_4_ = fVar220 + auVar325._0_4_;
            fStack_698 = fVar237 + auVar325._8_4_;
            fStack_694 = fVar256 + auVar325._12_4_;
            auStack_690._0_4_ = fVar260 + auVar325._16_4_;
            auStack_690._4_4_ = fVar263 + auVar325._20_4_;
            fStack_688 = fVar266 + auVar325._24_4_;
            fStack_684 = auVar39._28_4_ + auVar325._28_4_;
            fVar220 = fVar159 * fVar245 * -fVar265;
            fVar218 = fVar176 * fVar337 * -fVar219;
            auVar98._4_4_ = fVar218;
            auVar98._0_4_ = fVar220;
            fVar237 = fStack_798 * fVar158 * -fVar290;
            auVar98._8_4_ = fVar237;
            fVar256 = fStack_794 * fVar175 * -fVar197;
            auVar98._12_4_ = fVar256;
            fVar260 = fStack_790 * fVar178 * -fVar238;
            auVar98._16_4_ = fVar260;
            fVar263 = fStack_78c * fVar179 * -fVar241;
            auVar98._20_4_ = fVar263;
            fVar266 = fStack_788 * fVar181 * -fVar244;
            auVar98._24_4_ = fVar266;
            auVar98._28_4_ = -fVar301;
            local_5a0._4_4_ = local_7c0._4_4_ + fVar218;
            local_5a0._0_4_ = local_7c0._0_4_ + fVar220;
            fStack_598 = local_7c0._8_4_ + fVar237;
            fStack_594 = local_7c0._12_4_ + fVar256;
            fStack_590 = local_7c0._16_4_ + fVar260;
            fStack_58c = local_7c0._20_4_ + fVar263;
            fStack_588 = local_7c0._24_4_ + fVar266;
            fStack_584 = local_7c0._28_4_ + -fVar301;
            fVar220 = fVar245 * 0.0 * fVar159;
            fVar218 = fVar337 * 0.0 * fVar176;
            auVar99._4_4_ = fVar218;
            auVar99._0_4_ = fVar220;
            fVar237 = fVar158 * 0.0 * fStack_798;
            auVar99._8_4_ = fVar237;
            fVar256 = fVar175 * 0.0 * fStack_794;
            auVar99._12_4_ = fVar256;
            fVar260 = fVar178 * 0.0 * fStack_790;
            auVar99._16_4_ = fVar260;
            fVar263 = fVar179 * 0.0 * fStack_78c;
            auVar99._20_4_ = fVar263;
            fVar266 = fVar181 * 0.0 * fStack_788;
            auVar99._24_4_ = fVar266;
            auVar99._28_4_ = fVar301;
            auVar45 = vsubps_avx(auVar325,auVar97);
            auVar384._0_4_ = fVar220 + auVar171._0_4_;
            auVar384._4_4_ = fVar218 + auVar171._4_4_;
            auVar384._8_4_ = fVar237 + auVar171._8_4_;
            auVar384._12_4_ = fVar256 + auVar171._12_4_;
            auVar384._16_4_ = fVar260 + auVar171._16_4_;
            auVar384._20_4_ = fVar263 + auVar171._20_4_;
            auVar384._24_4_ = fVar266 + auVar171._24_4_;
            auVar384._28_4_ = fVar301 + auVar171._28_4_;
            fVar220 = auVar363._0_4_ * fVar274 * fVar177;
            fVar177 = auVar363._4_4_ * fVar276 * fVar180;
            auVar100._4_4_ = fVar177;
            auVar100._0_4_ = fVar220;
            fVar218 = auVar363._8_4_ * fVar312 * fVar240;
            auVar100._8_4_ = fVar218;
            fVar180 = auVar363._12_4_ * fVar299 * fVar258;
            auVar100._12_4_ = fVar180;
            fVar237 = auVar363._16_4_ * fVar315 * fVar262;
            auVar100._16_4_ = fVar237;
            fVar240 = auVar363._20_4_ * fVar300 * fVar264;
            auVar100._20_4_ = fVar240;
            fVar256 = auVar363._24_4_ * fVar317 * fVar272;
            auVar100._24_4_ = fVar256;
            auVar100._28_4_ = fStack_784;
            auVar164 = vsubps_avx(local_7c0,auVar98);
            auVar365._0_4_ = auVar383._0_4_ + fVar220;
            auVar365._4_4_ = auVar383._4_4_ + fVar177;
            auVar365._8_4_ = auVar383._8_4_ + fVar218;
            auVar365._12_4_ = auVar383._12_4_ + fVar180;
            auVar365._16_4_ = auVar383._16_4_ + fVar237;
            auVar365._20_4_ = auVar383._20_4_ + fVar240;
            auVar365._24_4_ = auVar383._24_4_ + fVar256;
            auVar365._28_4_ = auVar383._28_4_ + fStack_784;
            fVar220 = fVar274 * -fVar273 * auVar363._0_4_;
            fVar177 = fVar276 * -fVar275 * auVar363._4_4_;
            auVar101._4_4_ = fVar177;
            auVar101._0_4_ = fVar220;
            fVar218 = fVar312 * -fVar277 * auVar363._8_4_;
            auVar101._8_4_ = fVar218;
            fVar180 = fVar299 * -fVar239 * auVar363._12_4_;
            auVar101._12_4_ = fVar180;
            fVar237 = fVar315 * -fVar314 * auVar363._16_4_;
            auVar101._16_4_ = fVar237;
            fVar240 = fVar300 * -fVar242 * auVar363._20_4_;
            auVar101._20_4_ = fVar240;
            fVar256 = fVar317 * -fVar316 * auVar363._24_4_;
            auVar101._24_4_ = fVar256;
            auVar101._28_4_ = auVar325._28_4_;
            auVar165 = vsubps_avx(auVar171,auVar99);
            auVar254._0_4_ = local_540._0_4_ + fVar220;
            auVar254._4_4_ = local_540._4_4_ + fVar177;
            auVar254._8_4_ = local_540._8_4_ + fVar218;
            auVar254._12_4_ = local_540._12_4_ + fVar180;
            auVar254._16_4_ = local_540._16_4_ + fVar237;
            auVar254._20_4_ = local_540._20_4_ + fVar240;
            auVar254._24_4_ = local_540._24_4_ + fVar256;
            auVar254._28_4_ = local_540._28_4_ + auVar325._28_4_;
            fVar220 = fVar274 * 0.0 * auVar363._0_4_;
            fVar177 = fVar276 * 0.0 * auVar363._4_4_;
            auVar102._4_4_ = fVar177;
            auVar102._0_4_ = fVar220;
            fVar218 = fVar312 * 0.0 * auVar363._8_4_;
            auVar102._8_4_ = fVar218;
            fVar180 = fVar299 * 0.0 * auVar363._12_4_;
            auVar102._12_4_ = fVar180;
            fVar237 = fVar315 * 0.0 * auVar363._16_4_;
            auVar102._16_4_ = fVar237;
            fVar240 = fVar300 * 0.0 * auVar363._20_4_;
            auVar102._20_4_ = fVar240;
            fVar256 = fVar317 * 0.0 * auVar363._24_4_;
            auVar102._24_4_ = fVar256;
            auVar102._28_4_ = auVar171._28_4_;
            auVar39 = vsubps_avx(auVar383,auVar100);
            auVar137._4_4_ = fStack_45c;
            auVar137._0_4_ = local_460;
            auVar137._8_4_ = fStack_458;
            auVar137._12_4_ = fStack_454;
            auVar137._16_4_ = fStack_450;
            auVar137._20_4_ = fStack_44c;
            auVar137._24_4_ = fStack_448;
            auVar137._28_4_ = fStack_444;
            auVar327._0_4_ = local_460 + fVar220;
            auVar327._4_4_ = fStack_45c + fVar177;
            auVar327._8_4_ = fStack_458 + fVar218;
            auVar327._12_4_ = fStack_454 + fVar180;
            auVar327._16_4_ = fStack_450 + fVar237;
            auVar327._20_4_ = fStack_44c + fVar240;
            auVar327._24_4_ = fStack_448 + fVar256;
            auVar327._28_4_ = fStack_444 + auVar171._28_4_;
            auVar41 = vsubps_avx(local_540,auVar101);
            auVar42 = vsubps_avx(auVar137,auVar102);
            auVar43 = vsubps_avx(auVar254,auVar164);
            auVar44 = vsubps_avx(auVar327,auVar165);
            auVar103._4_4_ = auVar165._4_4_ * auVar43._4_4_;
            auVar103._0_4_ = auVar165._0_4_ * auVar43._0_4_;
            auVar103._8_4_ = auVar165._8_4_ * auVar43._8_4_;
            auVar103._12_4_ = auVar165._12_4_ * auVar43._12_4_;
            auVar103._16_4_ = auVar165._16_4_ * auVar43._16_4_;
            auVar103._20_4_ = auVar165._20_4_ * auVar43._20_4_;
            auVar103._24_4_ = auVar165._24_4_ * auVar43._24_4_;
            auVar103._28_4_ = auVar356._28_4_;
            auVar104._4_4_ = auVar164._4_4_ * auVar44._4_4_;
            auVar104._0_4_ = auVar164._0_4_ * auVar44._0_4_;
            auVar104._8_4_ = auVar164._8_4_ * auVar44._8_4_;
            auVar104._12_4_ = auVar164._12_4_ * auVar44._12_4_;
            auVar104._16_4_ = auVar164._16_4_ * auVar44._16_4_;
            auVar104._20_4_ = auVar164._20_4_ * auVar44._20_4_;
            auVar104._24_4_ = auVar164._24_4_ * auVar44._24_4_;
            auVar104._28_4_ = local_540._28_4_;
            auVar46 = vsubps_avx(auVar104,auVar103);
            auVar105._4_4_ = auVar45._4_4_ * auVar44._4_4_;
            auVar105._0_4_ = auVar45._0_4_ * auVar44._0_4_;
            auVar105._8_4_ = auVar45._8_4_ * auVar44._8_4_;
            auVar105._12_4_ = auVar45._12_4_ * auVar44._12_4_;
            auVar105._16_4_ = auVar45._16_4_ * auVar44._16_4_;
            auVar105._20_4_ = auVar45._20_4_ * auVar44._20_4_;
            auVar105._24_4_ = auVar45._24_4_ * auVar44._24_4_;
            auVar105._28_4_ = auVar44._28_4_;
            auVar44 = vsubps_avx(auVar365,auVar45);
            auVar106._4_4_ = auVar165._4_4_ * auVar44._4_4_;
            auVar106._0_4_ = auVar165._0_4_ * auVar44._0_4_;
            auVar106._8_4_ = auVar165._8_4_ * auVar44._8_4_;
            auVar106._12_4_ = auVar165._12_4_ * auVar44._12_4_;
            auVar106._16_4_ = auVar165._16_4_ * auVar44._16_4_;
            auVar106._20_4_ = auVar165._20_4_ * auVar44._20_4_;
            auVar106._24_4_ = auVar165._24_4_ * auVar44._24_4_;
            auVar106._28_4_ = auVar40._28_4_;
            auVar48 = vsubps_avx(auVar106,auVar105);
            auVar107._4_4_ = auVar164._4_4_ * auVar44._4_4_;
            auVar107._0_4_ = auVar164._0_4_ * auVar44._0_4_;
            auVar107._8_4_ = auVar164._8_4_ * auVar44._8_4_;
            auVar107._12_4_ = auVar164._12_4_ * auVar44._12_4_;
            auVar107._16_4_ = auVar164._16_4_ * auVar44._16_4_;
            auVar107._20_4_ = auVar164._20_4_ * auVar44._20_4_;
            auVar107._24_4_ = auVar164._24_4_ * auVar44._24_4_;
            auVar107._28_4_ = auVar40._28_4_;
            auVar108._4_4_ = auVar45._4_4_ * auVar43._4_4_;
            auVar108._0_4_ = auVar45._0_4_ * auVar43._0_4_;
            auVar108._8_4_ = auVar45._8_4_ * auVar43._8_4_;
            auVar108._12_4_ = auVar45._12_4_ * auVar43._12_4_;
            auVar108._16_4_ = auVar45._16_4_ * auVar43._16_4_;
            auVar108._20_4_ = auVar45._20_4_ * auVar43._20_4_;
            auVar108._24_4_ = auVar45._24_4_ * auVar43._24_4_;
            auVar108._28_4_ = auVar43._28_4_;
            auVar40 = vsubps_avx(auVar108,auVar107);
            auVar194._0_4_ = auVar46._0_4_ * 0.0 + auVar40._0_4_ + auVar48._0_4_ * 0.0;
            auVar194._4_4_ = auVar46._4_4_ * 0.0 + auVar40._4_4_ + auVar48._4_4_ * 0.0;
            auVar194._8_4_ = auVar46._8_4_ * 0.0 + auVar40._8_4_ + auVar48._8_4_ * 0.0;
            auVar194._12_4_ = auVar46._12_4_ * 0.0 + auVar40._12_4_ + auVar48._12_4_ * 0.0;
            auVar194._16_4_ = auVar46._16_4_ * 0.0 + auVar40._16_4_ + auVar48._16_4_ * 0.0;
            auVar194._20_4_ = auVar46._20_4_ * 0.0 + auVar40._20_4_ + auVar48._20_4_ * 0.0;
            auVar194._24_4_ = auVar46._24_4_ * 0.0 + auVar40._24_4_ + auVar48._24_4_ * 0.0;
            auVar194._28_4_ = auVar46._28_4_ + auVar40._28_4_ + auVar48._28_4_;
            auVar38 = vcmpps_avx(auVar194,ZEXT832(0) << 0x20,2);
            auVar39 = vblendvps_avx(auVar39,_local_6a0,auVar38);
            auVar234 = ZEXT3264(auVar39);
            auVar40 = vblendvps_avx(auVar41,_local_5a0,auVar38);
            auVar41 = vblendvps_avx(auVar42,auVar384,auVar38);
            auVar42 = vblendvps_avx(auVar45,auVar365,auVar38);
            auVar43 = vblendvps_avx(auVar164,auVar254,auVar38);
            auVar44 = vblendvps_avx(auVar165,auVar327,auVar38);
            auVar45 = vblendvps_avx(auVar365,auVar45,auVar38);
            auVar46 = vblendvps_avx(auVar254,auVar164,auVar38);
            auVar48 = vblendvps_avx(auVar327,auVar165,auVar38);
            local_7c0 = vandps_avx(auVar163,auVar217);
            auVar45 = vsubps_avx(auVar45,auVar39);
            auVar188 = vsubps_avx(auVar46,auVar40);
            auVar48 = vsubps_avx(auVar48,auVar41);
            auVar163 = vsubps_avx(auVar40,auVar43);
            fVar220 = auVar188._0_4_;
            fVar204 = auVar41._0_4_;
            fVar258 = auVar188._4_4_;
            fVar206 = auVar41._4_4_;
            auVar109._4_4_ = fVar206 * fVar258;
            auVar109._0_4_ = fVar204 * fVar220;
            fVar273 = auVar188._8_4_;
            fVar207 = auVar41._8_4_;
            auVar109._8_4_ = fVar207 * fVar273;
            fVar299 = auVar188._12_4_;
            fVar291 = auVar41._12_4_;
            auVar109._12_4_ = fVar291 * fVar299;
            fVar245 = auVar188._16_4_;
            fVar201 = auVar41._16_4_;
            auVar109._16_4_ = fVar201 * fVar245;
            fVar265 = auVar188._20_4_;
            fVar203 = auVar41._20_4_;
            auVar109._20_4_ = fVar203 * fVar265;
            fVar301 = auVar188._24_4_;
            fVar205 = auVar41._24_4_;
            auVar109._24_4_ = fVar205 * fVar301;
            auVar109._28_4_ = auVar46._28_4_;
            fVar177 = auVar40._0_4_;
            fVar247 = auVar48._0_4_;
            fVar260 = auVar40._4_4_;
            fVar257 = auVar48._4_4_;
            auVar110._4_4_ = fVar257 * fVar260;
            auVar110._0_4_ = fVar247 * fVar177;
            fVar274 = auVar40._8_4_;
            fVar259 = auVar48._8_4_;
            auVar110._8_4_ = fVar259 * fVar274;
            fVar314 = auVar40._12_4_;
            fVar261 = auVar48._12_4_;
            auVar110._12_4_ = fVar261 * fVar314;
            fVar337 = auVar40._16_4_;
            fVar278 = auVar48._16_4_;
            auVar110._16_4_ = fVar278 * fVar337;
            fVar219 = auVar40._20_4_;
            fVar286 = auVar48._20_4_;
            auVar110._20_4_ = fVar286 * fVar219;
            fVar157 = auVar40._24_4_;
            fVar287 = auVar48._24_4_;
            uVar12 = auVar164._28_4_;
            auVar110._24_4_ = fVar287 * fVar157;
            auVar110._28_4_ = uVar12;
            auVar46 = vsubps_avx(auVar110,auVar109);
            fVar218 = auVar39._0_4_;
            fVar262 = auVar39._4_4_;
            auVar111._4_4_ = fVar257 * fVar262;
            auVar111._0_4_ = fVar247 * fVar218;
            fVar275 = auVar39._8_4_;
            auVar111._8_4_ = fVar259 * fVar275;
            fVar315 = auVar39._12_4_;
            auVar111._12_4_ = fVar261 * fVar315;
            fVar158 = auVar39._16_4_;
            auVar111._16_4_ = fVar278 * fVar158;
            fVar290 = auVar39._20_4_;
            auVar111._20_4_ = fVar286 * fVar290;
            fVar174 = auVar39._24_4_;
            auVar111._24_4_ = fVar287 * fVar174;
            auVar111._28_4_ = uVar12;
            fVar180 = auVar45._0_4_;
            fVar263 = auVar45._4_4_;
            auVar112._4_4_ = fVar206 * fVar263;
            auVar112._0_4_ = fVar204 * fVar180;
            fVar276 = auVar45._8_4_;
            auVar112._8_4_ = fVar207 * fVar276;
            fVar242 = auVar45._12_4_;
            auVar112._12_4_ = fVar291 * fVar242;
            fVar175 = auVar45._16_4_;
            auVar112._16_4_ = fVar201 * fVar175;
            fVar197 = auVar45._20_4_;
            auVar112._20_4_ = fVar203 * fVar197;
            fVar182 = auVar45._24_4_;
            auVar112._24_4_ = fVar205 * fVar182;
            auVar112._28_4_ = auVar365._28_4_;
            auVar164 = vsubps_avx(auVar112,auVar111);
            auVar113._4_4_ = fVar260 * fVar263;
            auVar113._0_4_ = fVar177 * fVar180;
            auVar113._8_4_ = fVar274 * fVar276;
            auVar113._12_4_ = fVar314 * fVar242;
            auVar113._16_4_ = fVar337 * fVar175;
            auVar113._20_4_ = fVar219 * fVar197;
            auVar113._24_4_ = fVar157 * fVar182;
            auVar113._28_4_ = uVar12;
            auVar114._4_4_ = fVar262 * fVar258;
            auVar114._0_4_ = fVar218 * fVar220;
            auVar114._8_4_ = fVar275 * fVar273;
            auVar114._12_4_ = fVar315 * fVar299;
            auVar114._16_4_ = fVar158 * fVar245;
            auVar114._20_4_ = fVar290 * fVar265;
            auVar114._24_4_ = fVar174 * fVar301;
            auVar114._28_4_ = auVar165._28_4_;
            auVar165 = vsubps_avx(auVar114,auVar113);
            auVar189 = vsubps_avx(auVar41,auVar44);
            fVar240 = auVar165._28_4_ + auVar164._28_4_;
            auVar335._0_4_ = auVar165._0_4_ + auVar164._0_4_ * 0.0 + auVar46._0_4_ * 0.0;
            auVar335._4_4_ = auVar165._4_4_ + auVar164._4_4_ * 0.0 + auVar46._4_4_ * 0.0;
            auVar335._8_4_ = auVar165._8_4_ + auVar164._8_4_ * 0.0 + auVar46._8_4_ * 0.0;
            auVar335._12_4_ = auVar165._12_4_ + auVar164._12_4_ * 0.0 + auVar46._12_4_ * 0.0;
            auVar335._16_4_ = auVar165._16_4_ + auVar164._16_4_ * 0.0 + auVar46._16_4_ * 0.0;
            auVar335._20_4_ = auVar165._20_4_ + auVar164._20_4_ * 0.0 + auVar46._20_4_ * 0.0;
            auVar335._24_4_ = auVar165._24_4_ + auVar164._24_4_ * 0.0 + auVar46._24_4_ * 0.0;
            auVar335._28_4_ = fVar240 + auVar46._28_4_;
            fVar237 = auVar163._0_4_;
            fVar264 = auVar163._4_4_;
            auVar115._4_4_ = auVar44._4_4_ * fVar264;
            auVar115._0_4_ = auVar44._0_4_ * fVar237;
            fVar277 = auVar163._8_4_;
            auVar115._8_4_ = auVar44._8_4_ * fVar277;
            fVar300 = auVar163._12_4_;
            auVar115._12_4_ = auVar44._12_4_ * fVar300;
            fVar178 = auVar163._16_4_;
            auVar115._16_4_ = auVar44._16_4_ * fVar178;
            fVar238 = auVar163._20_4_;
            auVar115._20_4_ = auVar44._20_4_ * fVar238;
            fVar198 = auVar163._24_4_;
            auVar115._24_4_ = auVar44._24_4_ * fVar198;
            auVar115._28_4_ = fVar240;
            fVar240 = auVar189._0_4_;
            fVar266 = auVar189._4_4_;
            auVar116._4_4_ = auVar43._4_4_ * fVar266;
            auVar116._0_4_ = auVar43._0_4_ * fVar240;
            fVar312 = auVar189._8_4_;
            auVar116._8_4_ = auVar43._8_4_ * fVar312;
            fVar316 = auVar189._12_4_;
            auVar116._12_4_ = auVar43._12_4_ * fVar316;
            fVar179 = auVar189._16_4_;
            auVar116._16_4_ = auVar43._16_4_ * fVar179;
            fVar241 = auVar189._20_4_;
            auVar116._20_4_ = auVar43._20_4_ * fVar241;
            fVar200 = auVar189._24_4_;
            auVar116._24_4_ = auVar43._24_4_ * fVar200;
            auVar116._28_4_ = auVar165._28_4_;
            auVar163 = vsubps_avx(auVar116,auVar115);
            auVar164 = vsubps_avx(auVar39,auVar42);
            fVar256 = auVar164._0_4_;
            fVar272 = auVar164._4_4_;
            auVar117._4_4_ = auVar44._4_4_ * fVar272;
            auVar117._0_4_ = auVar44._0_4_ * fVar256;
            fVar239 = auVar164._8_4_;
            auVar117._8_4_ = auVar44._8_4_ * fVar239;
            fVar317 = auVar164._12_4_;
            auVar117._12_4_ = auVar44._12_4_ * fVar317;
            fVar181 = auVar164._16_4_;
            auVar117._16_4_ = auVar44._16_4_ * fVar181;
            fVar244 = auVar164._20_4_;
            auVar117._20_4_ = auVar44._20_4_ * fVar244;
            fVar202 = auVar164._24_4_;
            auVar117._24_4_ = auVar44._24_4_ * fVar202;
            auVar117._28_4_ = auVar44._28_4_;
            auVar118._4_4_ = fVar266 * auVar42._4_4_;
            auVar118._0_4_ = fVar240 * auVar42._0_4_;
            auVar118._8_4_ = fVar312 * auVar42._8_4_;
            auVar118._12_4_ = fVar316 * auVar42._12_4_;
            auVar118._16_4_ = fVar179 * auVar42._16_4_;
            auVar118._20_4_ = fVar241 * auVar42._20_4_;
            auVar118._24_4_ = fVar200 * auVar42._24_4_;
            auVar118._28_4_ = auVar46._28_4_;
            auVar44 = vsubps_avx(auVar117,auVar118);
            auVar119._4_4_ = auVar43._4_4_ * fVar272;
            auVar119._0_4_ = auVar43._0_4_ * fVar256;
            auVar119._8_4_ = auVar43._8_4_ * fVar239;
            auVar119._12_4_ = auVar43._12_4_ * fVar317;
            auVar119._16_4_ = auVar43._16_4_ * fVar181;
            auVar119._20_4_ = auVar43._20_4_ * fVar244;
            auVar119._24_4_ = auVar43._24_4_ * fVar202;
            auVar119._28_4_ = auVar43._28_4_;
            auVar120._4_4_ = fVar264 * auVar42._4_4_;
            auVar120._0_4_ = fVar237 * auVar42._0_4_;
            auVar120._8_4_ = fVar277 * auVar42._8_4_;
            auVar120._12_4_ = fVar300 * auVar42._12_4_;
            auVar120._16_4_ = fVar178 * auVar42._16_4_;
            auVar120._20_4_ = fVar238 * auVar42._20_4_;
            auVar120._24_4_ = fVar198 * auVar42._24_4_;
            auVar120._28_4_ = auVar42._28_4_;
            auVar42 = vsubps_avx(auVar120,auVar119);
            auVar172._0_4_ = auVar163._0_4_ * 0.0 + auVar42._0_4_ + auVar44._0_4_ * 0.0;
            auVar172._4_4_ = auVar163._4_4_ * 0.0 + auVar42._4_4_ + auVar44._4_4_ * 0.0;
            auVar172._8_4_ = auVar163._8_4_ * 0.0 + auVar42._8_4_ + auVar44._8_4_ * 0.0;
            auVar172._12_4_ = auVar163._12_4_ * 0.0 + auVar42._12_4_ + auVar44._12_4_ * 0.0;
            auVar172._16_4_ = auVar163._16_4_ * 0.0 + auVar42._16_4_ + auVar44._16_4_ * 0.0;
            auVar172._20_4_ = auVar163._20_4_ * 0.0 + auVar42._20_4_ + auVar44._20_4_ * 0.0;
            auVar172._24_4_ = auVar163._24_4_ * 0.0 + auVar42._24_4_ + auVar44._24_4_ * 0.0;
            auVar172._28_4_ = auVar44._28_4_ + auVar42._28_4_ + auVar44._28_4_;
            auVar173 = ZEXT3264(auVar172);
            auVar163 = vmaxps_avx(auVar335,auVar172);
            auVar163 = vcmpps_avx(auVar163,ZEXT432(0) << 0x20,2);
            auVar42 = local_7c0 & auVar163;
            if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar42 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar42 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar42 >> 0x7f,0) == '\0') &&
                  (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar42 >> 0xbf,0) == '\0') &&
                (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar42[0x1f]) {
LAB_01183e28:
              auVar196 = ZEXT3264(CONCAT824(uStack_468,
                                            CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
            }
            else {
              auVar42 = vandps_avx(auVar163,local_7c0);
              auVar121._4_4_ = fVar266 * fVar258;
              auVar121._0_4_ = fVar240 * fVar220;
              auVar121._8_4_ = fVar312 * fVar273;
              auVar121._12_4_ = fVar316 * fVar299;
              auVar121._16_4_ = fVar179 * fVar245;
              auVar121._20_4_ = fVar241 * fVar265;
              auVar121._24_4_ = fVar200 * fVar301;
              auVar121._28_4_ = local_7c0._28_4_;
              auVar122._4_4_ = fVar264 * fVar257;
              auVar122._0_4_ = fVar237 * fVar247;
              auVar122._8_4_ = fVar277 * fVar259;
              auVar122._12_4_ = fVar300 * fVar261;
              auVar122._16_4_ = fVar178 * fVar278;
              auVar122._20_4_ = fVar238 * fVar286;
              auVar122._24_4_ = fVar198 * fVar287;
              auVar122._28_4_ = auVar163._28_4_;
              auVar43 = vsubps_avx(auVar122,auVar121);
              auVar123._4_4_ = fVar272 * fVar257;
              auVar123._0_4_ = fVar256 * fVar247;
              auVar123._8_4_ = fVar239 * fVar259;
              auVar123._12_4_ = fVar317 * fVar261;
              auVar123._16_4_ = fVar181 * fVar278;
              auVar123._20_4_ = fVar244 * fVar286;
              auVar123._24_4_ = fVar202 * fVar287;
              auVar123._28_4_ = auVar48._28_4_;
              auVar124._4_4_ = fVar266 * fVar263;
              auVar124._0_4_ = fVar240 * fVar180;
              auVar124._8_4_ = fVar312 * fVar276;
              auVar124._12_4_ = fVar316 * fVar242;
              auVar124._16_4_ = fVar179 * fVar175;
              auVar124._20_4_ = fVar241 * fVar197;
              auVar124._24_4_ = fVar200 * fVar182;
              auVar124._28_4_ = auVar189._28_4_;
              auVar44 = vsubps_avx(auVar124,auVar123);
              auVar125._4_4_ = fVar264 * fVar263;
              auVar125._0_4_ = fVar237 * fVar180;
              auVar125._8_4_ = fVar277 * fVar276;
              auVar125._12_4_ = fVar300 * fVar242;
              auVar125._16_4_ = fVar178 * fVar175;
              auVar125._20_4_ = fVar238 * fVar197;
              auVar125._24_4_ = fVar198 * fVar182;
              auVar125._28_4_ = auVar45._28_4_;
              auVar126._4_4_ = fVar272 * fVar258;
              auVar126._0_4_ = fVar256 * fVar220;
              auVar126._8_4_ = fVar239 * fVar273;
              auVar126._12_4_ = fVar317 * fVar299;
              auVar126._16_4_ = fVar181 * fVar245;
              auVar126._20_4_ = fVar244 * fVar265;
              auVar126._24_4_ = fVar202 * fVar301;
              auVar126._28_4_ = auVar188._28_4_;
              auVar46 = vsubps_avx(auVar126,auVar125);
              auVar195._0_4_ = auVar43._0_4_ * 0.0 + auVar46._0_4_ + auVar44._0_4_ * 0.0;
              auVar195._4_4_ = auVar43._4_4_ * 0.0 + auVar46._4_4_ + auVar44._4_4_ * 0.0;
              auVar195._8_4_ = auVar43._8_4_ * 0.0 + auVar46._8_4_ + auVar44._8_4_ * 0.0;
              auVar195._12_4_ = auVar43._12_4_ * 0.0 + auVar46._12_4_ + auVar44._12_4_ * 0.0;
              auVar195._16_4_ = auVar43._16_4_ * 0.0 + auVar46._16_4_ + auVar44._16_4_ * 0.0;
              auVar195._20_4_ = auVar43._20_4_ * 0.0 + auVar46._20_4_ + auVar44._20_4_ * 0.0;
              auVar195._24_4_ = auVar43._24_4_ * 0.0 + auVar46._24_4_ + auVar44._24_4_ * 0.0;
              auVar195._28_4_ = auVar188._28_4_ + auVar46._28_4_ + auVar45._28_4_;
              auVar163 = vrcpps_avx(auVar195);
              fVar180 = auVar163._0_4_;
              fVar237 = auVar163._4_4_;
              auVar127._4_4_ = auVar195._4_4_ * fVar237;
              auVar127._0_4_ = auVar195._0_4_ * fVar180;
              fVar240 = auVar163._8_4_;
              auVar127._8_4_ = auVar195._8_4_ * fVar240;
              fVar256 = auVar163._12_4_;
              auVar127._12_4_ = auVar195._12_4_ * fVar256;
              fVar258 = auVar163._16_4_;
              auVar127._16_4_ = auVar195._16_4_ * fVar258;
              fVar263 = auVar163._20_4_;
              auVar127._20_4_ = auVar195._20_4_ * fVar263;
              fVar264 = auVar163._24_4_;
              auVar127._24_4_ = auVar195._24_4_ * fVar264;
              auVar127._28_4_ = auVar189._28_4_;
              auVar357._8_4_ = 0x3f800000;
              auVar357._0_8_ = 0x3f8000003f800000;
              auVar357._12_4_ = 0x3f800000;
              auVar357._16_4_ = 0x3f800000;
              auVar357._20_4_ = 0x3f800000;
              auVar357._24_4_ = 0x3f800000;
              auVar357._28_4_ = 0x3f800000;
              auVar163 = vsubps_avx(auVar357,auVar127);
              fVar180 = auVar163._0_4_ * fVar180 + fVar180;
              fVar237 = auVar163._4_4_ * fVar237 + fVar237;
              fVar240 = auVar163._8_4_ * fVar240 + fVar240;
              fVar256 = auVar163._12_4_ * fVar256 + fVar256;
              fVar258 = auVar163._16_4_ * fVar258 + fVar258;
              fVar263 = auVar163._20_4_ * fVar263 + fVar263;
              fVar264 = auVar163._24_4_ * fVar264 + fVar264;
              auVar128._4_4_ =
                   (fVar262 * auVar43._4_4_ + auVar44._4_4_ * fVar260 + auVar46._4_4_ * fVar206) *
                   fVar237;
              auVar128._0_4_ =
                   (fVar218 * auVar43._0_4_ + auVar44._0_4_ * fVar177 + auVar46._0_4_ * fVar204) *
                   fVar180;
              auVar128._8_4_ =
                   (fVar275 * auVar43._8_4_ + auVar44._8_4_ * fVar274 + auVar46._8_4_ * fVar207) *
                   fVar240;
              auVar128._12_4_ =
                   (fVar315 * auVar43._12_4_ + auVar44._12_4_ * fVar314 + auVar46._12_4_ * fVar291)
                   * fVar256;
              auVar128._16_4_ =
                   (fVar158 * auVar43._16_4_ + auVar44._16_4_ * fVar337 + auVar46._16_4_ * fVar201)
                   * fVar258;
              auVar128._20_4_ =
                   (fVar290 * auVar43._20_4_ + auVar44._20_4_ * fVar219 + auVar46._20_4_ * fVar203)
                   * fVar263;
              auVar128._24_4_ =
                   (fVar174 * auVar43._24_4_ + auVar44._24_4_ * fVar157 + auVar46._24_4_ * fVar205)
                   * fVar264;
              auVar128._28_4_ = auVar39._28_4_ + auVar40._28_4_ + auVar41._28_4_;
              auVar234 = ZEXT3264(auVar128);
              fVar220 = ray->tfar;
              auVar255._4_4_ = fVar220;
              auVar255._0_4_ = fVar220;
              auVar255._8_4_ = fVar220;
              auVar255._12_4_ = fVar220;
              auVar255._16_4_ = fVar220;
              auVar255._20_4_ = fVar220;
              auVar255._24_4_ = fVar220;
              auVar255._28_4_ = fVar220;
              auVar163 = vcmpps_avx(_local_360,auVar128,2);
              auVar39 = vcmpps_avx(auVar128,auVar255,2);
              auVar163 = vandps_avx(auVar163,auVar39);
              auVar40 = auVar42 & auVar163;
              if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar40 >> 0x7f,0) == '\0') &&
                    (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar40 >> 0xbf,0) == '\0') &&
                  (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar40[0x1f]) goto LAB_01183e28;
              auVar163 = vandps_avx(auVar42,auVar163);
              auVar40 = vcmpps_avx(ZEXT432(0) << 0x20,auVar195,4);
              auVar41 = auVar163 & auVar40;
              auVar196 = ZEXT3264(CONCAT824(uStack_468,
                                            CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
              if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar41 >> 0x7f,0) != '\0') ||
                    (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar41 >> 0xbf,0) != '\0') ||
                  (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar41[0x1f] < '\0') {
                auVar163 = vandps_avx(auVar40,auVar163);
                auVar196 = ZEXT3264(auVar163);
                auVar129._4_4_ = fVar237 * auVar335._4_4_;
                auVar129._0_4_ = fVar180 * auVar335._0_4_;
                auVar129._8_4_ = fVar240 * auVar335._8_4_;
                auVar129._12_4_ = fVar256 * auVar335._12_4_;
                auVar129._16_4_ = fVar258 * auVar335._16_4_;
                auVar129._20_4_ = fVar263 * auVar335._20_4_;
                auVar129._24_4_ = fVar264 * auVar335._24_4_;
                auVar129._28_4_ = auVar39._28_4_;
                auVar130._4_4_ = auVar172._4_4_ * fVar237;
                auVar130._0_4_ = auVar172._0_4_ * fVar180;
                auVar130._8_4_ = auVar172._8_4_ * fVar240;
                auVar130._12_4_ = auVar172._12_4_ * fVar256;
                auVar130._16_4_ = auVar172._16_4_ * fVar258;
                auVar130._20_4_ = auVar172._20_4_ * fVar263;
                auVar130._24_4_ = auVar172._24_4_ * fVar264;
                auVar130._28_4_ = auVar172._28_4_;
                auVar285._8_4_ = 0x3f800000;
                auVar285._0_8_ = 0x3f8000003f800000;
                auVar285._12_4_ = 0x3f800000;
                auVar285._16_4_ = 0x3f800000;
                auVar285._20_4_ = 0x3f800000;
                auVar285._24_4_ = 0x3f800000;
                auVar285._28_4_ = 0x3f800000;
                auVar163 = vsubps_avx(auVar285,auVar129);
                local_160 = vblendvps_avx(auVar163,auVar129,auVar38);
                auVar163 = vsubps_avx(auVar285,auVar130);
                _local_3c0 = vblendvps_avx(auVar163,auVar130,auVar38);
                auVar173 = ZEXT3264(_local_3c0);
                local_180 = auVar128;
              }
            }
            auVar366 = ZEXT3264(local_740);
            auVar163 = auVar196._0_32_;
            auVar134._4_4_ = fVar176;
            auVar134._0_4_ = fVar159;
            auVar134._8_4_ = fStack_798;
            auVar134._12_4_ = fStack_794;
            auVar134._16_4_ = fStack_790;
            auVar134._20_4_ = fStack_78c;
            auVar134._24_4_ = fStack_788;
            auVar134._28_4_ = fStack_784;
            if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar163 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar163 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar163 >> 0x7f,0) == '\0') &&
                  (auVar196 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar163 >> 0xbf,0) == '\0') &&
                (auVar196 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar196[0x1f]) {
              auVar298 = ZEXT3264(_local_760);
            }
            else {
              auVar39 = vsubps_avx(auVar363,auVar134);
              auVar234 = ZEXT3264(local_160);
              fVar159 = fVar159 + auVar39._0_4_ * local_160._0_4_;
              fVar176 = fVar176 + auVar39._4_4_ * local_160._4_4_;
              fVar177 = fStack_798 + auVar39._8_4_ * local_160._8_4_;
              fVar218 = fStack_794 + auVar39._12_4_ * local_160._12_4_;
              fVar180 = fStack_790 + auVar39._16_4_ * local_160._16_4_;
              fVar237 = fStack_78c + auVar39._20_4_ * local_160._20_4_;
              fVar240 = fStack_788 + auVar39._24_4_ * local_160._24_4_;
              fVar256 = fStack_784 + auVar39._28_4_;
              fVar220 = local_768->depth_scale;
              auVar131._4_4_ = (fVar176 + fVar176) * fVar220;
              auVar131._0_4_ = (fVar159 + fVar159) * fVar220;
              auVar131._8_4_ = (fVar177 + fVar177) * fVar220;
              auVar131._12_4_ = (fVar218 + fVar218) * fVar220;
              auVar131._16_4_ = (fVar180 + fVar180) * fVar220;
              auVar131._20_4_ = (fVar237 + fVar237) * fVar220;
              auVar131._24_4_ = (fVar240 + fVar240) * fVar220;
              auVar131._28_4_ = fVar256 + fVar256;
              auVar39 = vcmpps_avx(local_180,auVar131,6);
              auVar173 = ZEXT3264(auVar39);
              auVar40 = auVar163 & auVar39;
              auVar298 = ZEXT3264(_local_760);
              if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar40 >> 0x7f,0) != '\0') ||
                    (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar40 >> 0xbf,0) != '\0') ||
                  (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar40[0x1f] < '\0') {
                local_200 = vandps_avx(auVar39,auVar163);
                auVar173 = ZEXT3264(local_200);
                local_1c0._0_4_ = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
                local_1c0._4_4_ = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
                local_1c0._8_4_ = fStack_3b8 + fStack_3b8 + -1.0;
                local_1c0._12_4_ = fStack_3b4 + fStack_3b4 + -1.0;
                auVar187._16_4_ = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
                auVar187._0_16_ = local_1c0._0_16_;
                auVar187._20_4_ = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
                fStack_288 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
                _local_2a0 = auVar187;
                fStack_284 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
                auVar196 = ZEXT3264(_local_2a0);
                local_2c0 = local_160;
                local_280 = local_180;
                local_25c = uVar148;
                local_250 = local_630;
                uStack_248 = uStack_628;
                local_240 = local_560;
                uStack_238 = uStack_558;
                local_230 = local_570;
                uStack_228 = uStack_568;
                local_220 = _local_550;
                pGVar154 = (context->scene->geometries).items[local_770].ptr;
                _local_3c0 = _local_2a0;
                auVar163 = _local_3c0;
                if ((pGVar154->mask & ray->mask) == 0) {
                  pRVar147 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar147 = context->args;
                  if ((pRVar147->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar147 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar147 >> 8),1),
                     pGVar154->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_540._0_8_ = pGVar154;
                    local_7c0._0_8_ = context;
                    auVar186._0_4_ = (float)(int)local_260;
                    auVar186._4_8_ = SUB128(ZEXT812(0),4);
                    auVar186._12_4_ = 0;
                    auVar388 = vshufps_avx(auVar186,auVar186,0);
                    local_1e0[0] = (auVar388._0_4_ + local_160._0_4_ + 0.0) * (float)local_380._0_4_
                    ;
                    local_1e0[1] = (auVar388._4_4_ + local_160._4_4_ + 1.0) * (float)local_380._4_4_
                    ;
                    local_1e0[2] = (auVar388._8_4_ + local_160._8_4_ + 2.0) * fStack_378;
                    local_1e0[3] = (auVar388._12_4_ + local_160._12_4_ + 3.0) * fStack_374;
                    fStack_1d0 = (auVar388._0_4_ + local_160._16_4_ + 4.0) * fStack_370;
                    fStack_1cc = (auVar388._4_4_ + local_160._20_4_ + 5.0) * fStack_36c;
                    fStack_1c8 = (auVar388._8_4_ + local_160._24_4_ + 6.0) * fStack_368;
                    fStack_1c4 = auVar388._12_4_ + (float)local_160._28_4_ + 7.0;
                    uStack_3b0 = auVar187._16_8_;
                    uStack_3a8 = local_2a0._24_8_;
                    local_1c0._16_8_ = uStack_3b0;
                    local_1c0._24_8_ = uStack_3a8;
                    auVar196 = ZEXT3264(local_180);
                    local_1a0 = local_180;
                    iVar146 = vmovmskps_avx(local_200);
                    local_680._0_8_ = CONCAT44((int)((ulong)pRVar147 >> 0x20),iVar146);
                    lVar152 = 0;
                    if (local_680._0_8_ != 0) {
                      for (; ((ulong)local_680._0_8_ >> lVar152 & 1) == 0; lVar152 = lVar152 + 1) {
                      }
                    }
                    local_7a0 = (uint)lVar152;
                    uStack_79c = (undefined4)((ulong)lVar152 >> 0x20);
                    local_680._8_24_ = auVar335._8_24_;
                    _local_3c0 = auVar163;
                    if (iVar146 == 0) {
                      pRVar147 = (RTCIntersectArguments *)0x0;
LAB_01183e45:
                      auVar366 = ZEXT3264(local_740);
                      auVar298 = ZEXT3264(_local_760);
                      context = (RayQueryContext *)local_7c0._0_8_;
                      fVar302 = (float)local_700._0_4_;
                      fVar310 = (float)local_700._4_4_;
                      fVar311 = fStack_6f8;
                      fVar313 = fStack_6f4;
                      fVar235 = fStack_6f0;
                      fVar199 = fStack_6ec;
                      fVar236 = fStack_6e8;
                      fVar340 = (float)local_720._0_4_;
                      fVar346 = (float)local_720._4_4_;
                      fVar347 = fStack_718;
                      fVar348 = fStack_714;
                      fVar288 = fStack_710;
                      fVar243 = fStack_70c;
                      fVar246 = fStack_708;
                    }
                    else {
                      local_6a0._0_4_ = ray->tfar;
                      do {
                        lVar152 = CONCAT44(uStack_79c,local_7a0);
                        local_614 = local_1e0[lVar152];
                        auVar173 = ZEXT464((uint)local_614);
                        local_610 = *(uint *)(local_1c0 + lVar152 * 4);
                        auVar196 = ZEXT464(local_610);
                        ray->tfar = *(float *)(local_1a0 + lVar152 * 4);
                        local_6d0.context = context->user;
                        fVar177 = 1.0 - local_614;
                        fVar220 = local_614 * fVar177 + local_614 * fVar177;
                        auVar388 = ZEXT416((uint)(local_614 * local_614 * 3.0));
                        auVar388 = vshufps_avx(auVar388,auVar388,0);
                        auVar211 = ZEXT416((uint)((fVar220 - local_614 * local_614) * 3.0));
                        auVar211 = vshufps_avx(auVar211,auVar211,0);
                        auVar251 = ZEXT416((uint)((fVar177 * fVar177 - fVar220) * 3.0));
                        auVar251 = vshufps_avx(auVar251,auVar251,0);
                        auVar222 = ZEXT416((uint)(fVar177 * fVar177 * -3.0));
                        auVar222 = vshufps_avx(auVar222,auVar222,0);
                        auVar223._0_4_ = auVar222._0_4_ * (float)local_630._0_4_;
                        auVar223._4_4_ = auVar222._4_4_ * (float)local_630._4_4_;
                        auVar223._8_4_ = auVar222._8_4_ * (float)uStack_628;
                        auVar223._12_4_ = auVar222._12_4_ * uStack_628._4_4_;
                        auVar234 = ZEXT1664(auVar223);
                        auVar212._0_4_ =
                             auVar223._0_4_ +
                             auVar251._0_4_ * (float)local_560._0_4_ +
                             auVar388._0_4_ * (float)local_550._0_4_ +
                             auVar211._0_4_ * (float)local_570._0_4_;
                        auVar212._4_4_ =
                             auVar223._4_4_ +
                             auVar251._4_4_ * (float)local_560._4_4_ +
                             auVar388._4_4_ * (float)local_550._4_4_ +
                             auVar211._4_4_ * (float)local_570._4_4_;
                        auVar212._8_4_ =
                             auVar223._8_4_ +
                             auVar251._8_4_ * (float)uStack_558 +
                             auVar388._8_4_ * fStack_548 + auVar211._8_4_ * (float)uStack_568;
                        auVar212._12_4_ =
                             auVar223._12_4_ +
                             auVar251._12_4_ * uStack_558._4_4_ +
                             auVar388._12_4_ * fStack_544 + auVar211._12_4_ * uStack_568._4_4_;
                        local_620 = vmovlps_avx(auVar212);
                        local_618 = vextractps_avx(auVar212,2);
                        local_60c = (int)local_5e8;
                        local_608 = (int)local_770;
                        local_604 = (local_6d0.context)->instID[0];
                        local_600 = (local_6d0.context)->instPrimID[0];
                        local_7c4 = -1;
                        local_6d0.valid = &local_7c4;
                        local_6d0.geometryUserPtr = pGVar154->userPtr;
                        local_6d0.ray = (RTCRayN *)ray;
                        local_6d0.hit = (RTCHitN *)&local_620;
                        local_6d0.N = 1;
                        if (pGVar154->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01183d37:
                          pcVar37 = *(code **)(*(byte **)(local_7c0._0_8_ + 0x10) + 0x10);
                          if ((pcVar37 != (code *)0x0) &&
                             (((**(byte **)(local_7c0._0_8_ + 0x10) & 2) != 0 ||
                              ((*(byte *)(local_540._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar234 = ZEXT1664(auVar234._0_16_);
                            auVar388 = (*pcVar37)(&local_6d0);
                            auVar196._0_8_ = auVar388._8_8_;
                            auVar173._0_8_ = auVar388._0_8_;
                            auVar196._8_56_ = extraout_var_04;
                            auVar173._8_56_ = extraout_var_00;
                            if (*local_6d0.valid == 0) goto LAB_01183d82;
                          }
                          pRVar147 = (RTCIntersectArguments *)0x1;
                          goto LAB_01183e45;
                        }
                        auVar234 = ZEXT1664(auVar223);
                        auVar388 = (*pGVar154->occlusionFilterN)(&local_6d0);
                        auVar196._0_8_ = auVar388._8_8_;
                        auVar173._0_8_ = auVar388._0_8_;
                        auVar196._8_56_ = extraout_var_03;
                        auVar173._8_56_ = extraout_var;
                        if (*local_6d0.valid != 0) goto LAB_01183d37;
LAB_01183d82:
                        auVar173 = ZEXT464((uint)local_6a0._0_4_);
                        ray->tfar = (float)local_6a0._0_4_;
                        uVar151 = local_680._0_8_ ^ 1L << ((ulong)local_7a0 & 0x3f);
                        lVar152 = 0;
                        if (uVar151 != 0) {
                          for (; (uVar151 >> lVar152 & 1) == 0; lVar152 = lVar152 + 1) {
                          }
                        }
                        local_7a0 = (uint)lVar152;
                        uStack_79c = (undefined4)((ulong)lVar152 >> 0x20);
                        pRVar147 = (RTCIntersectArguments *)0x0;
                        local_680._0_8_ = uVar151;
                        auVar366 = ZEXT3264(local_740);
                        auVar298 = ZEXT3264(_local_760);
                        context = (RayQueryContext *)local_7c0._0_8_;
                        pGVar154 = (Geometry *)local_540._0_8_;
                        fVar302 = (float)local_700._0_4_;
                        fVar310 = (float)local_700._4_4_;
                        fVar311 = fStack_6f8;
                        fVar313 = fStack_6f4;
                        fVar235 = fStack_6f0;
                        fVar199 = fStack_6ec;
                        fVar236 = fStack_6e8;
                        fVar340 = (float)local_720._0_4_;
                        fVar346 = (float)local_720._4_4_;
                        fVar347 = fStack_718;
                        fVar348 = fStack_714;
                        fVar288 = fStack_710;
                        fVar243 = fStack_70c;
                        fVar246 = fStack_708;
                      } while (uVar151 != 0);
                    }
                  }
                }
                bVar156 = (bool)(bVar156 | (byte)pRVar147);
              }
            }
          }
          lVar155 = lVar155 + 8;
        } while ((int)lVar155 < (int)uVar148);
      }
      if (bVar156 != false) {
        return bVar156;
      }
      fVar220 = ray->tfar;
      auVar169._4_4_ = fVar220;
      auVar169._0_4_ = fVar220;
      auVar169._8_4_ = fVar220;
      auVar169._12_4_ = fVar220;
      auVar169._16_4_ = fVar220;
      auVar169._20_4_ = fVar220;
      auVar169._24_4_ = fVar220;
      auVar169._28_4_ = fVar220;
      auVar163 = vcmpps_avx(local_80,auVar169,2);
      uVar148 = vmovmskps_avx(auVar163);
      uVar145 = uVar145 & uVar145 + 0xff & uVar148;
    } while (uVar145 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }